

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O3

result * baryonyx::itm::select_float
                   (result *__return_storage_ptr__,context *ctx,problem *pb,bool is_optimization)

{
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *pvVar1;
  solver_updated_cb *psVar2;
  variables *pvVar3;
  double dVar4;
  bool bVar5;
  floating_point_type fVar6;
  objective_function_type oVar7;
  int iVar8;
  storage_type sVar9;
  pointer poVar10;
  pointer poVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  context *pcVar24;
  undefined8 uVar25;
  int iVar26;
  result *prVar27;
  raw_result<baryonyx::itm::maximize_tag> *prVar28;
  ulong uVar29;
  result_type_conflict *prVar30;
  result_type_conflict rVar31;
  ulong uVar32;
  int *piVar33;
  raw_result<baryonyx::itm::minimize_tag> *prVar34;
  undefined7 in_register_00000009;
  problem *pb_00;
  uint uVar35;
  pointer ptVar36;
  uint uVar37;
  solution *psVar38;
  timespec *ptVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  uint uVar94;
  index iVar95;
  undefined8 uStack_200;
  timespec tStack_1f8;
  timespec tStack_1e8;
  reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>
  rStack_1d8;
  reference_wrapper<std::atomic<bool>_> rStack_1d0;
  undefined1 auStack_1c8 [8];
  random_engine rStack_1c0;
  undefined1 auStack_1b8 [16];
  double dStack_1a8;
  undefined1 auStack_1a0 [24];
  undefined1 auStack_188 [16];
  quadratic_cost_type<double> qStack_178;
  reference_wrapper<const_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
  rStack_158;
  vector<std::thread,_std::allocator<std::thread>_> vStack_150;
  undefined1 auStack_138 [64];
  int *piStack_f8;
  pointer piStack_e8;
  vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
  vStack_e0;
  _Head_base<0UL,_unsigned_long_*,_false> _Stack_c0;
  _Head_base<0UL,_unsigned_long_*,_false> _Stack_b0;
  pointer pdStack_90;
  pointer pdStack_80;
  undefined1 auStack_78 [64];
  
  pb_00 = (problem *)CONCAT71(in_register_00000009,is_optimization);
  fVar6 = (ctx->parameters).float_type;
  oVar7 = pb->type;
  poVar10 = (pb->objective).qelements.
            super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
            ._M_impl.super__Vector_impl_data._M_start;
  poVar11 = (pb->objective).qelements.
            super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = (ctx->parameters).debug;
  auStack_1b8._8_8_ = pb;
  if (fVar6 != double_type) {
    if (fVar6 != float_type) {
      if (oVar7 == maximize) {
        if (poVar10 == poVar11) {
          if (bVar5 == false) {
            if (!is_optimization) {
              prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
                                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
              return prVar27;
            }
            auVar92 = ZEXT1664((undefined1  [16])0x0);
            auVar57 = vmovdqu64_avx512f(auVar92);
            *(undefined1 (*) [64])
             &(__return_storage_ptr__->variable_name).
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = auVar57;
            auVar57 = vmovdqu64_avx512f(auVar92);
            *(undefined1 (*) [64])
             &(__return_storage_ptr__->affected_vars).values.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_finish = auVar57;
            auVar57 = vmovdqu64_avx512f(auVar92);
            __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
            (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
            (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
            (__return_storage_ptr__->affected_vars).names =
                 (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  )auVar57._32_24_;
            (__return_storage_ptr__->affected_vars).values.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)auVar57._56_8_;
            __return_storage_ptr__->remaining_constraints = 0x7fffffff;
            __return_storage_ptr__->annoying_variable = 0;
            __return_storage_ptr__->status = uninitialized;
            if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
              (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
            }
            make_merged_constraints
                      ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                        *)(auStack_1a0 + 0x10),ctx,pb);
            if ((auStack_1a0._16_8_ == auStack_188._0_8_) ||
               ((pb->vars).values.
                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (pb->vars).values.
                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                ._M_impl.super__Vector_impl_data._M_finish)) {
              __return_storage_ptr__->status = success;
              std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                        (&__return_storage_ptr__->solutions,1);
              (__return_storage_ptr__->solutions).
              super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
              (__return_storage_ptr__->strings).
              super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (pb->strings).
                   super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(__return_storage_ptr__->strings).
                          super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                         &(pb->strings).
                          super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names)
              ;
              std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                        (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values
                        );
              std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
              goto LAB_005b9ac8;
            }
            uVar29 = std::chrono::_V2::system_clock::now();
            uVar42 = (ulong)(ctx->parameters).seed;
            if (uVar42 != 0) {
              uVar29 = uVar42;
            }
            rStack_1c0._M_x = uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0);
            iVar26 = (int)((ulong)((long)(pb->vars).values.
                                         super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pb->vars).values.
                                        super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x55555555;
            uStack_200 = (context *)CONCAT44(iVar26,(uint)uStack_200);
            default_cost_type<long_double>::default_cost_type
                      ((default_cost_type<long_double> *)(auStack_188 + 0x10),&pb->objective,iVar26)
            ;
            auStack_1a0._8_8_ = (pb->objective).value;
            uVar35 = (ctx->parameters).thread;
            auStack_1a0._0_8_ = pb;
            if ((int)uVar35 < 1) {
              uVar35 = std::thread::hardware_concurrency();
            }
            dStack_1a8 = 0.0;
            uVar37 = uVar35 + (uVar35 == 0);
            uVar29 = (ulong)uVar37;
            auStack_1b8 = (undefined1  [16])0x0;
            std::vector<std::thread,_std::allocator<std::thread>_>::vector
                      (&vStack_150,uVar29,(allocator_type *)auStack_138);
            tStack_1f8.tv_sec = (__time_t)__return_storage_ptr__;
            best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
            ::best_solution_recorder
                      ((best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
                        *)auStack_138,(random_engine *)(auStack_1c8 + 8),uVar37,
                       (default_cost_type<long_double> *)(auStack_188 + 0x10),
                       (double)auStack_1a0._8_8_,uStack_200._4_4_,
                       (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                        *)(auStack_1a0 + 0x10),(ctx->parameters).init_population_size);
            prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
            tStack_1f8.tv_nsec = (long)ctx;
            memset(prVar30,0,uVar29 * 8);
            tStack_1e8.tv_sec = 0;
            tStack_1e8.tv_nsec = -1;
            rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                 *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
            *prVar30 = rVar31;
            if (1 < uVar35) {
              uVar42 = 1;
              do {
                rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                   ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                    (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                     *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
                prVar30[uVar42] = rVar31;
                uVar32 = uVar42 - 1;
                if (uVar32 != 0) {
                  do {
                    iVar26 = (int)uVar32;
                    if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                      rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                         ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                           *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
                      prVar30[uVar32 & 0xffffffff] = rVar31;
                      iVar26 = (int)uVar42;
                    }
                    uVar32 = (ulong)(iVar26 - 1U);
                  } while (iVar26 - 1U != 0);
                }
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar29);
            }
            lVar41 = tStack_1f8.tv_nsec;
            uVar35 = 0;
            uStack_200._0_4_ = (uint)(uint3)uStack_200;
            LOCK();
            UNLOCK();
            tStack_1e8.tv_sec = tStack_1e8.tv_sec & 0xffffffff00000000;
            pvVar3 = (variables *)(auStack_1a0._0_8_ + 0x90);
            do {
              std::
              vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>>>
              ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                        ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>>>
                          *)auStack_1b8,(context *)lVar41,(uint *)&tStack_1e8,prVar30 + uVar35);
              uVar35 = (int)tStack_1e8.tv_sec + 1;
              tStack_1e8.tv_sec = CONCAT44(tStack_1e8.tv_sec._4_4_,uVar35);
            } while (uVar35 != uVar37);
            lVar41 = 0;
            lVar40 = 0;
            qStack_178.quadratic_elements._M_t.
            super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
            .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
            _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                            )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                              )pvVar3;
            do {
              rStack_1d0._M_data = (atomic<bool> *)((long)&uStack_200 + 3);
              rStack_1d8._M_data =
                   (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                    *)auStack_138;
              rStack_158._M_data =
                   (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)(auStack_1a0 + 0x10);
              auStack_1c8 = (undefined1  [8])(auStack_1b8._0_8_ + lVar41);
              qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl =
                   (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                   (auStack_188 + 0x10);
              std::thread::
              thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,long_double,baryonyx::itm::maximize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<long_double>const>,double&,void>
                        ((thread *)&tStack_1e8,
                         (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>
                          *)auStack_1c8,&rStack_1d0,
                         (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>_>
                          *)&rStack_1d8,&rStack_158,(int *)((long)&uStack_200 + 4),
                         (reference_wrapper<const_baryonyx::itm::default_cost_type<long_double>_> *)
                         &qStack_178.indices,(double *)(auStack_1a0 + 8));
              if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar40]._M_id._M_thread != 0) {
                std::terminate();
              }
              lVar41 = lVar41 + 0xc0;
              vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start[lVar40]._M_id._M_thread = tStack_1e8.tv_sec;
              lVar40 = lVar40 + 1;
            } while (uVar37 != (uint)lVar40);
            lVar41 = std::chrono::_V2::steady_clock::now();
            auVar57 = vpbroadcastq_avx512f();
            auStack_78 = vmovdqu64_avx512f(auVar57);
            psVar2 = (solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138);
            do {
              tStack_1e8.tv_sec = 1;
              tStack_1e8.tv_nsec = 0;
              do {
                ptVar39 = &tStack_1e8;
                iVar26 = nanosleep(&tStack_1e8,&tStack_1e8);
                if (iVar26 != -1) break;
                piVar33 = __errno_location();
              } while (*piVar33 == 4);
              if ((((solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138))->super__Function_base).
                  _M_manager != (_Manager_type)0x0) {
                auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                auVar92 = vmovdqu64_avx512f(auStack_78);
                auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
                auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
                auVar93 = ZEXT1664((undefined1  [16])0x0);
                uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
                do {
                  vpmullq_avx512dq(auVar57,auVar58);
                  uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
                  auVar60 = vmovdqa64_avx512f(auVar93);
                  auVar57 = vpaddq_avx512f(auVar57,auVar59);
                  uVar42 = uVar42 - 8;
                  auVar81 = vpgatherqq_avx512f(*(undefined8 *)
                                                ((long)&ptVar39[0xb].tv_sec + auStack_1b8._0_8_));
                  auVar93._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar81._8_8_;
                  auVar93._0_8_ = (ulong)((byte)uVar32 & 1) * auVar81._0_8_;
                  auVar93._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar81._16_8_;
                  auVar93._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar81._24_8_;
                  auVar93._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar81._32_8_;
                  auVar93._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar81._40_8_;
                  auVar93._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar81._48_8_;
                  auVar93._56_8_ = (uVar32 >> 7) * auVar81._56_8_;
                  auVar93 = vpaddq_avx512f(auVar93,auVar60);
                } while (uVar42 != 0);
                auVar92 = vmovdqa64_avx512f(auVar93);
                bVar5 = (bool)((byte)uVar32 & 1);
                auVar57._0_8_ = (ulong)bVar5 * auVar92._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
                bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
                auVar57._8_8_ = (ulong)bVar5 * auVar92._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
                bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
                auVar57._16_8_ = (ulong)bVar5 * auVar92._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
                bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
                auVar57._24_8_ = (ulong)bVar5 * auVar92._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
                bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
                auVar57._32_8_ = (ulong)bVar5 * auVar92._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
                bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
                auVar57._40_8_ = (ulong)bVar5 * auVar92._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
                bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
                auVar57._48_8_ = (ulong)bVar5 * auVar92._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
                auVar57._56_8_ =
                     (uVar32 >> 7) * auVar92._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
                auVar44 = vextracti64x4_avx512f(auVar57,1);
                auVar57 = vpaddq_avx512f(auVar57,ZEXT3264(auVar44));
                auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
                auVar13 = vpshufd_avx(auVar12,0xee);
                auVar12 = vpaddq_avx(auVar12,auVar13);
                storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                ::get_best((storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                            *)(auStack_138 + 8),(int *)&rStack_1d8,(double *)auStack_1c8,
                           (double *)&rStack_1d0,&tStack_1e8.tv_sec);
                std::function<void_(int,_double,_long,_double,_long)>::operator()
                          (psVar2,(int)rStack_1d8._M_data,(double)auStack_1c8,tStack_1e8.tv_sec,
                           (double)rStack_1d0._M_data,auVar12._0_8_);
              }
              lVar43 = std::chrono::_V2::steady_clock::now();
              uVar25 = auStack_1a0._0_8_;
              lVar40 = tStack_1f8.tv_nsec;
              dVar4 = ((solver_parameters *)tStack_1f8.tv_nsec)->time_limit;
            } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar41) / 1000000000.0 <= dVar4));
            LOCK();
            uStack_200._0_4_ = CONCAT13(1,(uint3)uStack_200);
            UNLOCK();
            prVar27 = (result *)tStack_1f8.tv_sec;
            for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                tStack_1f8.tv_sec = (__time_t)prVar27,
                ptVar36 !=
                vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
              std::thread::join();
              prVar27 = (result *)tStack_1f8.tv_sec;
            }
            (prVar27->strings).
            super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (((string_buffer_ptr *)uVar25)->
                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(prVar27->strings).
                        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                       &(((string_buffer_ptr *)uVar25)->
                        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount);
            std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator=(&(prVar27->affected_vars).names,
                        (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)(uVar25 + 0xc0));
            std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                      (&(prVar27->affected_vars).values,
                       &((affected_variables *)(uVar25 + 0xc0))->values);
            std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator=(&prVar27->variable_name,
                        (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)qStack_178.quadratic_elements._M_t.
                           super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                           .
                           super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                           ._M_head_impl);
            prVar27->variables = uStack_200._4_4_;
            prVar27->constraints =
                 (int)((ulong)(auStack_188._0_8_ - auStack_1a0._16_8_) >> 3) * -0x33333333;
            iVar26 = *piStack_f8;
            iVar8 = vStack_e0.
                    super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
            prVar28 = vStack_e0.
                      super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar26;
            prVar27->status = (uint)(iVar8 != 0) * 3;
            prVar27->duration =
                 vStack_e0.
                 super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
            prVar27->loop =
                 vStack_e0.
                 super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
            prVar27->remaining_constraints = iVar8;
            sVar9 = ((solver_parameters *)lVar40)->storage;
            if (sVar9 == one) {
              pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                       (tStack_1f8.tv_sec + 0x68);
              std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1)
              ;
              psVar38 = (pvVar1->
                        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>)
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_005b99c5:
              convert<baryonyx::itm::maximize_tag>(prVar28,psVar38,uStack_200._4_4_);
            }
            else {
              if (sVar9 == bound) {
                pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                         (tStack_1f8.tv_sec + 0x68);
                std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                          (pvVar1,2);
                convert<baryonyx::itm::maximize_tag>
                          (prVar28,(pvVar1->
                                   super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                   )._M_impl.super__Vector_impl_data._M_start,uStack_200._4_4_);
                prVar28 = storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                          ::get_worst((storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                                       *)(auStack_138 + 8));
                psVar38 = (pvVar1->
                          super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
                goto LAB_005b99c5;
              }
              if (sVar9 == five) {
                pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                         (tStack_1f8.tv_sec + 0x68);
                std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                          (pvVar1,5);
                lVar40 = 0;
                lVar41 = 0;
                do {
                  convert<baryonyx::itm::maximize_tag>
                            (vStack_e0.
                             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41],
                             (solution *)
                             ((long)&(((pvVar1->
                                       super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->variables).
                                     super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                     _M_impl + lVar40),uStack_200._4_4_);
                  lVar41 = lVar41 + 1;
                  lVar40 = lVar40 + 0x20;
                } while (lVar41 != 5);
              }
            }
            lVar41 = tStack_1f8.tv_nsec;
            storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>::
            show_population((storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                             *)(auStack_138 + 8),(context *)tStack_1f8.tv_nsec);
            if ((((solver_finished_cb *)(lVar41 + 0x158))->super__Function_base)._M_manager !=
                (_Manager_type)0x0) {
              (*((solver_finished_cb *)(tStack_1f8.tv_nsec + 0x158))->_M_invoker)
                        ((_Any_data *)(tStack_1f8.tv_nsec + 0x158),(result *)tStack_1f8.tv_sec);
            }
            operator_delete__(prVar30);
            if (pdStack_90 != (pointer)0x0) {
              operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
            }
            __return_storage_ptr__ = (result *)tStack_1f8.tv_sec;
            if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                _Stack_b0._M_head_impl != (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
              operator_delete__(_Stack_b0._M_head_impl);
            }
            _Stack_b0._M_head_impl = (unsigned_long *)0x0;
            if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
              operator_delete__(_Stack_c0._M_head_impl);
            }
            _Stack_c0._M_head_impl = (unsigned_long *)0x0;
            std::
            vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
            ::~vector(&vStack_e0);
            if (piStack_f8 != (int *)0x0) {
              operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
            }
            std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
            if ((void *)auStack_1b8._0_8_ != (void *)0x0) {
              operator_delete((void *)auStack_1b8._0_8_,(long)dStack_1a8 - auStack_1b8._0_8_);
            }
            if ((tuple<int_*,_std::default_delete<int[]>_>)
                qStack_178.linear_elements._M_t.
                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                super__Head_base<0UL,_double_*,_false>._M_head_impl !=
                (_Head_base<0UL,_int_*,_false>)0x0) {
              operator_delete__((void *)qStack_178.linear_elements._M_t.
                                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                        .super__Head_base<0UL,_double_*,_false>._M_head_impl);
            }
LAB_005b9ac8:
            std::
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                       *)(auStack_1a0 + 0x10));
            return __return_storage_ptr__;
          }
          if (!is_optimization) {
            prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
                                (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
            return prVar27;
          }
          auVar92 = ZEXT1664((undefined1  [16])0x0);
          auVar57 = vmovdqu64_avx512f(auVar92);
          *(undefined1 (*) [64])
           &(__return_storage_ptr__->variable_name).
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = auVar57;
          auVar57 = vmovdqu64_avx512f(auVar92);
          *(undefined1 (*) [64])
           &(__return_storage_ptr__->affected_vars).values.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish = auVar57;
          auVar57 = vmovdqu64_avx512f(auVar92);
          __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
          (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
          (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
          (__return_storage_ptr__->affected_vars).names =
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                )auVar57._32_24_;
          (__return_storage_ptr__->affected_vars).values.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)auVar57._56_8_;
          __return_storage_ptr__->remaining_constraints = 0x7fffffff;
          __return_storage_ptr__->annoying_variable = 0;
          __return_storage_ptr__->status = uninitialized;
          if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
            (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
          }
          make_merged_constraints
                    ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      *)(auStack_1a0 + 0x10),ctx,pb);
          if ((auStack_1a0._16_8_ == auStack_188._0_8_) ||
             ((pb->vars).values.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (pb->vars).values.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            __return_storage_ptr__->status = success;
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                      (&__return_storage_ptr__->solutions,1);
            (__return_storage_ptr__->solutions).
            super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
            (__return_storage_ptr__->strings).
            super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (pb->strings).
                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(__return_storage_ptr__->strings).
                        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                       &(pb->strings).
                        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
            std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                      (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
            std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
            goto LAB_005b8ca5;
          }
          uVar29 = std::chrono::_V2::system_clock::now();
          uVar42 = (ulong)(ctx->parameters).seed;
          if (uVar42 != 0) {
            uVar29 = uVar42;
          }
          rStack_1c0._M_x = uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0);
          iVar26 = (int)((ulong)((long)(pb->vars).values.
                                       super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pb->vars).values.
                                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555
          ;
          uStack_200 = (context *)CONCAT44(iVar26,(uint)uStack_200);
          default_cost_type<long_double>::default_cost_type
                    ((default_cost_type<long_double> *)(auStack_188 + 0x10),&pb->objective,iVar26);
          auStack_1a0._8_8_ = (pb->objective).value;
          uVar35 = (ctx->parameters).thread;
          auStack_1a0._0_8_ = pb;
          if ((int)uVar35 < 1) {
            uVar35 = std::thread::hardware_concurrency();
          }
          dStack_1a8 = 0.0;
          uVar37 = uVar35 + (uVar35 == 0);
          uVar29 = (ulong)uVar37;
          auStack_1b8 = (undefined1  [16])0x0;
          std::vector<std::thread,_std::allocator<std::thread>_>::vector
                    (&vStack_150,uVar29,(allocator_type *)auStack_138);
          tStack_1f8.tv_sec = (__time_t)__return_storage_ptr__;
          best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
          ::best_solution_recorder
                    ((best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
                      *)auStack_138,(random_engine *)(auStack_1c8 + 8),uVar37,
                     (default_cost_type<long_double> *)(auStack_188 + 0x10),
                     (double)auStack_1a0._8_8_,uStack_200._4_4_,
                     (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      *)(auStack_1a0 + 0x10),(ctx->parameters).init_population_size);
          prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
          tStack_1f8.tv_nsec = (long)ctx;
          memset(prVar30,0,uVar29 * 8);
          tStack_1e8.tv_sec = 0;
          tStack_1e8.tv_nsec = -1;
          rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
          *prVar30 = rVar31;
          if (1 < uVar35) {
            uVar42 = 1;
            do {
              rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                 ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                  (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                   *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
              prVar30[uVar42] = rVar31;
              uVar32 = uVar42 - 1;
              if (uVar32 != 0) {
                do {
                  iVar26 = (int)uVar32;
                  if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                    rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                       ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                        (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                         *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
                    prVar30[uVar32 & 0xffffffff] = rVar31;
                    iVar26 = (int)uVar42;
                  }
                  uVar32 = (ulong)(iVar26 - 1U);
                } while (iVar26 - 1U != 0);
              }
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar29);
          }
          lVar41 = tStack_1f8.tv_nsec;
          uVar35 = 0;
          uStack_200._0_4_ = (uint)(uint3)uStack_200;
          LOCK();
          UNLOCK();
          tStack_1e8.tv_sec = tStack_1e8.tv_sec & 0xffffffff00000000;
          pvVar3 = (variables *)(auStack_1a0._0_8_ + 0x90);
          do {
            std::
            vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>>>
            ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                      ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>>>
                        *)auStack_1b8,(context *)lVar41,(uint *)&tStack_1e8,prVar30 + uVar35);
            uVar35 = (int)tStack_1e8.tv_sec + 1;
            tStack_1e8.tv_sec = CONCAT44(tStack_1e8.tv_sec._4_4_,uVar35);
          } while (uVar35 != uVar37);
          lVar41 = 0;
          lVar40 = 0;
          qStack_178.quadratic_elements._M_t.
          super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
          _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                          )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                            )pvVar3;
          do {
            rStack_1d0._M_data = (atomic<bool> *)((long)&uStack_200 + 3);
            rStack_1d8._M_data =
                 (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                  *)auStack_138;
            rStack_158._M_data =
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)(auStack_1a0 + 0x10);
            auStack_1c8 = (undefined1  [8])(auStack_1b8._0_8_ + lVar41);
            qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl =
                 (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)(auStack_188 + 0x10);
            std::thread::
            thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,long_double,baryonyx::itm::maximize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<long_double>const>,double&,void>
                      ((thread *)&tStack_1e8,
                       (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>
                        *)auStack_1c8,&rStack_1d0,
                       (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>_>
                        *)&rStack_1d8,&rStack_158,(int *)((long)&uStack_200 + 4),
                       (reference_wrapper<const_baryonyx::itm::default_cost_type<long_double>_> *)
                       &qStack_178.indices,(double *)(auStack_1a0 + 8));
            if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start[lVar40]._M_id._M_thread != 0) {
              std::terminate();
            }
            lVar41 = lVar41 + 0xc0;
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start[lVar40]._M_id._M_thread = tStack_1e8.tv_sec;
            lVar40 = lVar40 + 1;
          } while (uVar37 != (uint)lVar40);
          lVar41 = std::chrono::_V2::steady_clock::now();
          auVar57 = vpbroadcastq_avx512f();
          auStack_78 = vmovdqu64_avx512f(auVar57);
          psVar2 = (solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138);
          do {
            tStack_1e8.tv_sec = 1;
            tStack_1e8.tv_nsec = 0;
            do {
              ptVar39 = &tStack_1e8;
              iVar26 = nanosleep(&tStack_1e8,&tStack_1e8);
              if (iVar26 != -1) break;
              piVar33 = __errno_location();
            } while (*piVar33 == 4);
            if ((((solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138))->super__Function_base).
                _M_manager != (_Manager_type)0x0) {
              auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar92 = vmovdqu64_avx512f(auStack_78);
              auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
              auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
              auVar93 = ZEXT1664((undefined1  [16])0x0);
              uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
              do {
                vpmullq_avx512dq(auVar57,auVar58);
                uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
                auVar60 = vmovdqa64_avx512f(auVar93);
                auVar57 = vpaddq_avx512f(auVar57,auVar59);
                uVar42 = uVar42 - 8;
                auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                              ((long)&ptVar39[0xb].tv_sec + auStack_1b8._0_8_));
                auVar81._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
                auVar81._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
                auVar81._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
                auVar81._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
                auVar81._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
                auVar81._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
                auVar81._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
                auVar81._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
                auVar93 = vpaddq_avx512f(auVar81,auVar60);
              } while (uVar42 != 0);
              auVar57 = vmovdqa64_avx512f(auVar93);
              bVar5 = (bool)((byte)uVar32 & 1);
              auVar92._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
              bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar92._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
              bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar92._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
              bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
              auVar92._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
              bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
              auVar92._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
              bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
              auVar92._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
              bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
              auVar92._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
              auVar92._56_8_ =
                   (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
              auVar44 = vextracti64x4_avx512f(auVar92,1);
              auVar57 = vpaddq_avx512f(auVar92,ZEXT3264(auVar44));
              auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
              auVar13 = vpshufd_avx(auVar12,0xee);
              auVar12 = vpaddq_avx(auVar12,auVar13);
              storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>::
              get_best((storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                        *)(auStack_138 + 8),(int *)&rStack_1d8,(double *)auStack_1c8,
                       (double *)&rStack_1d0,&tStack_1e8.tv_sec);
              std::function<void_(int,_double,_long,_double,_long)>::operator()
                        (psVar2,(int)rStack_1d8._M_data,(double)auStack_1c8,tStack_1e8.tv_sec,
                         (double)rStack_1d0._M_data,auVar12._0_8_);
            }
            lVar43 = std::chrono::_V2::steady_clock::now();
            uVar25 = auStack_1a0._0_8_;
            lVar40 = tStack_1f8.tv_nsec;
            dVar4 = ((solver_parameters *)tStack_1f8.tv_nsec)->time_limit;
          } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar41) / 1000000000.0 <= dVar4));
          LOCK();
          uStack_200._0_4_ = CONCAT13(1,(uint3)uStack_200);
          UNLOCK();
          prVar27 = (result *)tStack_1f8.tv_sec;
          for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              tStack_1f8.tv_sec = (__time_t)prVar27,
              ptVar36 !=
              vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
            std::thread::join();
            prVar27 = (result *)tStack_1f8.tv_sec;
          }
          (prVar27->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (((string_buffer_ptr *)uVar25)->
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(prVar27->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(((string_buffer_ptr *)uVar25)->
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&(prVar27->affected_vars).names,
                      (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)(uVar25 + 0xc0));
          std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                    (&(prVar27->affected_vars).values,
                     &((affected_variables *)(uVar25 + 0xc0))->values);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&prVar27->variable_name,
                      (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)qStack_178.quadratic_elements._M_t.
                         super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                         .
                         super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                         ._M_head_impl);
          prVar27->variables = uStack_200._4_4_;
          prVar27->constraints =
               (int)((ulong)(auStack_188._0_8_ - auStack_1a0._16_8_) >> 3) * -0x33333333;
          iVar26 = *piStack_f8;
          iVar8 = vStack_e0.
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
          prVar28 = vStack_e0.
                    super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar26;
          prVar27->status = (uint)(iVar8 != 0) * 3;
          prVar27->duration =
               vStack_e0.
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
          prVar27->loop =
               vStack_e0.
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
          prVar27->remaining_constraints = iVar8;
          sVar9 = ((solver_parameters *)lVar40)->storage;
          if (sVar9 == one) {
            pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                     (tStack_1f8.tv_sec + 0x68);
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1);
            psVar38 = (pvVar1->
                      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                      _M_impl.super__Vector_impl_data._M_start;
LAB_005b8ba2:
            convert<baryonyx::itm::maximize_tag>(prVar28,psVar38,uStack_200._4_4_);
          }
          else {
            if (sVar9 == bound) {
              pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                       (tStack_1f8.tv_sec + 0x68);
              std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2)
              ;
              convert<baryonyx::itm::maximize_tag>
                        (prVar28,(pvVar1->
                                 super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                 )._M_impl.super__Vector_impl_data._M_start,uStack_200._4_4_);
              prVar28 = storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                        ::get_worst((storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                                     *)(auStack_138 + 8));
              psVar38 = (pvVar1->
                        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>)
                        ._M_impl.super__Vector_impl_data._M_start + 1;
              goto LAB_005b8ba2;
            }
            if (sVar9 == five) {
              pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                       (tStack_1f8.tv_sec + 0x68);
              std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,5)
              ;
              lVar40 = 0;
              lVar41 = 0;
              do {
                convert<baryonyx::itm::maximize_tag>
                          (vStack_e0.
                           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41],
                           (solution *)
                           ((long)&(((pvVar1->
                                     super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->variables).
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl + lVar40),uStack_200._4_4_);
                lVar41 = lVar41 + 1;
                lVar40 = lVar40 + 0x20;
              } while (lVar41 != 5);
            }
          }
          lVar41 = tStack_1f8.tv_nsec;
          storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>::
          show_population((storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                           *)(auStack_138 + 8),(context *)tStack_1f8.tv_nsec);
          if ((((solver_finished_cb *)(lVar41 + 0x158))->super__Function_base)._M_manager !=
              (_Manager_type)0x0) {
            (*((solver_finished_cb *)(tStack_1f8.tv_nsec + 0x158))->_M_invoker)
                      ((_Any_data *)(tStack_1f8.tv_nsec + 0x158),(result *)tStack_1f8.tv_sec);
          }
          operator_delete__(prVar30);
          if (pdStack_90 != (pointer)0x0) {
            operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
          }
          __return_storage_ptr__ = (result *)tStack_1f8.tv_sec;
          if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl
              != (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
            operator_delete__(_Stack_b0._M_head_impl);
          }
          _Stack_b0._M_head_impl = (unsigned_long *)0x0;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
            operator_delete__(_Stack_c0._M_head_impl);
          }
          _Stack_c0._M_head_impl = (unsigned_long *)0x0;
          std::
          vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
          ::~vector(&vStack_e0);
          if (piStack_f8 != (int *)0x0) {
            operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
          if ((void *)auStack_1b8._0_8_ != (void *)0x0) {
            operator_delete((void *)auStack_1b8._0_8_,(long)dStack_1a8 - auStack_1b8._0_8_);
          }
          if ((tuple<int_*,_std::default_delete<int[]>_>)
              qStack_178.linear_elements._M_t.
              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
              super__Head_base<0UL,_double_*,_false>._M_head_impl !=
              (_Head_base<0UL,_int_*,_false>)0x0) {
            operator_delete__((void *)qStack_178.linear_elements._M_t.
                                      super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                      .super__Head_base<0UL,_double_*,_false>._M_head_impl);
          }
LAB_005b8ca5:
          std::
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                     *)(auStack_1a0 + 0x10));
          return __return_storage_ptr__;
        }
        if (bVar5 == false) {
          if (!is_optimization) {
            prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
                                (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
            return prVar27;
          }
          auVar92 = ZEXT1664((undefined1  [16])0x0);
          auVar57 = vmovdqu64_avx512f(auVar92);
          *(undefined1 (*) [64])
           &(__return_storage_ptr__->variable_name).
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = auVar57;
          auVar57 = vmovdqu64_avx512f(auVar92);
          *(undefined1 (*) [64])
           &(__return_storage_ptr__->affected_vars).values.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish = auVar57;
          auVar57 = vmovdqu64_avx512f(auVar92);
          __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
          (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
          (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
          (__return_storage_ptr__->affected_vars).names =
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                )auVar57._32_24_;
          (__return_storage_ptr__->affected_vars).values.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)auVar57._56_8_;
          __return_storage_ptr__->remaining_constraints = 0x7fffffff;
          __return_storage_ptr__->annoying_variable = 0;
          __return_storage_ptr__->status = uninitialized;
          if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
            (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
          }
          make_merged_constraints
                    ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      *)auStack_1a0,ctx,pb);
          if ((auStack_1a0._0_8_ == auStack_1a0._8_8_) ||
             ((pb->vars).values.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (pb->vars).values.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            __return_storage_ptr__->status = success;
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                      (&__return_storage_ptr__->solutions,1);
            (__return_storage_ptr__->solutions).
            super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
            (__return_storage_ptr__->strings).
            super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (pb->strings).
                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(__return_storage_ptr__->strings).
                        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                       &(pb->strings).
                        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
            std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                      (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
            std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
            goto LAB_005d3a74;
          }
          uVar29 = std::chrono::_V2::system_clock::now();
          uVar42 = (ulong)(ctx->parameters).seed;
          if (uVar42 != 0) {
            uVar29 = uVar42;
          }
          rStack_1d0._M_data =
               (atomic<bool> *)(uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0));
          uVar35 = (int)((ulong)((long)(pb->vars).values.
                                       super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pb->vars).values.
                                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555
          ;
          lVar41 = (ulong)uVar35 << 0x20;
          quadratic_cost_type<long_double>::quadratic_cost_type
                    ((quadratic_cost_type<long_double> *)auStack_188,&pb->objective,uVar35);
          dStack_1a8 = (pb->objective).value;
          uVar35 = (ctx->parameters).thread;
          if ((int)uVar35 < 1) {
            uVar35 = std::thread::hardware_concurrency();
          }
          auVar12._8_8_ = 0;
          auVar12._0_8_ = auStack_1b8._8_8_;
          auStack_1b8 = auVar12 << 0x40;
          uVar37 = uVar35 + (uVar35 == 0);
          uVar29 = (ulong)uVar37;
          _auStack_1c8 = (undefined1  [16])0x0;
          std::vector<std::thread,_std::allocator<std::thread>_>::vector
                    (&vStack_150,uVar29,(allocator_type *)auStack_138);
          best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
          ::best_solution_recorder
                    ((best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
                      *)auStack_138,(random_engine *)&rStack_1d0,uVar37,
                     (quadratic_cost_type<long_double> *)auStack_188,dStack_1a8,
                     (int)((ulong)lVar41 >> 0x20),
                     (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      *)auStack_1a0,(ctx->parameters).init_population_size);
          prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
          uStack_200 = ctx;
          memset(prVar30,0,uVar29 * 8);
          tStack_1f8.tv_sec = 0;
          tStack_1f8.tv_nsec = -1;
          rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)&rStack_1d0,(param_type *)&tStack_1f8);
          uVar94 = (uint)((ulong)lVar41 >> 0x20);
          *prVar30 = rVar31;
          if (1 < uVar35) {
            uVar42 = 1;
            do {
              rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                 ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                  (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                   *)&rStack_1d0,(param_type *)&tStack_1f8);
              prVar30[uVar42] = rVar31;
              uVar32 = uVar42 - 1;
              if (uVar32 != 0) {
                do {
                  iVar26 = (int)uVar32;
                  if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                    rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                       ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                        (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                         *)&rStack_1d0,(param_type *)&tStack_1f8);
                    prVar30[uVar32 & 0xffffffff] = rVar31;
                    iVar26 = (int)uVar42;
                  }
                  uVar32 = (ulong)(iVar26 - 1U);
                } while (iVar26 - 1U != 0);
              }
              uVar94 = (uint)((ulong)lVar41 >> 0x20);
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar29);
          }
          pcVar24 = uStack_200;
          uVar35 = 0;
          LOCK();
          lVar41 = (ulong)uVar94 << 0x20;
          UNLOCK();
          tStack_1f8.tv_sec = tStack_1f8.tv_sec & 0xffffffff00000000;
          pvVar3 = (variables *)(auStack_1b8._8_8_ + 0x90);
          do {
            std::
            vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>>>
            ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                      ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>>>
                        *)auStack_1c8,pcVar24,(uint *)&tStack_1f8,prVar30 + uVar35);
            uVar35 = (int)tStack_1f8.tv_sec + 1;
            tStack_1f8.tv_sec = CONCAT44(tStack_1f8.tv_sec._4_4_,uVar35);
          } while (uVar35 != uVar37);
          lVar40 = 0;
          lVar43 = 0;
          qStack_178.quadratic_elements._M_t.
          super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
          _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                          )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                            )pvVar3;
          do {
            tStack_1e8.tv_nsec = (long)&stack0xfffffffffffffdf3;
            tStack_1e8.tv_sec = (__time_t)auStack_138;
            rStack_158._M_data =
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)auStack_1a0;
            rStack_1d8._M_data =
                 (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                  *)((long)(context **)auStack_1c8 + lVar40);
            qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl =
                 (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)auStack_188;
            std::thread::
            thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,long_double,baryonyx::itm::maximize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::quadratic_cost_type<long_double>const>,double&,void>
                      ((thread *)&tStack_1f8,
                       (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>_>
                        *)&rStack_1d8,(reference_wrapper<std::atomic<bool>_> *)&tStack_1e8.tv_nsec,
                       (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>_>
                        *)&tStack_1e8,&rStack_158,(int *)&stack0xfffffffffffffdf4,
                       (reference_wrapper<const_baryonyx::itm::quadratic_cost_type<long_double>_> *)
                       &qStack_178.indices,&dStack_1a8);
            if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start[lVar43]._M_id._M_thread != 0) {
              std::terminate();
            }
            lVar40 = lVar40 + 0xc0;
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start[lVar43]._M_id._M_thread = tStack_1f8.tv_sec;
            lVar43 = lVar43 + 1;
          } while (uVar37 != (uint)lVar43);
          lVar40 = std::chrono::_V2::steady_clock::now();
          auVar57 = vpbroadcastq_avx512f();
          auStack_78 = vmovdqu64_avx512f(auVar57);
          psVar2 = &uStack_200->update;
          do {
            tStack_1f8.tv_sec = 1;
            tStack_1f8.tv_nsec = 0;
            do {
              ptVar39 = &tStack_1f8;
              iVar26 = nanosleep(&tStack_1f8,&tStack_1f8);
              if (iVar26 != -1) break;
              piVar33 = __errno_location();
            } while (*piVar33 == 4);
            if ((uStack_200->update).super__Function_base._M_manager != (_Manager_type)0x0) {
              auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar92 = vmovdqu64_avx512f(auStack_78);
              auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
              auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
              auVar93 = ZEXT1664((undefined1  [16])0x0);
              uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
              do {
                vpmullq_avx512dq(auVar57,auVar58);
                uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
                auVar60 = vmovdqa64_avx512f(auVar93);
                auVar57 = vpaddq_avx512f(auVar57,auVar59);
                uVar42 = uVar42 - 8;
                auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                              ((long)((long)auStack_1c8 + 0xb0) + (long)ptVar39));
                auVar83._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
                auVar83._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
                auVar83._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
                auVar83._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
                auVar83._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
                auVar83._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
                auVar83._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
                auVar83._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
                auVar93 = vpaddq_avx512f(auVar83,auVar60);
              } while (uVar42 != 0);
              auVar57 = vmovdqa64_avx512f(auVar93);
              bVar5 = (bool)((byte)uVar32 & 1);
              auVar58._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
              bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar58._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
              bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar58._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
              bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
              auVar58._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
              bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
              auVar58._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
              bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
              auVar58._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
              bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
              auVar58._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
              auVar58._56_8_ =
                   (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
              auVar44 = vextracti64x4_avx512f(auVar58,1);
              auVar57 = vpaddq_avx512f(auVar58,ZEXT3264(auVar44));
              auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
              auVar13 = vpshufd_avx(auVar12,0xee);
              auVar12 = vpaddq_avx(auVar12,auVar13);
              storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>
              ::get_best((storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                          *)(auStack_138 + 8),(int *)&tStack_1e8,(double *)&rStack_1d8,
                         (double *)&tStack_1e8.tv_nsec,&tStack_1f8.tv_sec);
              std::function<void_(int,_double,_long,_double,_long)>::operator()
                        (psVar2,(int)tStack_1e8.tv_sec,(double)rStack_1d8._M_data,tStack_1f8.tv_sec,
                         (double)tStack_1e8.tv_nsec,auVar12._0_8_);
            }
            lVar43 = std::chrono::_V2::steady_clock::now();
            pcVar24 = uStack_200;
            dVar4 = (uStack_200->parameters).time_limit;
          } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar40) / 1000000000.0 <= dVar4));
          LOCK();
          iVar95 = (index)((ulong)lVar41 >> 0x20);
          UNLOCK();
          uVar25 = auStack_1b8._8_8_;
          for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              ptVar36 !=
              vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
            std::thread::join();
          }
          (__return_storage_ptr__->strings).
          super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)uVar25;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(__return_storage_ptr__->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + 8));
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&(__return_storage_ptr__->affected_vars).names,
                      (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)(uVar25 + 0xc0));
          std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                    (&(__return_storage_ptr__->affected_vars).values,
                     (vector<signed_char,_std::allocator<signed_char>_> *)(uVar25 + 0xd8));
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&__return_storage_ptr__->variable_name,
                      (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)qStack_178.quadratic_elements._M_t.
                         super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                         .
                         super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                         ._M_head_impl);
          __return_storage_ptr__->variables = iVar95;
          __return_storage_ptr__->constraints =
               (int)((ulong)(auStack_1a0._8_8_ - auStack_1a0._0_8_) >> 3) * -0x33333333;
          iVar26 = *piStack_f8;
          iVar8 = vStack_e0.
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
          prVar28 = vStack_e0.
                    super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar26;
          __return_storage_ptr__->status = (uint)(iVar8 != 0) * 3;
          __return_storage_ptr__->duration =
               vStack_e0.
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
          __return_storage_ptr__->loop =
               vStack_e0.
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
          __return_storage_ptr__->remaining_constraints = iVar8;
          sVar9 = (pcVar24->parameters).storage;
          if (sVar9 == one) {
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                      (&__return_storage_ptr__->solutions,1);
            psVar38 = (__return_storage_ptr__->solutions).
                      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                      _M_impl.super__Vector_impl_data._M_start;
LAB_005d3935:
            convert<baryonyx::itm::maximize_tag>(prVar28,psVar38,iVar95);
          }
          else {
            if (sVar9 == bound) {
              pvVar1 = &__return_storage_ptr__->solutions;
              std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2)
              ;
              convert<baryonyx::itm::maximize_tag>
                        (prVar28,(pvVar1->
                                 super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                 )._M_impl.super__Vector_impl_data._M_start,iVar95);
              prVar28 = storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                        ::get_worst((storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                                     *)(auStack_138 + 8));
              psVar38 = (pvVar1->
                        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>)
                        ._M_impl.super__Vector_impl_data._M_start + 1;
              goto LAB_005d3935;
            }
            if (sVar9 == five) {
              std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                        (&__return_storage_ptr__->solutions,5);
              lVar40 = 0;
              lVar41 = 0;
              do {
                convert<baryonyx::itm::maximize_tag>
                          (vStack_e0.
                           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41],
                           (solution *)
                           ((long)&(((__return_storage_ptr__->solutions).
                                     super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->variables).
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl + lVar40),iVar95);
                lVar41 = lVar41 + 1;
                lVar40 = lVar40 + 0x20;
              } while (lVar41 != 5);
            }
          }
          pcVar24 = uStack_200;
          storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>::
          show_population((storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                           *)(auStack_138 + 8),uStack_200);
          if ((pcVar24->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
            (*(uStack_200->finish)._M_invoker)
                      ((_Any_data *)&uStack_200->finish,__return_storage_ptr__);
          }
          operator_delete__(prVar30);
          if (pdStack_90 != (pointer)0x0) {
            operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
          }
          if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl
              != (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
            operator_delete__(_Stack_b0._M_head_impl);
          }
          _Stack_b0._M_head_impl = (unsigned_long *)0x0;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
            operator_delete__(_Stack_c0._M_head_impl);
          }
          _Stack_c0._M_head_impl = (unsigned_long *)0x0;
          std::
          vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
          ::~vector(&vStack_e0);
          if (piStack_f8 != (int *)0x0) {
            operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
          if (auStack_1c8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_1c8,auStack_1b8._0_8_ - (long)auStack_1c8);
          }
          if ((tuple<int_*,_std::default_delete<int[]>_>)
              qStack_178.linear_elements._M_t.
              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
              super__Head_base<0UL,_double_*,_false>._M_head_impl !=
              (_Head_base<0UL,_int_*,_false>)0x0) {
            operator_delete__((void *)qStack_178.linear_elements._M_t.
                                      super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                      .super__Head_base<0UL,_double_*,_false>._M_head_impl);
          }
          qStack_178.linear_elements._M_t.
          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl =
               (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
               (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
          if ((_Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               )qStack_178.obj != (quad *)0x0) {
            operator_delete__(qStack_178.obj);
          }
          qStack_178.obj = (objective_function *)0x0;
          if ((_Head_base<0UL,_float_*,_false>)auStack_188._8_8_ !=
              (_Head_base<0UL,_float_*,_false>)0x0) {
            operator_delete__((void *)auStack_188._8_8_);
          }
LAB_005d3a74:
          std::
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                     *)auStack_1a0);
          return __return_storage_ptr__;
        }
        if (!is_optimization) {
          prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
                              (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
          return prVar27;
        }
        auVar92 = ZEXT1664((undefined1  [16])0x0);
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->variable_name).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->affected_vars).values.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
        (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
        (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
        (__return_storage_ptr__->affected_vars).names =
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              )auVar57._32_24_;
        (__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)auVar57._56_8_;
        __return_storage_ptr__->remaining_constraints = 0x7fffffff;
        __return_storage_ptr__->annoying_variable = 0;
        __return_storage_ptr__->status = uninitialized;
        if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
        }
        make_merged_constraints
                  ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)auStack_1a0,ctx,pb);
        if ((auStack_1a0._0_8_ == auStack_1a0._8_8_) ||
           ((pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          __return_storage_ptr__->status = success;
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,1);
          (__return_storage_ptr__->solutions).
          super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
          (__return_storage_ptr__->strings).
          super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(__return_storage_ptr__->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(pb->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
          std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                    (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
          goto LAB_005d2be3;
        }
        uVar29 = std::chrono::_V2::system_clock::now();
        uVar42 = (ulong)(ctx->parameters).seed;
        if (uVar42 != 0) {
          uVar29 = uVar42;
        }
        rStack_1d0._M_data =
             (atomic<bool> *)(uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0));
        uVar35 = (int)((ulong)((long)(pb->vars).values.
                                     super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pb->vars).values.
                                    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
        lVar41 = (ulong)uVar35 << 0x20;
        quadratic_cost_type<long_double>::quadratic_cost_type
                  ((quadratic_cost_type<long_double> *)auStack_188,&pb->objective,uVar35);
        dStack_1a8 = (pb->objective).value;
        uVar35 = (ctx->parameters).thread;
        if ((int)uVar35 < 1) {
          uVar35 = std::thread::hardware_concurrency();
        }
        auVar13._8_8_ = 0;
        auVar13._0_8_ = auStack_1b8._8_8_;
        auStack_1b8 = auVar13 << 0x40;
        uVar37 = uVar35 + (uVar35 == 0);
        uVar29 = (ulong)uVar37;
        _auStack_1c8 = (undefined1  [16])0x0;
        std::vector<std::thread,_std::allocator<std::thread>_>::vector
                  (&vStack_150,uVar29,(allocator_type *)auStack_138);
        best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
        ::best_solution_recorder
                  ((best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
                    *)auStack_138,(random_engine *)&rStack_1d0,uVar37,
                   (quadratic_cost_type<long_double> *)auStack_188,dStack_1a8,
                   (int)((ulong)lVar41 >> 0x20),
                   (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)auStack_1a0,(ctx->parameters).init_population_size);
        prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
        uStack_200 = ctx;
        memset(prVar30,0,uVar29 * 8);
        tStack_1f8.tv_sec = 0;
        tStack_1f8.tv_nsec = -1;
        rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                            (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *
                            )&rStack_1d0,(param_type *)&tStack_1f8);
        uVar94 = (uint)((ulong)lVar41 >> 0x20);
        *prVar30 = rVar31;
        if (1 < uVar35) {
          uVar42 = 1;
          do {
            rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                 *)&rStack_1d0,(param_type *)&tStack_1f8);
            prVar30[uVar42] = rVar31;
            uVar32 = uVar42 - 1;
            if (uVar32 != 0) {
              do {
                iVar26 = (int)uVar32;
                if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                  rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                     ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                      (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                       *)&rStack_1d0,(param_type *)&tStack_1f8);
                  prVar30[uVar32 & 0xffffffff] = rVar31;
                  iVar26 = (int)uVar42;
                }
                uVar32 = (ulong)(iVar26 - 1U);
              } while (iVar26 - 1U != 0);
            }
            uVar94 = (uint)((ulong)lVar41 >> 0x20);
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar29);
        }
        pcVar24 = uStack_200;
        uVar35 = 0;
        LOCK();
        lVar41 = (ulong)uVar94 << 0x20;
        UNLOCK();
        tStack_1f8.tv_sec = tStack_1f8.tv_sec & 0xffffffff00000000;
        pvVar3 = (variables *)(auStack_1b8._8_8_ + 0x90);
        do {
          std::
          vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>>>
          ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                    ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>>>
                      *)auStack_1c8,pcVar24,(uint *)&tStack_1f8,prVar30 + uVar35);
          uVar35 = (int)tStack_1f8.tv_sec + 1;
          tStack_1f8.tv_sec = CONCAT44(tStack_1f8.tv_sec._4_4_,uVar35);
        } while (uVar35 != uVar37);
        lVar40 = 0;
        lVar43 = 0;
        qStack_178.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
        _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                        )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                          )pvVar3;
        do {
          tStack_1e8.tv_nsec = (long)&stack0xfffffffffffffdf3;
          tStack_1e8.tv_sec = (__time_t)auStack_138;
          rStack_158._M_data =
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)auStack_1a0;
          rStack_1d8._M_data =
               (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                *)((long)(context **)auStack_1c8 + lVar40);
          qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl =
               (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)auStack_188;
          std::thread::
          thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,long_double,baryonyx::itm::maximize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::quadratic_cost_type<long_double>const>,double&,void>
                    ((thread *)&tStack_1f8,
                     (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>_>
                      *)&rStack_1d8,(reference_wrapper<std::atomic<bool>_> *)&tStack_1e8.tv_nsec,
                     (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>_>
                      *)&tStack_1e8,&rStack_158,(int *)&stack0xfffffffffffffdf4,
                     (reference_wrapper<const_baryonyx::itm::quadratic_cost_type<long_double>_> *)
                     &qStack_178.indices,&dStack_1a8);
          if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start[lVar43]._M_id._M_thread != 0) {
            std::terminate();
          }
          lVar40 = lVar40 + 0xc0;
          vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar43]._M_id._M_thread = tStack_1f8.tv_sec;
          lVar43 = lVar43 + 1;
        } while (uVar37 != (uint)lVar43);
        lVar40 = std::chrono::_V2::steady_clock::now();
        auVar57 = vpbroadcastq_avx512f();
        auStack_78 = vmovdqu64_avx512f(auVar57);
        psVar2 = &uStack_200->update;
        do {
          tStack_1f8.tv_sec = 1;
          tStack_1f8.tv_nsec = 0;
          do {
            ptVar39 = &tStack_1f8;
            iVar26 = nanosleep(&tStack_1f8,&tStack_1f8);
            if (iVar26 != -1) break;
            piVar33 = __errno_location();
          } while (*piVar33 == 4);
          if ((uStack_200->update).super__Function_base._M_manager != (_Manager_type)0x0) {
            auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar92 = vmovdqu64_avx512f(auStack_78);
            auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
            auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
            auVar93 = ZEXT1664((undefined1  [16])0x0);
            uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
            do {
              vpmullq_avx512dq(auVar57,auVar58);
              uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
              auVar60 = vmovdqa64_avx512f(auVar93);
              auVar57 = vpaddq_avx512f(auVar57,auVar59);
              uVar42 = uVar42 - 8;
              auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                            ((long)((long)auStack_1c8 + 0xb0) + (long)ptVar39));
              auVar82._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
              auVar82._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
              auVar82._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
              auVar82._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
              auVar82._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
              auVar82._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
              auVar82._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
              auVar82._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
              auVar93 = vpaddq_avx512f(auVar82,auVar60);
            } while (uVar42 != 0);
            auVar57 = vmovdqa64_avx512f(auVar93);
            bVar5 = (bool)((byte)uVar32 & 1);
            auVar59._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
            bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar59._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
            bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar59._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
            bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar59._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
            bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar59._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
            bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar59._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
            bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar59._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
            auVar59._56_8_ =
                 (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
            auVar44 = vextracti64x4_avx512f(auVar59,1);
            auVar57 = vpaddq_avx512f(auVar59,ZEXT3264(auVar44));
            auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
            auVar13 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpaddq_avx(auVar12,auVar13);
            storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>::
            get_best((storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                      *)(auStack_138 + 8),(int *)&tStack_1e8,(double *)&rStack_1d8,
                     (double *)&tStack_1e8.tv_nsec,&tStack_1f8.tv_sec);
            std::function<void_(int,_double,_long,_double,_long)>::operator()
                      (psVar2,(int)tStack_1e8.tv_sec,(double)rStack_1d8._M_data,tStack_1f8.tv_sec,
                       (double)tStack_1e8.tv_nsec,auVar12._0_8_);
          }
          lVar43 = std::chrono::_V2::steady_clock::now();
          pcVar24 = uStack_200;
          dVar4 = (uStack_200->parameters).time_limit;
        } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar40) / 1000000000.0 <= dVar4));
        LOCK();
        iVar95 = (index)((ulong)lVar41 >> 0x20);
        UNLOCK();
        uVar25 = auStack_1b8._8_8_;
        for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            ptVar36 !=
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
          std::thread::join();
        }
        (__return_storage_ptr__->strings).
        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)uVar25;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__return_storage_ptr__->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + 8));
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(__return_storage_ptr__->affected_vars).names,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)(uVar25 + 0xc0));
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(__return_storage_ptr__->affected_vars).values,
                   (vector<signed_char,_std::allocator<signed_char>_> *)(uVar25 + 0xd8));
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&__return_storage_ptr__->variable_name,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)qStack_178.quadratic_elements._M_t.
                       super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       .
                       super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                       ._M_head_impl);
        __return_storage_ptr__->variables = iVar95;
        __return_storage_ptr__->constraints =
             (int)((ulong)(auStack_1a0._8_8_ - auStack_1a0._0_8_) >> 3) * -0x33333333;
        iVar26 = *piStack_f8;
        iVar8 = vStack_e0.
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
        prVar28 = vStack_e0.
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar26;
        __return_storage_ptr__->status = (uint)(iVar8 != 0) * 3;
        __return_storage_ptr__->duration =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
        __return_storage_ptr__->loop =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
        __return_storage_ptr__->remaining_constraints = iVar8;
        sVar9 = (pcVar24->parameters).storage;
        if (sVar9 == one) {
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,1);
          psVar38 = (__return_storage_ptr__->solutions).
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                    _M_impl.super__Vector_impl_data._M_start;
LAB_005d2aa4:
          convert<baryonyx::itm::maximize_tag>(prVar28,psVar38,iVar95);
        }
        else {
          if (sVar9 == bound) {
            pvVar1 = &__return_storage_ptr__->solutions;
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
            convert<baryonyx::itm::maximize_tag>
                      (prVar28,(pvVar1->
                               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                               )._M_impl.super__Vector_impl_data._M_start,iVar95);
            prVar28 = storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                      ::get_worst((storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                                   *)(auStack_138 + 8));
            psVar38 = (pvVar1->
                      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1;
            goto LAB_005d2aa4;
          }
          if (sVar9 == five) {
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                      (&__return_storage_ptr__->solutions,5);
            lVar40 = 0;
            lVar41 = 0;
            do {
              convert<baryonyx::itm::maximize_tag>
                        (vStack_e0.
                         super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41],
                         (solution *)
                         ((long)&(((__return_storage_ptr__->solutions).
                                   super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->variables).
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl + lVar40),iVar95);
              lVar41 = lVar41 + 1;
              lVar40 = lVar40 + 0x20;
            } while (lVar41 != 5);
          }
        }
        pcVar24 = uStack_200;
        storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>::
        show_population((storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                         *)(auStack_138 + 8),uStack_200);
        if ((pcVar24->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(uStack_200->finish)._M_invoker)
                    ((_Any_data *)&uStack_200->finish,__return_storage_ptr__);
        }
        operator_delete__(prVar30);
        if (pdStack_90 != (pointer)0x0) {
          operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
        }
        if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
            (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
          operator_delete__(_Stack_b0._M_head_impl);
        }
        _Stack_b0._M_head_impl = (unsigned_long *)0x0;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
          operator_delete__(_Stack_c0._M_head_impl);
        }
        _Stack_c0._M_head_impl = (unsigned_long *)0x0;
        std::
        vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
        ::~vector(&vStack_e0);
        if (piStack_f8 != (int *)0x0) {
          operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
        if (auStack_1c8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_1c8,auStack_1b8._0_8_ - (long)auStack_1c8);
        }
        if ((tuple<int_*,_std::default_delete<int[]>_>)
            qStack_178.linear_elements._M_t.
            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl !=
            (_Head_base<0UL,_int_*,_false>)0x0) {
          operator_delete__((void *)qStack_178.linear_elements._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl);
        }
        qStack_178.linear_elements._M_t.
        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl =
             (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
             (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
        if ((_Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             )qStack_178.obj != (quad *)0x0) {
          operator_delete__(qStack_178.obj);
        }
        qStack_178.obj = (objective_function *)0x0;
        if ((_Head_base<0UL,_float_*,_false>)auStack_188._8_8_ !=
            (_Head_base<0UL,_float_*,_false>)0x0) {
          operator_delete__((void *)auStack_188._8_8_);
        }
LAB_005d2be3:
        std::
        vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   *)auStack_1a0);
        return __return_storage_ptr__;
      }
      if (poVar10 == poVar11) {
        if (bVar5 == false) {
          if (!is_optimization) {
            prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>
                                (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
            return prVar27;
          }
          auVar92 = ZEXT1664((undefined1  [16])0x0);
          auVar57 = vmovdqu64_avx512f(auVar92);
          *(undefined1 (*) [64])
           &(__return_storage_ptr__->variable_name).
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = auVar57;
          auVar57 = vmovdqu64_avx512f(auVar92);
          *(undefined1 (*) [64])
           &(__return_storage_ptr__->affected_vars).values.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish = auVar57;
          auVar57 = vmovdqu64_avx512f(auVar92);
          __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
          (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
          (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
          (__return_storage_ptr__->affected_vars).names =
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                )auVar57._32_24_;
          (__return_storage_ptr__->affected_vars).values.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)auVar57._56_8_;
          __return_storage_ptr__->remaining_constraints = 0x7fffffff;
          __return_storage_ptr__->annoying_variable = 0;
          __return_storage_ptr__->status = uninitialized;
          if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
            (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
          }
          make_merged_constraints
                    ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      *)(auStack_1a0 + 0x10),ctx,pb);
          if ((auStack_1a0._16_8_ == auStack_188._0_8_) ||
             ((pb->vars).values.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (pb->vars).values.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            __return_storage_ptr__->status = success;
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                      (&__return_storage_ptr__->solutions,1);
            (__return_storage_ptr__->solutions).
            super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
            (__return_storage_ptr__->strings).
            super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (pb->strings).
                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(__return_storage_ptr__->strings).
                        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                       &(pb->strings).
                        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
            std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                      (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
            std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
            goto LAB_005ebc14;
          }
          uVar29 = std::chrono::_V2::system_clock::now();
          uVar42 = (ulong)(ctx->parameters).seed;
          if (uVar42 != 0) {
            uVar29 = uVar42;
          }
          rStack_1c0._M_x = uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0);
          iVar26 = (int)((ulong)((long)(pb->vars).values.
                                       super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pb->vars).values.
                                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555
          ;
          uStack_200 = (context *)CONCAT44(iVar26,(uint)uStack_200);
          default_cost_type<long_double>::default_cost_type
                    ((default_cost_type<long_double> *)(auStack_188 + 0x10),&pb->objective,iVar26);
          auStack_1a0._8_8_ = (pb->objective).value;
          uVar35 = (ctx->parameters).thread;
          auStack_1a0._0_8_ = pb;
          if ((int)uVar35 < 1) {
            uVar35 = std::thread::hardware_concurrency();
          }
          dStack_1a8 = 0.0;
          uVar37 = uVar35 + (uVar35 == 0);
          uVar29 = (ulong)uVar37;
          auStack_1b8 = (undefined1  [16])0x0;
          std::vector<std::thread,_std::allocator<std::thread>_>::vector
                    (&vStack_150,uVar29,(allocator_type *)auStack_138);
          tStack_1f8.tv_sec = (__time_t)__return_storage_ptr__;
          best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
          ::best_solution_recorder
                    ((best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                      *)auStack_138,(random_engine *)(auStack_1c8 + 8),uVar37,
                     (default_cost_type<long_double> *)(auStack_188 + 0x10),
                     (double)auStack_1a0._8_8_,uStack_200._4_4_,
                     (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      *)(auStack_1a0 + 0x10),(ctx->parameters).init_population_size);
          prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
          tStack_1f8.tv_nsec = (long)ctx;
          memset(prVar30,0,uVar29 * 8);
          tStack_1e8.tv_sec = 0;
          tStack_1e8.tv_nsec = -1;
          rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
          *prVar30 = rVar31;
          if (1 < uVar35) {
            uVar42 = 1;
            do {
              rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                 ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                  (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                   *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
              prVar30[uVar42] = rVar31;
              uVar32 = uVar42 - 1;
              if (uVar32 != 0) {
                do {
                  iVar26 = (int)uVar32;
                  if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                    rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                       ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                        (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                         *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
                    prVar30[uVar32 & 0xffffffff] = rVar31;
                    iVar26 = (int)uVar42;
                  }
                  uVar32 = (ulong)(iVar26 - 1U);
                } while (iVar26 - 1U != 0);
              }
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar29);
          }
          lVar41 = tStack_1f8.tv_nsec;
          uVar35 = 0;
          uStack_200._0_4_ = (uint)(uint3)uStack_200;
          LOCK();
          UNLOCK();
          tStack_1e8.tv_sec = tStack_1e8.tv_sec & 0xffffffff00000000;
          pvVar3 = (variables *)(auStack_1a0._0_8_ + 0x90);
          do {
            std::
            vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>>>
            ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                      ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>>>
                        *)auStack_1b8,(context *)lVar41,(uint *)&tStack_1e8,prVar30 + uVar35);
            uVar35 = (int)tStack_1e8.tv_sec + 1;
            tStack_1e8.tv_sec = CONCAT44(tStack_1e8.tv_sec._4_4_,uVar35);
          } while (uVar35 != uVar37);
          lVar41 = 0;
          lVar40 = 0;
          qStack_178.quadratic_elements._M_t.
          super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
          _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                          )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                            )pvVar3;
          do {
            rStack_1d0._M_data = (atomic<bool> *)((long)&uStack_200 + 3);
            rStack_1d8._M_data =
                 (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                  *)auStack_138;
            rStack_158._M_data =
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)(auStack_1a0 + 0x10);
            auStack_1c8 = (undefined1  [8])(auStack_1b8._0_8_ + lVar41);
            qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl =
                 (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)(auStack_188 + 0x10);
            std::thread::
            thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,long_double,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<long_double>const>,double&,void>
                      ((thread *)&tStack_1e8,
                       (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>
                        *)auStack_1c8,&rStack_1d0,
                       (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>_>
                        *)&rStack_1d8,&rStack_158,(int *)((long)&uStack_200 + 4),
                       (reference_wrapper<const_baryonyx::itm::default_cost_type<long_double>_> *)
                       &qStack_178.indices,(double *)(auStack_1a0 + 8));
            if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start[lVar40]._M_id._M_thread != 0) {
              std::terminate();
            }
            lVar41 = lVar41 + 0xc0;
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start[lVar40]._M_id._M_thread = tStack_1e8.tv_sec;
            lVar40 = lVar40 + 1;
          } while (uVar37 != (uint)lVar40);
          lVar41 = std::chrono::_V2::steady_clock::now();
          auVar57 = vpbroadcastq_avx512f();
          auStack_78 = vmovdqu64_avx512f(auVar57);
          psVar2 = (solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138);
          do {
            tStack_1e8.tv_sec = 1;
            tStack_1e8.tv_nsec = 0;
            do {
              ptVar39 = &tStack_1e8;
              iVar26 = nanosleep(&tStack_1e8,&tStack_1e8);
              if (iVar26 != -1) break;
              piVar33 = __errno_location();
            } while (*piVar33 == 4);
            if ((((solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138))->super__Function_base).
                _M_manager != (_Manager_type)0x0) {
              auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar92 = vmovdqu64_avx512f(auStack_78);
              auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
              auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
              auVar93 = ZEXT1664((undefined1  [16])0x0);
              uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
              do {
                vpmullq_avx512dq(auVar57,auVar58);
                uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
                auVar60 = vmovdqa64_avx512f(auVar93);
                auVar57 = vpaddq_avx512f(auVar57,auVar59);
                uVar42 = uVar42 - 8;
                auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                              ((long)&ptVar39[0xb].tv_sec + auStack_1b8._0_8_));
                auVar86._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
                auVar86._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
                auVar86._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
                auVar86._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
                auVar86._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
                auVar86._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
                auVar86._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
                auVar86._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
                auVar93 = vpaddq_avx512f(auVar86,auVar60);
              } while (uVar42 != 0);
              auVar57 = vmovdqa64_avx512f(auVar93);
              bVar5 = (bool)((byte)uVar32 & 1);
              auVar87._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
              bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar87._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
              bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar87._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
              bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
              auVar87._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
              bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
              auVar87._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
              bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
              auVar87._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
              bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
              auVar87._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
              auVar87._56_8_ =
                   (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
              auVar44 = vextracti64x4_avx512f(auVar87,1);
              auVar57 = vpaddq_avx512f(auVar87,ZEXT3264(auVar44));
              auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
              auVar13 = vpshufd_avx(auVar12,0xee);
              auVar12 = vpaddq_avx(auVar12,auVar13);
              storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>::
              get_best((storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                        *)(auStack_138 + 8),(int *)&rStack_1d8,(double *)auStack_1c8,
                       (double *)&rStack_1d0,&tStack_1e8.tv_sec);
              std::function<void_(int,_double,_long,_double,_long)>::operator()
                        (psVar2,(int)rStack_1d8._M_data,(double)auStack_1c8,tStack_1e8.tv_sec,
                         (double)rStack_1d0._M_data,auVar12._0_8_);
            }
            lVar43 = std::chrono::_V2::steady_clock::now();
            uVar25 = auStack_1a0._0_8_;
            lVar40 = tStack_1f8.tv_nsec;
            dVar4 = ((solver_parameters *)tStack_1f8.tv_nsec)->time_limit;
          } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar41) / 1000000000.0 <= dVar4));
          LOCK();
          uStack_200._0_4_ = CONCAT13(1,(uint3)uStack_200);
          UNLOCK();
          prVar27 = (result *)tStack_1f8.tv_sec;
          for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              tStack_1f8.tv_sec = (__time_t)prVar27,
              ptVar36 !=
              vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
            std::thread::join();
            prVar27 = (result *)tStack_1f8.tv_sec;
          }
          (prVar27->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (((string_buffer_ptr *)uVar25)->
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(prVar27->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(((string_buffer_ptr *)uVar25)->
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&(prVar27->affected_vars).names,
                      (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)(uVar25 + 0xc0));
          std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                    (&(prVar27->affected_vars).values,
                     &((affected_variables *)(uVar25 + 0xc0))->values);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&prVar27->variable_name,
                      (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)qStack_178.quadratic_elements._M_t.
                         super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                         .
                         super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                         ._M_head_impl);
          prVar27->variables = uStack_200._4_4_;
          prVar27->constraints =
               (int)((ulong)(auStack_188._0_8_ - auStack_1a0._16_8_) >> 3) * -0x33333333;
          iVar26 = *piStack_f8;
          iVar8 = vStack_e0.
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
          prVar34 = (raw_result<baryonyx::itm::minimize_tag> *)
                    (vStack_e0.
                     super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar26);
          prVar27->status = (uint)(iVar8 != 0) * 3;
          prVar27->duration =
               vStack_e0.
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
          prVar27->loop =
               vStack_e0.
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
          prVar27->remaining_constraints = iVar8;
          sVar9 = ((solver_parameters *)lVar40)->storage;
          if (sVar9 == one) {
            pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                     (tStack_1f8.tv_sec + 0x68);
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1);
            psVar38 = (pvVar1->
                      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                      _M_impl.super__Vector_impl_data._M_start;
LAB_005ebb11:
            convert<baryonyx::itm::minimize_tag>(prVar34,psVar38,uStack_200._4_4_);
          }
          else {
            if (sVar9 == bound) {
              pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                       (tStack_1f8.tv_sec + 0x68);
              std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2)
              ;
              convert<baryonyx::itm::minimize_tag>
                        (prVar34,(pvVar1->
                                 super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                 )._M_impl.super__Vector_impl_data._M_start,uStack_200._4_4_);
              prVar34 = storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                        ::get_worst((storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                                     *)(auStack_138 + 8));
              psVar38 = (pvVar1->
                        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>)
                        ._M_impl.super__Vector_impl_data._M_start + 1;
              goto LAB_005ebb11;
            }
            if (sVar9 == five) {
              pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                       (tStack_1f8.tv_sec + 0x68);
              std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,5)
              ;
              lVar40 = 0;
              lVar41 = 0;
              do {
                convert<baryonyx::itm::minimize_tag>
                          ((raw_result<baryonyx::itm::minimize_tag> *)
                           (vStack_e0.
                            super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41]),
                           (solution *)
                           ((long)&(((pvVar1->
                                     super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->variables).
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl + lVar40),uStack_200._4_4_);
                lVar41 = lVar41 + 1;
                lVar40 = lVar40 + 0x20;
              } while (lVar41 != 5);
            }
          }
          lVar41 = tStack_1f8.tv_nsec;
          storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>::
          show_population((storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                           *)(auStack_138 + 8),(context *)tStack_1f8.tv_nsec);
          if ((((solver_finished_cb *)(lVar41 + 0x158))->super__Function_base)._M_manager !=
              (_Manager_type)0x0) {
            (*((solver_finished_cb *)(tStack_1f8.tv_nsec + 0x158))->_M_invoker)
                      ((_Any_data *)(tStack_1f8.tv_nsec + 0x158),(result *)tStack_1f8.tv_sec);
          }
          operator_delete__(prVar30);
          if (pdStack_90 != (pointer)0x0) {
            operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
          }
          __return_storage_ptr__ = (result *)tStack_1f8.tv_sec;
          if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl
              != (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
            operator_delete__(_Stack_b0._M_head_impl);
          }
          _Stack_b0._M_head_impl = (unsigned_long *)0x0;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
            operator_delete__(_Stack_c0._M_head_impl);
          }
          _Stack_c0._M_head_impl = (unsigned_long *)0x0;
          std::
          vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
          ::~vector((vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                     *)&vStack_e0);
          if (piStack_f8 != (int *)0x0) {
            operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
          if ((void *)auStack_1b8._0_8_ != (void *)0x0) {
            operator_delete((void *)auStack_1b8._0_8_,(long)dStack_1a8 - auStack_1b8._0_8_);
          }
          if ((tuple<int_*,_std::default_delete<int[]>_>)
              qStack_178.linear_elements._M_t.
              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
              super__Head_base<0UL,_double_*,_false>._M_head_impl !=
              (_Head_base<0UL,_int_*,_false>)0x0) {
            operator_delete__((void *)qStack_178.linear_elements._M_t.
                                      super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                      .super__Head_base<0UL,_double_*,_false>._M_head_impl);
          }
LAB_005ebc14:
          std::
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                     *)(auStack_1a0 + 0x10));
          return __return_storage_ptr__;
        }
        if (!is_optimization) {
          prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>
                              (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
          return prVar27;
        }
        auVar92 = ZEXT1664((undefined1  [16])0x0);
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->variable_name).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->affected_vars).values.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
        (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
        (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
        (__return_storage_ptr__->affected_vars).names =
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              )auVar57._32_24_;
        (__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)auVar57._56_8_;
        __return_storage_ptr__->remaining_constraints = 0x7fffffff;
        __return_storage_ptr__->annoying_variable = 0;
        __return_storage_ptr__->status = uninitialized;
        if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
        }
        make_merged_constraints
                  ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)(auStack_1a0 + 0x10),ctx,pb);
        if ((auStack_1a0._16_8_ == auStack_188._0_8_) ||
           ((pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          __return_storage_ptr__->status = success;
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,1);
          (__return_storage_ptr__->solutions).
          super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
          (__return_storage_ptr__->strings).
          super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(__return_storage_ptr__->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(pb->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
          std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                    (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
          goto LAB_005eadf1;
        }
        uVar29 = std::chrono::_V2::system_clock::now();
        uVar42 = (ulong)(ctx->parameters).seed;
        if (uVar42 != 0) {
          uVar29 = uVar42;
        }
        rStack_1c0._M_x = uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0);
        iVar26 = (int)((ulong)((long)(pb->vars).values.
                                     super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pb->vars).values.
                                    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
        uStack_200 = (context *)CONCAT44(iVar26,(uint)uStack_200);
        default_cost_type<long_double>::default_cost_type
                  ((default_cost_type<long_double> *)(auStack_188 + 0x10),&pb->objective,iVar26);
        auStack_1a0._8_8_ = (pb->objective).value;
        uVar35 = (ctx->parameters).thread;
        auStack_1a0._0_8_ = pb;
        if ((int)uVar35 < 1) {
          uVar35 = std::thread::hardware_concurrency();
        }
        dStack_1a8 = 0.0;
        uVar37 = uVar35 + (uVar35 == 0);
        uVar29 = (ulong)uVar37;
        auStack_1b8 = (undefined1  [16])0x0;
        std::vector<std::thread,_std::allocator<std::thread>_>::vector
                  (&vStack_150,uVar29,(allocator_type *)auStack_138);
        tStack_1f8.tv_sec = (__time_t)__return_storage_ptr__;
        best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
        ::best_solution_recorder
                  ((best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                    *)auStack_138,(random_engine *)(auStack_1c8 + 8),uVar37,
                   (default_cost_type<long_double> *)(auStack_188 + 0x10),(double)auStack_1a0._8_8_,
                   uStack_200._4_4_,
                   (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)(auStack_1a0 + 0x10),(ctx->parameters).init_population_size);
        prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
        tStack_1f8.tv_nsec = (long)ctx;
        memset(prVar30,0,uVar29 * 8);
        tStack_1e8.tv_sec = 0;
        tStack_1e8.tv_nsec = -1;
        rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                            (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *
                            )(auStack_1c8 + 8),(param_type *)&tStack_1e8);
        *prVar30 = rVar31;
        if (1 < uVar35) {
          uVar42 = 1;
          do {
            rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                 *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
            prVar30[uVar42] = rVar31;
            uVar32 = uVar42 - 1;
            if (uVar32 != 0) {
              do {
                iVar26 = (int)uVar32;
                if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                  rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                     ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                      (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                       *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
                  prVar30[uVar32 & 0xffffffff] = rVar31;
                  iVar26 = (int)uVar42;
                }
                uVar32 = (ulong)(iVar26 - 1U);
              } while (iVar26 - 1U != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar29);
        }
        lVar41 = tStack_1f8.tv_nsec;
        uVar35 = 0;
        uStack_200._0_4_ = (uint)(uint3)uStack_200;
        LOCK();
        UNLOCK();
        tStack_1e8.tv_sec = tStack_1e8.tv_sec & 0xffffffff00000000;
        pvVar3 = (variables *)(auStack_1a0._0_8_ + 0x90);
        do {
          std::
          vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>>>
          ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                    ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>>>
                      *)auStack_1b8,(context *)lVar41,(uint *)&tStack_1e8,prVar30 + uVar35);
          uVar35 = (int)tStack_1e8.tv_sec + 1;
          tStack_1e8.tv_sec = CONCAT44(tStack_1e8.tv_sec._4_4_,uVar35);
        } while (uVar35 != uVar37);
        lVar41 = 0;
        lVar40 = 0;
        qStack_178.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
        _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                        )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                          )pvVar3;
        do {
          rStack_1d0._M_data = (atomic<bool> *)((long)&uStack_200 + 3);
          rStack_1d8._M_data =
               (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                *)auStack_138;
          rStack_158._M_data =
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)(auStack_1a0 + 0x10);
          auStack_1c8 = (undefined1  [8])(auStack_1b8._0_8_ + lVar41);
          qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl =
               (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)(auStack_188 + 0x10);
          std::thread::
          thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,long_double,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<long_double>const>,double&,void>
                    ((thread *)&tStack_1e8,
                     (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>
                      *)auStack_1c8,&rStack_1d0,
                     (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>_>
                      *)&rStack_1d8,&rStack_158,(int *)((long)&uStack_200 + 4),
                     (reference_wrapper<const_baryonyx::itm::default_cost_type<long_double>_> *)
                     &qStack_178.indices,(double *)(auStack_1a0 + 8));
          if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start[lVar40]._M_id._M_thread != 0) {
            std::terminate();
          }
          lVar41 = lVar41 + 0xc0;
          vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar40]._M_id._M_thread = tStack_1e8.tv_sec;
          lVar40 = lVar40 + 1;
        } while (uVar37 != (uint)lVar40);
        lVar41 = std::chrono::_V2::steady_clock::now();
        auVar57 = vpbroadcastq_avx512f();
        auStack_78 = vmovdqu64_avx512f(auVar57);
        psVar2 = (solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138);
        do {
          tStack_1e8.tv_sec = 1;
          tStack_1e8.tv_nsec = 0;
          do {
            ptVar39 = &tStack_1e8;
            iVar26 = nanosleep(&tStack_1e8,&tStack_1e8);
            if (iVar26 != -1) break;
            piVar33 = __errno_location();
          } while (*piVar33 == 4);
          if ((((solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138))->super__Function_base)._M_manager
              != (_Manager_type)0x0) {
            auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar92 = vmovdqu64_avx512f(auStack_78);
            auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
            auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
            auVar93 = ZEXT1664((undefined1  [16])0x0);
            uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
            do {
              vpmullq_avx512dq(auVar57,auVar58);
              uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
              auVar60 = vmovdqa64_avx512f(auVar93);
              auVar57 = vpaddq_avx512f(auVar57,auVar59);
              uVar42 = uVar42 - 8;
              auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                            ((long)&ptVar39[0xb].tv_sec + auStack_1b8._0_8_));
              auVar84._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
              auVar84._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
              auVar84._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
              auVar84._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
              auVar84._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
              auVar84._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
              auVar84._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
              auVar84._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
              auVar93 = vpaddq_avx512f(auVar84,auVar60);
            } while (uVar42 != 0);
            auVar57 = vmovdqa64_avx512f(auVar93);
            bVar5 = (bool)((byte)uVar32 & 1);
            auVar85._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
            bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar85._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
            bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar85._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
            bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar85._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
            bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar85._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
            bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar85._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
            bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar85._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
            auVar85._56_8_ =
                 (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
            auVar44 = vextracti64x4_avx512f(auVar85,1);
            auVar57 = vpaddq_avx512f(auVar85,ZEXT3264(auVar44));
            auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
            auVar13 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpaddq_avx(auVar12,auVar13);
            storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>::
            get_best((storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                      *)(auStack_138 + 8),(int *)&rStack_1d8,(double *)auStack_1c8,
                     (double *)&rStack_1d0,&tStack_1e8.tv_sec);
            std::function<void_(int,_double,_long,_double,_long)>::operator()
                      (psVar2,(int)rStack_1d8._M_data,(double)auStack_1c8,tStack_1e8.tv_sec,
                       (double)rStack_1d0._M_data,auVar12._0_8_);
          }
          lVar43 = std::chrono::_V2::steady_clock::now();
          uVar25 = auStack_1a0._0_8_;
          lVar40 = tStack_1f8.tv_nsec;
          dVar4 = ((solver_parameters *)tStack_1f8.tv_nsec)->time_limit;
        } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar41) / 1000000000.0 <= dVar4));
        LOCK();
        uStack_200._0_4_ = CONCAT13(1,(uint3)uStack_200);
        UNLOCK();
        prVar27 = (result *)tStack_1f8.tv_sec;
        for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            tStack_1f8.tv_sec = (__time_t)prVar27,
            ptVar36 !=
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
          std::thread::join();
          prVar27 = (result *)tStack_1f8.tv_sec;
        }
        (prVar27->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (((string_buffer_ptr *)uVar25)->
                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(prVar27->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(((string_buffer_ptr *)uVar25)->
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(prVar27->affected_vars).names,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)(uVar25 + 0xc0));
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(prVar27->affected_vars).values,&((affected_variables *)(uVar25 + 0xc0))->values
                  );
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&prVar27->variable_name,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)qStack_178.quadratic_elements._M_t.
                       super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       .
                       super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                       ._M_head_impl);
        prVar27->variables = uStack_200._4_4_;
        prVar27->constraints =
             (int)((ulong)(auStack_188._0_8_ - auStack_1a0._16_8_) >> 3) * -0x33333333;
        iVar26 = *piStack_f8;
        iVar8 = vStack_e0.
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
        prVar34 = (raw_result<baryonyx::itm::minimize_tag> *)
                  (vStack_e0.
                   super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar26);
        prVar27->status = (uint)(iVar8 != 0) * 3;
        prVar27->duration =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
        prVar27->loop =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
        prVar27->remaining_constraints = iVar8;
        sVar9 = ((solver_parameters *)lVar40)->storage;
        if (sVar9 == one) {
          pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                   (tStack_1f8.tv_sec + 0x68);
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1);
          psVar38 = (pvVar1->
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                    _M_impl.super__Vector_impl_data._M_start;
LAB_005eacee:
          convert<baryonyx::itm::minimize_tag>(prVar34,psVar38,uStack_200._4_4_);
        }
        else {
          if (sVar9 == bound) {
            pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                     (tStack_1f8.tv_sec + 0x68);
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
            convert<baryonyx::itm::minimize_tag>
                      (prVar34,(pvVar1->
                               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                               )._M_impl.super__Vector_impl_data._M_start,uStack_200._4_4_);
            prVar34 = storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                      ::get_worst((storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                                   *)(auStack_138 + 8));
            psVar38 = (pvVar1->
                      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1;
            goto LAB_005eacee;
          }
          if (sVar9 == five) {
            pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                     (tStack_1f8.tv_sec + 0x68);
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,5);
            lVar40 = 0;
            lVar41 = 0;
            do {
              convert<baryonyx::itm::minimize_tag>
                        ((raw_result<baryonyx::itm::minimize_tag> *)
                         (vStack_e0.
                          super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41]),
                         (solution *)
                         ((long)&(((pvVar1->
                                   super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->variables).
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl + lVar40),uStack_200._4_4_);
              lVar41 = lVar41 + 1;
              lVar40 = lVar40 + 0x20;
            } while (lVar41 != 5);
          }
        }
        lVar41 = tStack_1f8.tv_nsec;
        storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>::
        show_population((storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                         *)(auStack_138 + 8),(context *)tStack_1f8.tv_nsec);
        if ((((solver_finished_cb *)(lVar41 + 0x158))->super__Function_base)._M_manager !=
            (_Manager_type)0x0) {
          (*((solver_finished_cb *)(tStack_1f8.tv_nsec + 0x158))->_M_invoker)
                    ((_Any_data *)(tStack_1f8.tv_nsec + 0x158),(result *)tStack_1f8.tv_sec);
        }
        operator_delete__(prVar30);
        if (pdStack_90 != (pointer)0x0) {
          operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
        }
        __return_storage_ptr__ = (result *)tStack_1f8.tv_sec;
        if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
            (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
          operator_delete__(_Stack_b0._M_head_impl);
        }
        _Stack_b0._M_head_impl = (unsigned_long *)0x0;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
          operator_delete__(_Stack_c0._M_head_impl);
        }
        _Stack_c0._M_head_impl = (unsigned_long *)0x0;
        std::
        vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
        ::~vector((vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                   *)&vStack_e0);
        if (piStack_f8 != (int *)0x0) {
          operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
        if ((void *)auStack_1b8._0_8_ != (void *)0x0) {
          operator_delete((void *)auStack_1b8._0_8_,(long)dStack_1a8 - auStack_1b8._0_8_);
        }
        if ((tuple<int_*,_std::default_delete<int[]>_>)
            qStack_178.linear_elements._M_t.
            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl !=
            (_Head_base<0UL,_int_*,_false>)0x0) {
          operator_delete__((void *)qStack_178.linear_elements._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl);
        }
LAB_005eadf1:
        std::
        vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   *)(auStack_1a0 + 0x10));
        return __return_storage_ptr__;
      }
      if (bVar5 == false) {
        if (!is_optimization) {
          prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
                              (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
          return prVar27;
        }
        auVar92 = ZEXT1664((undefined1  [16])0x0);
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->variable_name).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->affected_vars).values.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
        (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
        (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
        (__return_storage_ptr__->affected_vars).names =
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              )auVar57._32_24_;
        (__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)auVar57._56_8_;
        __return_storage_ptr__->remaining_constraints = 0x7fffffff;
        __return_storage_ptr__->annoying_variable = 0;
        __return_storage_ptr__->status = uninitialized;
        if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
        }
        make_merged_constraints
                  ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)auStack_1a0,ctx,pb);
        if ((auStack_1a0._0_8_ == auStack_1a0._8_8_) ||
           ((pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          __return_storage_ptr__->status = success;
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,1);
          (__return_storage_ptr__->solutions).
          super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
          (__return_storage_ptr__->strings).
          super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(__return_storage_ptr__->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(pb->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
          std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                    (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
          goto LAB_00605afe;
        }
        uVar29 = std::chrono::_V2::system_clock::now();
        uVar42 = (ulong)(ctx->parameters).seed;
        if (uVar42 != 0) {
          uVar29 = uVar42;
        }
        rStack_1d0._M_data =
             (atomic<bool> *)(uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0));
        uVar35 = (int)((ulong)((long)(pb->vars).values.
                                     super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pb->vars).values.
                                    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
        lVar41 = (ulong)uVar35 << 0x20;
        quadratic_cost_type<long_double>::quadratic_cost_type
                  ((quadratic_cost_type<long_double> *)auStack_188,&pb->objective,uVar35);
        dStack_1a8 = (pb->objective).value;
        uVar35 = (ctx->parameters).thread;
        if ((int)uVar35 < 1) {
          uVar35 = std::thread::hardware_concurrency();
        }
        auVar23._8_8_ = 0;
        auVar23._0_8_ = auStack_1b8._8_8_;
        auStack_1b8 = auVar23 << 0x40;
        uVar37 = uVar35 + (uVar35 == 0);
        uVar29 = (ulong)uVar37;
        _auStack_1c8 = (undefined1  [16])0x0;
        std::vector<std::thread,_std::allocator<std::thread>_>::vector
                  (&vStack_150,uVar29,(allocator_type *)auStack_138);
        best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
        ::best_solution_recorder
                  ((best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                    *)auStack_138,(random_engine *)&rStack_1d0,uVar37,
                   (quadratic_cost_type<long_double> *)auStack_188,dStack_1a8,
                   (int)((ulong)lVar41 >> 0x20),
                   (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)auStack_1a0,(ctx->parameters).init_population_size);
        prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
        uStack_200 = ctx;
        memset(prVar30,0,uVar29 * 8);
        tStack_1f8.tv_sec = 0;
        tStack_1f8.tv_nsec = -1;
        rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                            (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *
                            )&rStack_1d0,(param_type *)&tStack_1f8);
        uVar94 = (uint)((ulong)lVar41 >> 0x20);
        *prVar30 = rVar31;
        if (1 < uVar35) {
          uVar42 = 1;
          do {
            rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                 *)&rStack_1d0,(param_type *)&tStack_1f8);
            prVar30[uVar42] = rVar31;
            uVar32 = uVar42 - 1;
            if (uVar32 != 0) {
              do {
                iVar26 = (int)uVar32;
                if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                  rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                     ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                      (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                       *)&rStack_1d0,(param_type *)&tStack_1f8);
                  prVar30[uVar32 & 0xffffffff] = rVar31;
                  iVar26 = (int)uVar42;
                }
                uVar32 = (ulong)(iVar26 - 1U);
              } while (iVar26 - 1U != 0);
            }
            uVar94 = (uint)((ulong)lVar41 >> 0x20);
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar29);
        }
        pcVar24 = uStack_200;
        uVar35 = 0;
        LOCK();
        lVar41 = (ulong)uVar94 << 0x20;
        UNLOCK();
        tStack_1f8.tv_sec = tStack_1f8.tv_sec & 0xffffffff00000000;
        pvVar3 = (variables *)(auStack_1b8._8_8_ + 0x90);
        do {
          std::
          vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>>>
          ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                    ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>>>
                      *)auStack_1c8,pcVar24,(uint *)&tStack_1f8,prVar30 + uVar35);
          uVar35 = (int)tStack_1f8.tv_sec + 1;
          tStack_1f8.tv_sec = CONCAT44(tStack_1f8.tv_sec._4_4_,uVar35);
        } while (uVar35 != uVar37);
        lVar40 = 0;
        lVar43 = 0;
        qStack_178.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
        _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                        )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                          )pvVar3;
        do {
          tStack_1e8.tv_nsec = (long)&stack0xfffffffffffffdf3;
          tStack_1e8.tv_sec = (__time_t)auStack_138;
          rStack_158._M_data =
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)auStack_1a0;
          rStack_1d8._M_data =
               (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                *)((long)(context **)auStack_1c8 + lVar40);
          qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl =
               (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)auStack_188;
          std::thread::
          thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,long_double,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::quadratic_cost_type<long_double>const>,double&,void>
                    ((thread *)&tStack_1f8,
                     (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>_>
                      *)&rStack_1d8,(reference_wrapper<std::atomic<bool>_> *)&tStack_1e8.tv_nsec,
                     (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>_>
                      *)&tStack_1e8,&rStack_158,(int *)&stack0xfffffffffffffdf4,
                     (reference_wrapper<const_baryonyx::itm::quadratic_cost_type<long_double>_> *)
                     &qStack_178.indices,&dStack_1a8);
          if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start[lVar43]._M_id._M_thread != 0) {
            std::terminate();
          }
          lVar40 = lVar40 + 0xc0;
          vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar43]._M_id._M_thread = tStack_1f8.tv_sec;
          lVar43 = lVar43 + 1;
        } while (uVar37 != (uint)lVar43);
        lVar40 = std::chrono::_V2::steady_clock::now();
        auVar57 = vpbroadcastq_avx512f();
        auStack_78 = vmovdqu64_avx512f(auVar57);
        psVar2 = &uStack_200->update;
        do {
          tStack_1f8.tv_sec = 1;
          tStack_1f8.tv_nsec = 0;
          do {
            ptVar39 = &tStack_1f8;
            iVar26 = nanosleep(&tStack_1f8,&tStack_1f8);
            if (iVar26 != -1) break;
            piVar33 = __errno_location();
          } while (*piVar33 == 4);
          if ((uStack_200->update).super__Function_base._M_manager != (_Manager_type)0x0) {
            auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar92 = vmovdqu64_avx512f(auStack_78);
            auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
            auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
            auVar93 = ZEXT1664((undefined1  [16])0x0);
            uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
            do {
              vpmullq_avx512dq(auVar57,auVar58);
              uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
              auVar60 = vmovdqa64_avx512f(auVar93);
              auVar57 = vpaddq_avx512f(auVar57,auVar59);
              uVar42 = uVar42 - 8;
              auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                            ((long)((long)auStack_1c8 + 0xb0) + (long)ptVar39));
              auVar90._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
              auVar90._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
              auVar90._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
              auVar90._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
              auVar90._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
              auVar90._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
              auVar90._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
              auVar90._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
              auVar93 = vpaddq_avx512f(auVar90,auVar60);
            } while (uVar42 != 0);
            auVar57 = vmovdqa64_avx512f(auVar93);
            bVar5 = (bool)((byte)uVar32 & 1);
            auVar91._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
            bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar91._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
            bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar91._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
            bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar91._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
            bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar91._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
            bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar91._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
            bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar91._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
            auVar91._56_8_ =
                 (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
            auVar44 = vextracti64x4_avx512f(auVar91,1);
            auVar57 = vpaddq_avx512f(auVar91,ZEXT3264(auVar44));
            auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
            auVar13 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpaddq_avx(auVar12,auVar13);
            storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag>::
            get_best((storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                      *)(auStack_138 + 8),(int *)&tStack_1e8,(double *)&rStack_1d8,
                     (double *)&tStack_1e8.tv_nsec,&tStack_1f8.tv_sec);
            std::function<void_(int,_double,_long,_double,_long)>::operator()
                      (psVar2,(int)tStack_1e8.tv_sec,(double)rStack_1d8._M_data,tStack_1f8.tv_sec,
                       (double)tStack_1e8.tv_nsec,auVar12._0_8_);
          }
          lVar43 = std::chrono::_V2::steady_clock::now();
          pcVar24 = uStack_200;
          dVar4 = (uStack_200->parameters).time_limit;
        } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar40) / 1000000000.0 <= dVar4));
        LOCK();
        iVar95 = (index)((ulong)lVar41 >> 0x20);
        UNLOCK();
        uVar25 = auStack_1b8._8_8_;
        for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            ptVar36 !=
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
          std::thread::join();
        }
        (__return_storage_ptr__->strings).
        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)uVar25;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__return_storage_ptr__->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + 8));
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(__return_storage_ptr__->affected_vars).names,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)(uVar25 + 0xc0));
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(__return_storage_ptr__->affected_vars).values,
                   (vector<signed_char,_std::allocator<signed_char>_> *)(uVar25 + 0xd8));
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&__return_storage_ptr__->variable_name,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)qStack_178.quadratic_elements._M_t.
                       super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       .
                       super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                       ._M_head_impl);
        __return_storage_ptr__->variables = iVar95;
        __return_storage_ptr__->constraints =
             (int)((ulong)(auStack_1a0._8_8_ - auStack_1a0._0_8_) >> 3) * -0x33333333;
        iVar26 = *piStack_f8;
        iVar8 = vStack_e0.
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
        prVar34 = (raw_result<baryonyx::itm::minimize_tag> *)
                  (vStack_e0.
                   super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar26);
        __return_storage_ptr__->status = (uint)(iVar8 != 0) * 3;
        __return_storage_ptr__->duration =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
        __return_storage_ptr__->loop =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
        __return_storage_ptr__->remaining_constraints = iVar8;
        sVar9 = (pcVar24->parameters).storage;
        if (sVar9 == one) {
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,1);
          psVar38 = (__return_storage_ptr__->solutions).
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                    _M_impl.super__Vector_impl_data._M_start;
LAB_006059bf:
          convert<baryonyx::itm::minimize_tag>(prVar34,psVar38,iVar95);
        }
        else {
          if (sVar9 == bound) {
            pvVar1 = &__return_storage_ptr__->solutions;
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
            convert<baryonyx::itm::minimize_tag>
                      (prVar34,(pvVar1->
                               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                               )._M_impl.super__Vector_impl_data._M_start,iVar95);
            prVar34 = storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                      ::get_worst((storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                                   *)(auStack_138 + 8));
            psVar38 = (pvVar1->
                      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1;
            goto LAB_006059bf;
          }
          if (sVar9 == five) {
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                      (&__return_storage_ptr__->solutions,5);
            lVar40 = 0;
            lVar41 = 0;
            do {
              convert<baryonyx::itm::minimize_tag>
                        ((raw_result<baryonyx::itm::minimize_tag> *)
                         (vStack_e0.
                          super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41]),
                         (solution *)
                         ((long)&(((__return_storage_ptr__->solutions).
                                   super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->variables).
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl + lVar40),iVar95);
              lVar41 = lVar41 + 1;
              lVar40 = lVar40 + 0x20;
            } while (lVar41 != 5);
          }
        }
        pcVar24 = uStack_200;
        storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag>::
        show_population((storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                         *)(auStack_138 + 8),uStack_200);
        if ((pcVar24->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(uStack_200->finish)._M_invoker)
                    ((_Any_data *)&uStack_200->finish,__return_storage_ptr__);
        }
        operator_delete__(prVar30);
        if (pdStack_90 != (pointer)0x0) {
          operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
        }
        if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
            (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
          operator_delete__(_Stack_b0._M_head_impl);
        }
        _Stack_b0._M_head_impl = (unsigned_long *)0x0;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
          operator_delete__(_Stack_c0._M_head_impl);
        }
        _Stack_c0._M_head_impl = (unsigned_long *)0x0;
        std::
        vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
        ::~vector((vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                   *)&vStack_e0);
        if (piStack_f8 != (int *)0x0) {
          operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
        if (auStack_1c8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_1c8,auStack_1b8._0_8_ - (long)auStack_1c8);
        }
        if ((tuple<int_*,_std::default_delete<int[]>_>)
            qStack_178.linear_elements._M_t.
            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl !=
            (_Head_base<0UL,_int_*,_false>)0x0) {
          operator_delete__((void *)qStack_178.linear_elements._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl);
        }
        qStack_178.linear_elements._M_t.
        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl =
             (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
             (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
        if ((_Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             )qStack_178.obj != (quad *)0x0) {
          operator_delete__(qStack_178.obj);
        }
        qStack_178.obj = (objective_function *)0x0;
        if ((_Head_base<0UL,_float_*,_false>)auStack_188._8_8_ !=
            (_Head_base<0UL,_float_*,_false>)0x0) {
          operator_delete__((void *)auStack_188._8_8_);
        }
LAB_00605afe:
        std::
        vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   *)auStack_1a0);
        return __return_storage_ptr__;
      }
      if (!is_optimization) {
        prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
                            (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
        return prVar27;
      }
      auVar92 = ZEXT1664((undefined1  [16])0x0);
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->variable_name).
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
      (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
      (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
      (__return_storage_ptr__->affected_vars).names =
           (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            )auVar57._32_24_;
      (__return_storage_ptr__->affected_vars).values.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)auVar57._56_8_;
      __return_storage_ptr__->remaining_constraints = 0x7fffffff;
      __return_storage_ptr__->annoying_variable = 0;
      __return_storage_ptr__->status = uninitialized;
      if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
      }
      make_merged_constraints
                ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)auStack_1a0,ctx,pb);
      if ((auStack_1a0._0_8_ == auStack_1a0._8_8_) ||
         ((pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        __return_storage_ptr__->status = success;
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,1);
        (__return_storage_ptr__->solutions).
        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
        (__return_storage_ptr__->strings).
        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__return_storage_ptr__->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(pb->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
        goto LAB_00604c6d;
      }
      uVar29 = std::chrono::_V2::system_clock::now();
      uVar42 = (ulong)(ctx->parameters).seed;
      if (uVar42 != 0) {
        uVar29 = uVar42;
      }
      rStack_1d0._M_data = (atomic<bool> *)(uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0))
      ;
      uVar35 = (int)((ulong)((long)(pb->vars).values.
                                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pb->vars).values.
                                  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
      lVar41 = (ulong)uVar35 << 0x20;
      quadratic_cost_type<long_double>::quadratic_cost_type
                ((quadratic_cost_type<long_double> *)auStack_188,&pb->objective,uVar35);
      dStack_1a8 = (pb->objective).value;
      uVar35 = (ctx->parameters).thread;
      if ((int)uVar35 < 1) {
        uVar35 = std::thread::hardware_concurrency();
      }
      auVar22._8_8_ = 0;
      auVar22._0_8_ = auStack_1b8._8_8_;
      auStack_1b8 = auVar22 << 0x40;
      uVar37 = uVar35 + (uVar35 == 0);
      uVar29 = (ulong)uVar37;
      _auStack_1c8 = (undefined1  [16])0x0;
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                (&vStack_150,uVar29,(allocator_type *)auStack_138);
      best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
      ::best_solution_recorder
                ((best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                  *)auStack_138,(random_engine *)&rStack_1d0,uVar37,
                 (quadratic_cost_type<long_double> *)auStack_188,dStack_1a8,
                 (int)((ulong)lVar41 >> 0x20),
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)auStack_1a0,(ctx->parameters).init_population_size);
      prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
      uStack_200 = ctx;
      memset(prVar30,0,uVar29 * 8);
      tStack_1f8.tv_sec = 0;
      tStack_1f8.tv_nsec = -1;
      rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                         ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          &rStack_1d0,(param_type *)&tStack_1f8);
      uVar94 = (uint)((ulong)lVar41 >> 0x20);
      *prVar30 = rVar31;
      if (1 < uVar35) {
        uVar42 = 1;
        do {
          rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)&rStack_1d0,(param_type *)&tStack_1f8);
          prVar30[uVar42] = rVar31;
          uVar32 = uVar42 - 1;
          if (uVar32 != 0) {
            do {
              iVar26 = (int)uVar32;
              if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                   ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                    (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                     *)&rStack_1d0,(param_type *)&tStack_1f8);
                prVar30[uVar32 & 0xffffffff] = rVar31;
                iVar26 = (int)uVar42;
              }
              uVar32 = (ulong)(iVar26 - 1U);
            } while (iVar26 - 1U != 0);
          }
          uVar94 = (uint)((ulong)lVar41 >> 0x20);
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar29);
      }
      pcVar24 = uStack_200;
      uVar35 = 0;
      LOCK();
      lVar41 = (ulong)uVar94 << 0x20;
      UNLOCK();
      tStack_1f8.tv_sec = tStack_1f8.tv_sec & 0xffffffff00000000;
      pvVar3 = (variables *)(auStack_1b8._8_8_ + 0x90);
      do {
        std::
        vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>>>
        ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                  ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>>>
                    *)auStack_1c8,pcVar24,(uint *)&tStack_1f8,prVar30 + uVar35);
        uVar35 = (int)tStack_1f8.tv_sec + 1;
        tStack_1f8.tv_sec = CONCAT44(tStack_1f8.tv_sec._4_4_,uVar35);
      } while (uVar35 != uVar37);
      lVar40 = 0;
      lVar43 = 0;
      qStack_178.quadratic_elements._M_t.
      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl
           = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
              )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                )pvVar3;
      do {
        tStack_1e8.tv_nsec = (long)&stack0xfffffffffffffdf3;
        tStack_1e8.tv_sec = (__time_t)auStack_138;
        rStack_158._M_data =
             (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              *)auStack_1a0;
        rStack_1d8._M_data =
             (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
              *)((long)(context **)auStack_1c8 + lVar40);
        qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl =
             (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)auStack_188;
        std::thread::
        thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,long_double,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::quadratic_cost_type<long_double>const>,double&,void>
                  ((thread *)&tStack_1f8,
                   (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>_>
                    *)&rStack_1d8,(reference_wrapper<std::atomic<bool>_> *)&tStack_1e8.tv_nsec,
                   (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>_>
                    *)&tStack_1e8,&rStack_158,(int *)&stack0xfffffffffffffdf4,
                   (reference_wrapper<const_baryonyx::itm::quadratic_cost_type<long_double>_> *)
                   &qStack_178.indices,&dStack_1a8);
        if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start[lVar43]._M_id._M_thread != 0) {
          std::terminate();
        }
        lVar40 = lVar40 + 0xc0;
        vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[lVar43]._M_id._M_thread = tStack_1f8.tv_sec;
        lVar43 = lVar43 + 1;
      } while (uVar37 != (uint)lVar43);
      lVar40 = std::chrono::_V2::steady_clock::now();
      auVar57 = vpbroadcastq_avx512f();
      auStack_78 = vmovdqu64_avx512f(auVar57);
      psVar2 = &uStack_200->update;
      do {
        tStack_1f8.tv_sec = 1;
        tStack_1f8.tv_nsec = 0;
        do {
          ptVar39 = &tStack_1f8;
          iVar26 = nanosleep(&tStack_1f8,&tStack_1f8);
          if (iVar26 != -1) break;
          piVar33 = __errno_location();
        } while (*piVar33 == 4);
        if ((uStack_200->update).super__Function_base._M_manager != (_Manager_type)0x0) {
          auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar92 = vmovdqu64_avx512f(auStack_78);
          auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
          auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
          auVar93 = ZEXT1664((undefined1  [16])0x0);
          uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
          do {
            vpmullq_avx512dq(auVar57,auVar58);
            uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
            auVar60 = vmovdqa64_avx512f(auVar93);
            auVar57 = vpaddq_avx512f(auVar57,auVar59);
            uVar42 = uVar42 - 8;
            auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                          ((long)((long)auStack_1c8 + 0xb0) + (long)ptVar39));
            auVar88._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
            auVar88._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
            auVar88._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
            auVar88._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
            auVar88._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
            auVar88._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
            auVar88._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
            auVar88._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
            auVar93 = vpaddq_avx512f(auVar88,auVar60);
          } while (uVar42 != 0);
          auVar57 = vmovdqa64_avx512f(auVar93);
          bVar5 = (bool)((byte)uVar32 & 1);
          auVar89._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
          bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar89._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
          bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar89._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
          bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar89._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
          bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar89._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
          bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar89._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
          bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar89._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
          auVar89._56_8_ =
               (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
          auVar44 = vextracti64x4_avx512f(auVar89,1);
          auVar57 = vpaddq_avx512f(auVar89,ZEXT3264(auVar44));
          auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
          auVar13 = vpshufd_avx(auVar12,0xee);
          auVar12 = vpaddq_avx(auVar12,auVar13);
          storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag>::
          get_best((storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                    *)(auStack_138 + 8),(int *)&tStack_1e8,(double *)&rStack_1d8,
                   (double *)&tStack_1e8.tv_nsec,&tStack_1f8.tv_sec);
          std::function<void_(int,_double,_long,_double,_long)>::operator()
                    (psVar2,(int)tStack_1e8.tv_sec,(double)rStack_1d8._M_data,tStack_1f8.tv_sec,
                     (double)tStack_1e8.tv_nsec,auVar12._0_8_);
        }
        lVar43 = std::chrono::_V2::steady_clock::now();
        pcVar24 = uStack_200;
        dVar4 = (uStack_200->parameters).time_limit;
      } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar40) / 1000000000.0 <= dVar4));
      LOCK();
      iVar95 = (index)((ulong)lVar41 >> 0x20);
      UNLOCK();
      uVar25 = auStack_1b8._8_8_;
      for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ptVar36 !=
          vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
        std::thread::join();
      }
      (__return_storage_ptr__->strings).
      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)uVar25;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(__return_storage_ptr__->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + 8));
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&(__return_storage_ptr__->affected_vars).names,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)(uVar25 + 0xc0));
      std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                (&(__return_storage_ptr__->affected_vars).values,
                 (vector<signed_char,_std::allocator<signed_char>_> *)(uVar25 + 0xd8));
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&__return_storage_ptr__->variable_name,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)qStack_178.quadratic_elements._M_t.
                     super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     .
                     super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                     ._M_head_impl);
      __return_storage_ptr__->variables = iVar95;
      __return_storage_ptr__->constraints =
           (int)((ulong)(auStack_1a0._8_8_ - auStack_1a0._0_8_) >> 3) * -0x33333333;
      iVar26 = *piStack_f8;
      iVar8 = vStack_e0.
              super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
      prVar34 = (raw_result<baryonyx::itm::minimize_tag> *)
                (vStack_e0.
                 super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar26);
      __return_storage_ptr__->status = (uint)(iVar8 != 0) * 3;
      __return_storage_ptr__->duration =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
      __return_storage_ptr__->loop =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
      __return_storage_ptr__->remaining_constraints = iVar8;
      sVar9 = (pcVar24->parameters).storage;
      if (sVar9 == one) {
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,1);
        psVar38 = (__return_storage_ptr__->solutions).
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                  _M_impl.super__Vector_impl_data._M_start;
LAB_00604b2e:
        convert<baryonyx::itm::minimize_tag>(prVar34,psVar38,iVar95);
      }
      else {
        if (sVar9 == bound) {
          pvVar1 = &__return_storage_ptr__->solutions;
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
          convert<baryonyx::itm::minimize_tag>
                    (prVar34,(pvVar1->
                             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                             )._M_impl.super__Vector_impl_data._M_start,iVar95);
          prVar34 = storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                    ::get_worst((storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                                 *)(auStack_138 + 8));
          psVar38 = (pvVar1->
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                    _M_impl.super__Vector_impl_data._M_start + 1;
          goto LAB_00604b2e;
        }
        if (sVar9 == five) {
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,5);
          lVar40 = 0;
          lVar41 = 0;
          do {
            convert<baryonyx::itm::minimize_tag>
                      ((raw_result<baryonyx::itm::minimize_tag> *)
                       (vStack_e0.
                        super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41]),
                       (solution *)
                       ((long)&(((__return_storage_ptr__->solutions).
                                 super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->variables).
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                       + lVar40),iVar95);
            lVar41 = lVar41 + 1;
            lVar40 = lVar40 + 0x20;
          } while (lVar41 != 5);
        }
      }
      pcVar24 = uStack_200;
      storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag>::
      show_population((storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag>
                       *)(auStack_138 + 8),uStack_200);
      if ((pcVar24->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(uStack_200->finish)._M_invoker)((_Any_data *)&uStack_200->finish,__return_storage_ptr__);
      }
      operator_delete__(prVar30);
      if (pdStack_90 != (pointer)0x0) {
        operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
      }
      if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
          (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
        operator_delete__(_Stack_b0._M_head_impl);
      }
      _Stack_b0._M_head_impl = (unsigned_long *)0x0;
      if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
          _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
        operator_delete__(_Stack_c0._M_head_impl);
      }
      _Stack_c0._M_head_impl = (unsigned_long *)0x0;
      std::
      vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
      ::~vector((vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 *)&vStack_e0);
      if (piStack_f8 != (int *)0x0) {
        operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
      if (auStack_1c8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_1c8,auStack_1b8._0_8_ - (long)auStack_1c8);
      }
      if ((tuple<int_*,_std::default_delete<int[]>_>)
          qStack_178.linear_elements._M_t.
          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0)
      {
        operator_delete__((void *)qStack_178.linear_elements._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl);
      }
      qStack_178.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
      if ((_Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
           )qStack_178.obj != (quad *)0x0) {
        operator_delete__(qStack_178.obj);
      }
      qStack_178.obj = (objective_function *)0x0;
      if ((_Head_base<0UL,_float_*,_false>)auStack_188._8_8_ != (_Head_base<0UL,_float_*,_false>)0x0
         ) {
        operator_delete__((void *)auStack_188._8_8_);
      }
LAB_00604c6d:
      std::
      vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
      ~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)auStack_1a0);
      return __return_storage_ptr__;
    }
    if (oVar7 == maximize) {
      if (poVar10 == poVar11) {
        if (bVar5 == false) {
          if (!is_optimization) {
            prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>
                                (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
            return prVar27;
          }
          auVar92 = ZEXT1664((undefined1  [16])0x0);
          auVar57 = vmovdqu64_avx512f(auVar92);
          *(undefined1 (*) [64])
           &(__return_storage_ptr__->variable_name).
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = auVar57;
          auVar57 = vmovdqu64_avx512f(auVar92);
          *(undefined1 (*) [64])
           &(__return_storage_ptr__->affected_vars).values.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish = auVar57;
          auVar57 = vmovdqu64_avx512f(auVar92);
          __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
          (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
          (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
          (__return_storage_ptr__->affected_vars).names =
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                )auVar57._32_24_;
          (__return_storage_ptr__->affected_vars).values.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)auVar57._56_8_;
          __return_storage_ptr__->remaining_constraints = 0x7fffffff;
          __return_storage_ptr__->annoying_variable = 0;
          __return_storage_ptr__->status = uninitialized;
          if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
            (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
          }
          make_merged_constraints
                    ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      *)(auStack_1a0 + 0x10),ctx,pb);
          if ((auStack_1a0._16_8_ == auStack_188._0_8_) ||
             ((pb->vars).values.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (pb->vars).values.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            __return_storage_ptr__->status = success;
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                      (&__return_storage_ptr__->solutions,1);
            (__return_storage_ptr__->solutions).
            super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
            (__return_storage_ptr__->strings).
            super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (pb->strings).
                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(__return_storage_ptr__->strings).
                        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                       &(pb->strings).
                        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
            std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                      (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
            std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
            goto LAB_004f59b9;
          }
          uVar29 = std::chrono::_V2::system_clock::now();
          uVar42 = (ulong)(ctx->parameters).seed;
          if (uVar42 != 0) {
            uVar29 = uVar42;
          }
          rStack_1c0._M_x = uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0);
          iVar26 = (int)((ulong)((long)(pb->vars).values.
                                       super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pb->vars).values.
                                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555
          ;
          uStack_200 = (context *)CONCAT44(iVar26,(uint)uStack_200);
          default_cost_type<float>::default_cost_type
                    ((default_cost_type<float> *)(auStack_188 + 0x10),&pb->objective,iVar26);
          auStack_1a0._8_8_ = (pb->objective).value;
          uVar35 = (ctx->parameters).thread;
          auStack_1a0._0_8_ = pb;
          if ((int)uVar35 < 1) {
            uVar35 = std::thread::hardware_concurrency();
          }
          dStack_1a8 = 0.0;
          uVar37 = uVar35 + (uVar35 == 0);
          uVar29 = (ulong)uVar37;
          auStack_1b8 = (undefined1  [16])0x0;
          std::vector<std::thread,_std::allocator<std::thread>_>::vector
                    (&vStack_150,uVar29,(allocator_type *)auStack_138);
          tStack_1f8.tv_sec = (__time_t)__return_storage_ptr__;
          best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
          ::best_solution_recorder
                    ((best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
                      *)auStack_138,(random_engine *)(auStack_1c8 + 8),uVar37,
                     (default_cost_type<float> *)(auStack_188 + 0x10),(double)auStack_1a0._8_8_,
                     uStack_200._4_4_,
                     (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      *)(auStack_1a0 + 0x10),(ctx->parameters).init_population_size);
          prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
          tStack_1f8.tv_nsec = (long)ctx;
          memset(prVar30,0,uVar29 * 8);
          tStack_1e8.tv_sec = 0;
          tStack_1e8.tv_nsec = -1;
          rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
          *prVar30 = rVar31;
          if (1 < uVar35) {
            uVar42 = 1;
            do {
              rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                 ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                  (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                   *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
              prVar30[uVar42] = rVar31;
              uVar32 = uVar42 - 1;
              if (uVar32 != 0) {
                do {
                  iVar26 = (int)uVar32;
                  if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                    rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                       ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                        (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                         *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
                    prVar30[uVar32 & 0xffffffff] = rVar31;
                    iVar26 = (int)uVar42;
                  }
                  uVar32 = (ulong)(iVar26 - 1U);
                } while (iVar26 - 1U != 0);
              }
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar29);
          }
          lVar41 = tStack_1f8.tv_nsec;
          uVar35 = 0;
          uStack_200._0_4_ = (uint)(uint3)uStack_200;
          LOCK();
          UNLOCK();
          tStack_1e8.tv_sec = tStack_1e8.tv_sec & 0xffffffff00000000;
          pvVar3 = (variables *)(auStack_1a0._0_8_ + 0x90);
          do {
            std::
            vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>>>
            ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                      ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>>>
                        *)auStack_1b8,(context *)lVar41,(uint *)&tStack_1e8,prVar30 + uVar35);
            uVar35 = (int)tStack_1e8.tv_sec + 1;
            tStack_1e8.tv_sec = CONCAT44(tStack_1e8.tv_sec._4_4_,uVar35);
          } while (uVar35 != uVar37);
          lVar41 = 0;
          lVar40 = 0;
          qStack_178.quadratic_elements._M_t.
          super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
          _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                          )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                            )pvVar3;
          do {
            rStack_1d0._M_data = (atomic<bool> *)((long)&uStack_200 + 3);
            rStack_1d8._M_data =
                 (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                  *)auStack_138;
            rStack_158._M_data =
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)(auStack_1a0 + 0x10);
            auStack_1c8 = (undefined1  [8])(auStack_1b8._0_8_ + lVar41);
            qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl =
                 (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)(auStack_188 + 0x10);
            std::thread::
            thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<float>,float,baryonyx::itm::maximize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<float>const>,double&,void>
                      ((thread *)&tStack_1e8,
                       (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>_>_>
                        *)auStack_1c8,&rStack_1d0,
                       (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::maximize_tag>_>
                        *)&rStack_1d8,&rStack_158,(int *)((long)&uStack_200 + 4),
                       (reference_wrapper<const_baryonyx::itm::default_cost_type<float>_> *)
                       &qStack_178.indices,(double *)(auStack_1a0 + 8));
            if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start[lVar40]._M_id._M_thread != 0) {
              std::terminate();
            }
            lVar41 = lVar41 + 0xc0;
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start[lVar40]._M_id._M_thread = tStack_1e8.tv_sec;
            lVar40 = lVar40 + 1;
          } while (uVar37 != (uint)lVar40);
          lVar41 = std::chrono::_V2::steady_clock::now();
          auVar57 = vpbroadcastq_avx512f();
          auStack_78 = vmovdqu64_avx512f(auVar57);
          psVar2 = (solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138);
          do {
            tStack_1e8.tv_sec = 1;
            tStack_1e8.tv_nsec = 0;
            do {
              ptVar39 = &tStack_1e8;
              iVar26 = nanosleep(&tStack_1e8,&tStack_1e8);
              if (iVar26 != -1) break;
              piVar33 = __errno_location();
            } while (*piVar33 == 4);
            if ((((solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138))->super__Function_base).
                _M_manager != (_Manager_type)0x0) {
              auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar92 = vmovdqu64_avx512f(auStack_78);
              auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
              auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
              auVar93 = ZEXT1664((undefined1  [16])0x0);
              uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
              do {
                vpmullq_avx512dq(auVar57,auVar58);
                uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
                auVar60 = vmovdqa64_avx512f(auVar93);
                auVar57 = vpaddq_avx512f(auVar57,auVar59);
                uVar42 = uVar42 - 8;
                auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                              ((long)&ptVar39[0xb].tv_sec + auStack_1b8._0_8_));
                auVar47._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
                auVar47._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
                auVar47._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
                auVar47._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
                auVar47._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
                auVar47._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
                auVar47._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
                auVar47._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
                auVar93 = vpaddq_avx512f(auVar47,auVar60);
              } while (uVar42 != 0);
              auVar57 = vmovdqa64_avx512f(auVar93);
              bVar5 = (bool)((byte)uVar32 & 1);
              auVar48._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
              bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar48._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
              bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar48._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
              bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
              auVar48._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
              bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
              auVar48._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
              bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
              auVar48._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
              bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
              auVar48._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
              auVar48._56_8_ =
                   (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
              auVar44 = vextracti64x4_avx512f(auVar48,1);
              auVar57 = vpaddq_avx512f(auVar48,ZEXT3264(auVar44));
              auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
              auVar13 = vpshufd_avx(auVar12,0xee);
              auVar12 = vpaddq_avx(auVar12,auVar13);
              storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>::
              get_best((storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>
                        *)(auStack_138 + 8),(int *)&rStack_1d8,(double *)auStack_1c8,
                       (double *)&rStack_1d0,&tStack_1e8.tv_sec);
              std::function<void_(int,_double,_long,_double,_long)>::operator()
                        (psVar2,(int)rStack_1d8._M_data,(double)auStack_1c8,tStack_1e8.tv_sec,
                         (double)rStack_1d0._M_data,auVar12._0_8_);
            }
            lVar43 = std::chrono::_V2::steady_clock::now();
            uVar25 = auStack_1a0._0_8_;
            lVar40 = tStack_1f8.tv_nsec;
            dVar4 = ((solver_parameters *)tStack_1f8.tv_nsec)->time_limit;
          } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar41) / 1000000000.0 <= dVar4));
          LOCK();
          uStack_200._0_4_ = CONCAT13(1,(uint3)uStack_200);
          UNLOCK();
          prVar27 = (result *)tStack_1f8.tv_sec;
          for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              tStack_1f8.tv_sec = (__time_t)prVar27,
              ptVar36 !=
              vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
            std::thread::join();
            prVar27 = (result *)tStack_1f8.tv_sec;
          }
          (prVar27->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (((string_buffer_ptr *)uVar25)->
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(prVar27->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(((string_buffer_ptr *)uVar25)->
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&(prVar27->affected_vars).names,
                      (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)(uVar25 + 0xc0));
          std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                    (&(prVar27->affected_vars).values,
                     &((affected_variables *)(uVar25 + 0xc0))->values);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&prVar27->variable_name,
                      (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)qStack_178.quadratic_elements._M_t.
                         super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                         .
                         super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                         ._M_head_impl);
          prVar27->variables = uStack_200._4_4_;
          prVar27->constraints =
               (int)((ulong)(auStack_188._0_8_ - auStack_1a0._16_8_) >> 3) * -0x33333333;
          iVar26 = *piStack_f8;
          iVar8 = vStack_e0.
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
          prVar28 = vStack_e0.
                    super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar26;
          prVar27->status = (uint)(iVar8 != 0) * 3;
          prVar27->duration =
               vStack_e0.
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
          prVar27->loop =
               vStack_e0.
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
          prVar27->remaining_constraints = iVar8;
          sVar9 = ((solver_parameters *)lVar40)->storage;
          if (sVar9 == one) {
            pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                     (tStack_1f8.tv_sec + 0x68);
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1);
            psVar38 = (pvVar1->
                      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                      _M_impl.super__Vector_impl_data._M_start;
LAB_004f58b6:
            convert<baryonyx::itm::maximize_tag>(prVar28,psVar38,uStack_200._4_4_);
          }
          else {
            if (sVar9 == bound) {
              pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                       (tStack_1f8.tv_sec + 0x68);
              std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2)
              ;
              convert<baryonyx::itm::maximize_tag>
                        (prVar28,(pvVar1->
                                 super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                 )._M_impl.super__Vector_impl_data._M_start,uStack_200._4_4_);
              prVar28 = storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>
                        ::get_worst((storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>
                                     *)(auStack_138 + 8));
              psVar38 = (pvVar1->
                        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>)
                        ._M_impl.super__Vector_impl_data._M_start + 1;
              goto LAB_004f58b6;
            }
            if (sVar9 == five) {
              pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                       (tStack_1f8.tv_sec + 0x68);
              std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,5)
              ;
              lVar40 = 0;
              lVar41 = 0;
              do {
                convert<baryonyx::itm::maximize_tag>
                          (vStack_e0.
                           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41],
                           (solution *)
                           ((long)&(((pvVar1->
                                     super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->variables).
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl + lVar40),uStack_200._4_4_);
                lVar41 = lVar41 + 1;
                lVar40 = lVar40 + 0x20;
              } while (lVar41 != 5);
            }
          }
          lVar41 = tStack_1f8.tv_nsec;
          storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>::
          show_population((storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>
                           *)(auStack_138 + 8),(context *)tStack_1f8.tv_nsec);
          if ((((solver_finished_cb *)(lVar41 + 0x158))->super__Function_base)._M_manager !=
              (_Manager_type)0x0) {
            (*((solver_finished_cb *)(tStack_1f8.tv_nsec + 0x158))->_M_invoker)
                      ((_Any_data *)(tStack_1f8.tv_nsec + 0x158),(result *)tStack_1f8.tv_sec);
          }
          operator_delete__(prVar30);
          if (pdStack_90 != (pointer)0x0) {
            operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
          }
          __return_storage_ptr__ = (result *)tStack_1f8.tv_sec;
          if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl
              != (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
            operator_delete__(_Stack_b0._M_head_impl);
          }
          _Stack_b0._M_head_impl = (unsigned_long *)0x0;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
            operator_delete__(_Stack_c0._M_head_impl);
          }
          _Stack_c0._M_head_impl = (unsigned_long *)0x0;
          std::
          vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
          ::~vector(&vStack_e0);
          if (piStack_f8 != (int *)0x0) {
            operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
          if ((void *)auStack_1b8._0_8_ != (void *)0x0) {
            operator_delete((void *)auStack_1b8._0_8_,(long)dStack_1a8 - auStack_1b8._0_8_);
          }
          if ((tuple<int_*,_std::default_delete<int[]>_>)
              qStack_178.linear_elements._M_t.
              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
              super__Head_base<0UL,_double_*,_false>._M_head_impl !=
              (_Head_base<0UL,_int_*,_false>)0x0) {
            operator_delete__((void *)qStack_178.linear_elements._M_t.
                                      super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                      .super__Head_base<0UL,_double_*,_false>._M_head_impl);
          }
LAB_004f59b9:
          std::
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                     *)(auStack_1a0 + 0x10));
          return __return_storage_ptr__;
        }
        if (!is_optimization) {
          prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>
                              (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
          return prVar27;
        }
        auVar92 = ZEXT1664((undefined1  [16])0x0);
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->variable_name).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->affected_vars).values.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
        (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
        (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
        (__return_storage_ptr__->affected_vars).names =
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              )auVar57._32_24_;
        (__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)auVar57._56_8_;
        __return_storage_ptr__->remaining_constraints = 0x7fffffff;
        __return_storage_ptr__->annoying_variable = 0;
        __return_storage_ptr__->status = uninitialized;
        if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
        }
        make_merged_constraints
                  ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)(auStack_1a0 + 0x10),ctx,pb);
        if ((auStack_1a0._16_8_ == auStack_188._0_8_) ||
           ((pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          __return_storage_ptr__->status = success;
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,1);
          (__return_storage_ptr__->solutions).
          super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
          (__return_storage_ptr__->strings).
          super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(__return_storage_ptr__->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(pb->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
          std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                    (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
          goto LAB_004f4b96;
        }
        uVar29 = std::chrono::_V2::system_clock::now();
        uVar42 = (ulong)(ctx->parameters).seed;
        if (uVar42 != 0) {
          uVar29 = uVar42;
        }
        rStack_1c0._M_x = uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0);
        iVar26 = (int)((ulong)((long)(pb->vars).values.
                                     super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pb->vars).values.
                                    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
        uStack_200 = (context *)CONCAT44(iVar26,(uint)uStack_200);
        default_cost_type<float>::default_cost_type
                  ((default_cost_type<float> *)(auStack_188 + 0x10),&pb->objective,iVar26);
        auStack_1a0._8_8_ = (pb->objective).value;
        uVar35 = (ctx->parameters).thread;
        auStack_1a0._0_8_ = pb;
        if ((int)uVar35 < 1) {
          uVar35 = std::thread::hardware_concurrency();
        }
        dStack_1a8 = 0.0;
        uVar37 = uVar35 + (uVar35 == 0);
        uVar29 = (ulong)uVar37;
        auStack_1b8 = (undefined1  [16])0x0;
        std::vector<std::thread,_std::allocator<std::thread>_>::vector
                  (&vStack_150,uVar29,(allocator_type *)auStack_138);
        tStack_1f8.tv_sec = (__time_t)__return_storage_ptr__;
        best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
        ::best_solution_recorder
                  ((best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
                    *)auStack_138,(random_engine *)(auStack_1c8 + 8),uVar37,
                   (default_cost_type<float> *)(auStack_188 + 0x10),(double)auStack_1a0._8_8_,
                   uStack_200._4_4_,
                   (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)(auStack_1a0 + 0x10),(ctx->parameters).init_population_size);
        prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
        tStack_1f8.tv_nsec = (long)ctx;
        memset(prVar30,0,uVar29 * 8);
        tStack_1e8.tv_sec = 0;
        tStack_1e8.tv_nsec = -1;
        rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                            (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *
                            )(auStack_1c8 + 8),(param_type *)&tStack_1e8);
        *prVar30 = rVar31;
        if (1 < uVar35) {
          uVar42 = 1;
          do {
            rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                 *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
            prVar30[uVar42] = rVar31;
            uVar32 = uVar42 - 1;
            if (uVar32 != 0) {
              do {
                iVar26 = (int)uVar32;
                if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                  rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                     ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                      (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                       *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
                  prVar30[uVar32 & 0xffffffff] = rVar31;
                  iVar26 = (int)uVar42;
                }
                uVar32 = (ulong)(iVar26 - 1U);
              } while (iVar26 - 1U != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar29);
        }
        lVar41 = tStack_1f8.tv_nsec;
        uVar35 = 0;
        uStack_200._0_4_ = (uint)(uint3)uStack_200;
        LOCK();
        UNLOCK();
        tStack_1e8.tv_sec = tStack_1e8.tv_sec & 0xffffffff00000000;
        pvVar3 = (variables *)(auStack_1a0._0_8_ + 0x90);
        do {
          std::
          vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>>>
          ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                    ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>>>
                      *)auStack_1b8,(context *)lVar41,(uint *)&tStack_1e8,prVar30 + uVar35);
          uVar35 = (int)tStack_1e8.tv_sec + 1;
          tStack_1e8.tv_sec = CONCAT44(tStack_1e8.tv_sec._4_4_,uVar35);
        } while (uVar35 != uVar37);
        lVar41 = 0;
        lVar40 = 0;
        qStack_178.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
        _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                        )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                          )pvVar3;
        do {
          rStack_1d0._M_data = (atomic<bool> *)((long)&uStack_200 + 3);
          rStack_1d8._M_data =
               (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                *)auStack_138;
          rStack_158._M_data =
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)(auStack_1a0 + 0x10);
          auStack_1c8 = (undefined1  [8])(auStack_1b8._0_8_ + lVar41);
          qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl =
               (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)(auStack_188 + 0x10);
          std::thread::
          thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<float>,float,baryonyx::itm::maximize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<float>const>,double&,void>
                    ((thread *)&tStack_1e8,
                     (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>_>_>
                      *)auStack_1c8,&rStack_1d0,
                     (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::maximize_tag>_>
                      *)&rStack_1d8,&rStack_158,(int *)((long)&uStack_200 + 4),
                     (reference_wrapper<const_baryonyx::itm::default_cost_type<float>_> *)
                     &qStack_178.indices,(double *)(auStack_1a0 + 8));
          if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start[lVar40]._M_id._M_thread != 0) {
            std::terminate();
          }
          lVar41 = lVar41 + 0xc0;
          vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar40]._M_id._M_thread = tStack_1e8.tv_sec;
          lVar40 = lVar40 + 1;
        } while (uVar37 != (uint)lVar40);
        lVar41 = std::chrono::_V2::steady_clock::now();
        auVar57 = vpbroadcastq_avx512f();
        auStack_78 = vmovdqu64_avx512f(auVar57);
        psVar2 = (solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138);
        do {
          tStack_1e8.tv_sec = 1;
          tStack_1e8.tv_nsec = 0;
          do {
            ptVar39 = &tStack_1e8;
            iVar26 = nanosleep(&tStack_1e8,&tStack_1e8);
            if (iVar26 != -1) break;
            piVar33 = __errno_location();
          } while (*piVar33 == 4);
          if ((((solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138))->super__Function_base)._M_manager
              != (_Manager_type)0x0) {
            auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar92 = vmovdqu64_avx512f(auStack_78);
            auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
            auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
            auVar93 = ZEXT1664((undefined1  [16])0x0);
            uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
            do {
              vpmullq_avx512dq(auVar57,auVar58);
              uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
              auVar60 = vmovdqa64_avx512f(auVar93);
              auVar57 = vpaddq_avx512f(auVar57,auVar59);
              uVar42 = uVar42 - 8;
              auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                            ((long)&ptVar39[0xb].tv_sec + auStack_1b8._0_8_));
              auVar45._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
              auVar45._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
              auVar45._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
              auVar45._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
              auVar45._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
              auVar45._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
              auVar45._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
              auVar45._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
              auVar93 = vpaddq_avx512f(auVar45,auVar60);
            } while (uVar42 != 0);
            auVar57 = vmovdqa64_avx512f(auVar93);
            bVar5 = (bool)((byte)uVar32 & 1);
            auVar46._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
            bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar46._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
            bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar46._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
            bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar46._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
            bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar46._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
            bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar46._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
            bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar46._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
            auVar46._56_8_ =
                 (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
            auVar44 = vextracti64x4_avx512f(auVar46,1);
            auVar57 = vpaddq_avx512f(auVar46,ZEXT3264(auVar44));
            auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
            auVar13 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpaddq_avx(auVar12,auVar13);
            storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>::get_best
                      ((storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>
                        *)(auStack_138 + 8),(int *)&rStack_1d8,(double *)auStack_1c8,
                       (double *)&rStack_1d0,&tStack_1e8.tv_sec);
            std::function<void_(int,_double,_long,_double,_long)>::operator()
                      (psVar2,(int)rStack_1d8._M_data,(double)auStack_1c8,tStack_1e8.tv_sec,
                       (double)rStack_1d0._M_data,auVar12._0_8_);
          }
          lVar43 = std::chrono::_V2::steady_clock::now();
          uVar25 = auStack_1a0._0_8_;
          lVar40 = tStack_1f8.tv_nsec;
          dVar4 = ((solver_parameters *)tStack_1f8.tv_nsec)->time_limit;
        } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar41) / 1000000000.0 <= dVar4));
        LOCK();
        uStack_200._0_4_ = CONCAT13(1,(uint3)uStack_200);
        UNLOCK();
        prVar27 = (result *)tStack_1f8.tv_sec;
        for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            tStack_1f8.tv_sec = (__time_t)prVar27,
            ptVar36 !=
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
          std::thread::join();
          prVar27 = (result *)tStack_1f8.tv_sec;
        }
        (prVar27->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (((string_buffer_ptr *)uVar25)->
                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(prVar27->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(((string_buffer_ptr *)uVar25)->
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(prVar27->affected_vars).names,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)(uVar25 + 0xc0));
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(prVar27->affected_vars).values,&((affected_variables *)(uVar25 + 0xc0))->values
                  );
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&prVar27->variable_name,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)qStack_178.quadratic_elements._M_t.
                       super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       .
                       super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                       ._M_head_impl);
        prVar27->variables = uStack_200._4_4_;
        prVar27->constraints =
             (int)((ulong)(auStack_188._0_8_ - auStack_1a0._16_8_) >> 3) * -0x33333333;
        iVar26 = *piStack_f8;
        iVar8 = vStack_e0.
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
        prVar28 = vStack_e0.
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar26;
        prVar27->status = (uint)(iVar8 != 0) * 3;
        prVar27->duration =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
        prVar27->loop =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
        prVar27->remaining_constraints = iVar8;
        sVar9 = ((solver_parameters *)lVar40)->storage;
        if (sVar9 == one) {
          pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                   (tStack_1f8.tv_sec + 0x68);
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1);
          psVar38 = (pvVar1->
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                    _M_impl.super__Vector_impl_data._M_start;
LAB_004f4a93:
          convert<baryonyx::itm::maximize_tag>(prVar28,psVar38,uStack_200._4_4_);
        }
        else {
          if (sVar9 == bound) {
            pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                     (tStack_1f8.tv_sec + 0x68);
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
            convert<baryonyx::itm::maximize_tag>
                      (prVar28,(pvVar1->
                               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                               )._M_impl.super__Vector_impl_data._M_start,uStack_200._4_4_);
            prVar28 = storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>
                      ::get_worst((storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>
                                   *)(auStack_138 + 8));
            psVar38 = (pvVar1->
                      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1;
            goto LAB_004f4a93;
          }
          if (sVar9 == five) {
            pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                     (tStack_1f8.tv_sec + 0x68);
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,5);
            lVar40 = 0;
            lVar41 = 0;
            do {
              convert<baryonyx::itm::maximize_tag>
                        (vStack_e0.
                         super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41],
                         (solution *)
                         ((long)&(((pvVar1->
                                   super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->variables).
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl + lVar40),uStack_200._4_4_);
              lVar41 = lVar41 + 1;
              lVar40 = lVar40 + 0x20;
            } while (lVar41 != 5);
          }
        }
        lVar41 = tStack_1f8.tv_nsec;
        storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>::
        show_population((storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>
                         *)(auStack_138 + 8),(context *)tStack_1f8.tv_nsec);
        if ((((solver_finished_cb *)(lVar41 + 0x158))->super__Function_base)._M_manager !=
            (_Manager_type)0x0) {
          (*((solver_finished_cb *)(tStack_1f8.tv_nsec + 0x158))->_M_invoker)
                    ((_Any_data *)(tStack_1f8.tv_nsec + 0x158),(result *)tStack_1f8.tv_sec);
        }
        operator_delete__(prVar30);
        if (pdStack_90 != (pointer)0x0) {
          operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
        }
        __return_storage_ptr__ = (result *)tStack_1f8.tv_sec;
        if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
            (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
          operator_delete__(_Stack_b0._M_head_impl);
        }
        _Stack_b0._M_head_impl = (unsigned_long *)0x0;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
          operator_delete__(_Stack_c0._M_head_impl);
        }
        _Stack_c0._M_head_impl = (unsigned_long *)0x0;
        std::
        vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
        ::~vector(&vStack_e0);
        if (piStack_f8 != (int *)0x0) {
          operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
        if ((void *)auStack_1b8._0_8_ != (void *)0x0) {
          operator_delete((void *)auStack_1b8._0_8_,(long)dStack_1a8 - auStack_1b8._0_8_);
        }
        if ((tuple<int_*,_std::default_delete<int[]>_>)
            qStack_178.linear_elements._M_t.
            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl !=
            (_Head_base<0UL,_int_*,_false>)0x0) {
          operator_delete__((void *)qStack_178.linear_elements._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl);
        }
LAB_004f4b96:
        std::
        vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   *)(auStack_1a0 + 0x10));
        return __return_storage_ptr__;
      }
      if (bVar5 == false) {
        if (!is_optimization) {
          prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
                              (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
          return prVar27;
        }
        auVar92 = ZEXT1664((undefined1  [16])0x0);
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->variable_name).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->affected_vars).values.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
        (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
        (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
        (__return_storage_ptr__->affected_vars).names =
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              )auVar57._32_24_;
        (__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)auVar57._56_8_;
        __return_storage_ptr__->remaining_constraints = 0x7fffffff;
        __return_storage_ptr__->annoying_variable = 0;
        __return_storage_ptr__->status = uninitialized;
        if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
        }
        make_merged_constraints
                  ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)auStack_1a0,ctx,pb);
        if ((auStack_1a0._0_8_ == auStack_1a0._8_8_) ||
           ((pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          __return_storage_ptr__->status = success;
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,1);
          (__return_storage_ptr__->solutions).
          super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
          (__return_storage_ptr__->strings).
          super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(__return_storage_ptr__->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(pb->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
          std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                    (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
          goto LAB_0050fae2;
        }
        uVar29 = std::chrono::_V2::system_clock::now();
        uVar42 = (ulong)(ctx->parameters).seed;
        if (uVar42 != 0) {
          uVar29 = uVar42;
        }
        rStack_1d0._M_data =
             (atomic<bool> *)(uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0));
        uVar35 = (int)((ulong)((long)(pb->vars).values.
                                     super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pb->vars).values.
                                    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
        lVar41 = (ulong)uVar35 << 0x20;
        quadratic_cost_type<float>::quadratic_cost_type
                  ((quadratic_cost_type<float> *)auStack_188,&pb->objective,uVar35);
        dStack_1a8 = (pb->objective).value;
        uVar35 = (ctx->parameters).thread;
        if ((int)uVar35 < 1) {
          uVar35 = std::thread::hardware_concurrency();
        }
        auVar15._8_8_ = 0;
        auVar15._0_8_ = auStack_1b8._8_8_;
        auStack_1b8 = auVar15 << 0x40;
        uVar37 = uVar35 + (uVar35 == 0);
        uVar29 = (ulong)uVar37;
        _auStack_1c8 = (undefined1  [16])0x0;
        std::vector<std::thread,_std::allocator<std::thread>_>::vector
                  (&vStack_150,uVar29,(allocator_type *)auStack_138);
        best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
        ::best_solution_recorder
                  ((best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
                    *)auStack_138,(random_engine *)&rStack_1d0,uVar37,
                   (quadratic_cost_type<float> *)auStack_188,dStack_1a8,(int)((ulong)lVar41 >> 0x20)
                   ,(vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                     *)auStack_1a0,(ctx->parameters).init_population_size);
        prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
        uStack_200 = ctx;
        memset(prVar30,0,uVar29 * 8);
        tStack_1f8.tv_sec = 0;
        tStack_1f8.tv_nsec = -1;
        rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                            (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *
                            )&rStack_1d0,(param_type *)&tStack_1f8);
        uVar94 = (uint)((ulong)lVar41 >> 0x20);
        *prVar30 = rVar31;
        if (1 < uVar35) {
          uVar42 = 1;
          do {
            rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                 *)&rStack_1d0,(param_type *)&tStack_1f8);
            prVar30[uVar42] = rVar31;
            uVar32 = uVar42 - 1;
            if (uVar32 != 0) {
              do {
                iVar26 = (int)uVar32;
                if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                  rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                     ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                      (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                       *)&rStack_1d0,(param_type *)&tStack_1f8);
                  prVar30[uVar32 & 0xffffffff] = rVar31;
                  iVar26 = (int)uVar42;
                }
                uVar32 = (ulong)(iVar26 - 1U);
              } while (iVar26 - 1U != 0);
            }
            uVar94 = (uint)((ulong)lVar41 >> 0x20);
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar29);
        }
        pcVar24 = uStack_200;
        uVar35 = 0;
        LOCK();
        lVar41 = (ulong)uVar94 << 0x20;
        UNLOCK();
        tStack_1f8.tv_sec = tStack_1f8.tv_sec & 0xffffffff00000000;
        pvVar3 = (variables *)(auStack_1b8._8_8_ + 0x90);
        do {
          std::
          vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>>>
          ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                    ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>>>
                      *)auStack_1c8,pcVar24,(uint *)&tStack_1f8,prVar30 + uVar35);
          uVar35 = (int)tStack_1f8.tv_sec + 1;
          tStack_1f8.tv_sec = CONCAT44(tStack_1f8.tv_sec._4_4_,uVar35);
        } while (uVar35 != uVar37);
        lVar40 = 0;
        lVar43 = 0;
        qStack_178.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
        _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                        )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                          )pvVar3;
        do {
          tStack_1e8.tv_nsec = (long)&stack0xfffffffffffffdf3;
          tStack_1e8.tv_sec = (__time_t)auStack_138;
          rStack_158._M_data =
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)auStack_1a0;
          rStack_1d8._M_data =
               (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                *)((long)(context **)auStack_1c8 + lVar40);
          qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl =
               (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)auStack_188;
          std::thread::
          thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,float,baryonyx::itm::maximize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::quadratic_cost_type<float>const>,double&,void>
                    ((thread *)&tStack_1f8,
                     (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>
                      *)&rStack_1d8,(reference_wrapper<std::atomic<bool>_> *)&tStack_1e8.tv_nsec,
                     (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>_>
                      *)&tStack_1e8,&rStack_158,(int *)&stack0xfffffffffffffdf4,
                     (reference_wrapper<const_baryonyx::itm::quadratic_cost_type<float>_> *)
                     &qStack_178.indices,&dStack_1a8);
          if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start[lVar43]._M_id._M_thread != 0) {
            std::terminate();
          }
          lVar40 = lVar40 + 0xc0;
          vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar43]._M_id._M_thread = tStack_1f8.tv_sec;
          lVar43 = lVar43 + 1;
        } while (uVar37 != (uint)lVar43);
        lVar40 = std::chrono::_V2::steady_clock::now();
        auVar57 = vpbroadcastq_avx512f();
        auStack_78 = vmovdqu64_avx512f(auVar57);
        psVar2 = &uStack_200->update;
        do {
          tStack_1f8.tv_sec = 1;
          tStack_1f8.tv_nsec = 0;
          do {
            ptVar39 = &tStack_1f8;
            iVar26 = nanosleep(&tStack_1f8,&tStack_1f8);
            if (iVar26 != -1) break;
            piVar33 = __errno_location();
          } while (*piVar33 == 4);
          if ((uStack_200->update).super__Function_base._M_manager != (_Manager_type)0x0) {
            auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar92 = vmovdqu64_avx512f(auStack_78);
            auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
            auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
            auVar93 = ZEXT1664((undefined1  [16])0x0);
            uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
            do {
              vpmullq_avx512dq(auVar57,auVar58);
              uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
              auVar60 = vmovdqa64_avx512f(auVar93);
              auVar57 = vpaddq_avx512f(auVar57,auVar59);
              uVar42 = uVar42 - 8;
              auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                            ((long)((long)auStack_1c8 + 0xb0) + (long)ptVar39));
              auVar51._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
              auVar51._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
              auVar51._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
              auVar51._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
              auVar51._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
              auVar51._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
              auVar51._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
              auVar51._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
              auVar93 = vpaddq_avx512f(auVar51,auVar60);
            } while (uVar42 != 0);
            auVar57 = vmovdqa64_avx512f(auVar93);
            bVar5 = (bool)((byte)uVar32 & 1);
            auVar52._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
            bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar52._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
            bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar52._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
            bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar52._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
            bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar52._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
            bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar52._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
            bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar52._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
            auVar52._56_8_ =
                 (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
            auVar44 = vextracti64x4_avx512f(auVar52,1);
            auVar57 = vpaddq_avx512f(auVar52,ZEXT3264(auVar44));
            auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
            auVar13 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpaddq_avx(auVar12,auVar13);
            storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>::
            get_best((storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>
                      *)(auStack_138 + 8),(int *)&tStack_1e8,(double *)&rStack_1d8,
                     (double *)&tStack_1e8.tv_nsec,&tStack_1f8.tv_sec);
            std::function<void_(int,_double,_long,_double,_long)>::operator()
                      (psVar2,(int)tStack_1e8.tv_sec,(double)rStack_1d8._M_data,tStack_1f8.tv_sec,
                       (double)tStack_1e8.tv_nsec,auVar12._0_8_);
          }
          lVar43 = std::chrono::_V2::steady_clock::now();
          pcVar24 = uStack_200;
          dVar4 = (uStack_200->parameters).time_limit;
        } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar40) / 1000000000.0 <= dVar4));
        LOCK();
        iVar95 = (index)((ulong)lVar41 >> 0x20);
        UNLOCK();
        uVar25 = auStack_1b8._8_8_;
        for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            ptVar36 !=
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
          std::thread::join();
        }
        (__return_storage_ptr__->strings).
        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)uVar25;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__return_storage_ptr__->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + 8));
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(__return_storage_ptr__->affected_vars).names,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)(uVar25 + 0xc0));
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(__return_storage_ptr__->affected_vars).values,
                   (vector<signed_char,_std::allocator<signed_char>_> *)(uVar25 + 0xd8));
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&__return_storage_ptr__->variable_name,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)qStack_178.quadratic_elements._M_t.
                       super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       .
                       super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                       ._M_head_impl);
        __return_storage_ptr__->variables = iVar95;
        __return_storage_ptr__->constraints =
             (int)((ulong)(auStack_1a0._8_8_ - auStack_1a0._0_8_) >> 3) * -0x33333333;
        iVar26 = *piStack_f8;
        iVar8 = vStack_e0.
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
        prVar28 = vStack_e0.
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar26;
        __return_storage_ptr__->status = (uint)(iVar8 != 0) * 3;
        __return_storage_ptr__->duration =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
        __return_storage_ptr__->loop =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
        __return_storage_ptr__->remaining_constraints = iVar8;
        sVar9 = (pcVar24->parameters).storage;
        if (sVar9 == one) {
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,1);
          psVar38 = (__return_storage_ptr__->solutions).
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                    _M_impl.super__Vector_impl_data._M_start;
LAB_0050f9a3:
          convert<baryonyx::itm::maximize_tag>(prVar28,psVar38,iVar95);
        }
        else {
          if (sVar9 == bound) {
            pvVar1 = &__return_storage_ptr__->solutions;
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
            convert<baryonyx::itm::maximize_tag>
                      (prVar28,(pvVar1->
                               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                               )._M_impl.super__Vector_impl_data._M_start,iVar95);
            prVar28 = storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>
                      ::get_worst((storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>
                                   *)(auStack_138 + 8));
            psVar38 = (pvVar1->
                      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1;
            goto LAB_0050f9a3;
          }
          if (sVar9 == five) {
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                      (&__return_storage_ptr__->solutions,5);
            lVar40 = 0;
            lVar41 = 0;
            do {
              convert<baryonyx::itm::maximize_tag>
                        (vStack_e0.
                         super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41],
                         (solution *)
                         ((long)&(((__return_storage_ptr__->solutions).
                                   super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->variables).
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl + lVar40),iVar95);
              lVar41 = lVar41 + 1;
              lVar40 = lVar40 + 0x20;
            } while (lVar41 != 5);
          }
        }
        pcVar24 = uStack_200;
        storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>::
        show_population((storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>
                         *)(auStack_138 + 8),uStack_200);
        if ((pcVar24->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(uStack_200->finish)._M_invoker)
                    ((_Any_data *)&uStack_200->finish,__return_storage_ptr__);
        }
        operator_delete__(prVar30);
        if (pdStack_90 != (pointer)0x0) {
          operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
        }
        if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
            (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
          operator_delete__(_Stack_b0._M_head_impl);
        }
        _Stack_b0._M_head_impl = (unsigned_long *)0x0;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
          operator_delete__(_Stack_c0._M_head_impl);
        }
        _Stack_c0._M_head_impl = (unsigned_long *)0x0;
        std::
        vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
        ::~vector(&vStack_e0);
        if (piStack_f8 != (int *)0x0) {
          operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
        if (auStack_1c8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_1c8,auStack_1b8._0_8_ - (long)auStack_1c8);
        }
        if ((tuple<int_*,_std::default_delete<int[]>_>)
            qStack_178.linear_elements._M_t.
            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl !=
            (_Head_base<0UL,_int_*,_false>)0x0) {
          operator_delete__((void *)qStack_178.linear_elements._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl);
        }
        qStack_178.linear_elements._M_t.
        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl =
             (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
             (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
        if ((_Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             )qStack_178.obj != (quad *)0x0) {
          operator_delete__(qStack_178.obj);
        }
        qStack_178.obj = (objective_function *)0x0;
        if ((_Head_base<0UL,_float_*,_false>)auStack_188._8_8_ !=
            (_Head_base<0UL,_float_*,_false>)0x0) {
          operator_delete__((void *)auStack_188._8_8_);
        }
LAB_0050fae2:
        std::
        vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   *)auStack_1a0);
        return __return_storage_ptr__;
      }
      if (!is_optimization) {
        prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
                            (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
        return prVar27;
      }
      auVar92 = ZEXT1664((undefined1  [16])0x0);
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->variable_name).
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
      (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
      (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
      (__return_storage_ptr__->affected_vars).names =
           (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            )auVar57._32_24_;
      (__return_storage_ptr__->affected_vars).values.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)auVar57._56_8_;
      __return_storage_ptr__->remaining_constraints = 0x7fffffff;
      __return_storage_ptr__->annoying_variable = 0;
      __return_storage_ptr__->status = uninitialized;
      if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
      }
      make_merged_constraints
                ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)auStack_1a0,ctx,pb);
      if ((auStack_1a0._0_8_ == auStack_1a0._8_8_) ||
         ((pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        __return_storage_ptr__->status = success;
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,1);
        (__return_storage_ptr__->solutions).
        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
        (__return_storage_ptr__->strings).
        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__return_storage_ptr__->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(pb->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
        goto LAB_0050ec51;
      }
      uVar29 = std::chrono::_V2::system_clock::now();
      uVar42 = (ulong)(ctx->parameters).seed;
      if (uVar42 != 0) {
        uVar29 = uVar42;
      }
      rStack_1d0._M_data = (atomic<bool> *)(uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0))
      ;
      uVar35 = (int)((ulong)((long)(pb->vars).values.
                                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pb->vars).values.
                                  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
      lVar41 = (ulong)uVar35 << 0x20;
      quadratic_cost_type<float>::quadratic_cost_type
                ((quadratic_cost_type<float> *)auStack_188,&pb->objective,uVar35);
      dStack_1a8 = (pb->objective).value;
      uVar35 = (ctx->parameters).thread;
      if ((int)uVar35 < 1) {
        uVar35 = std::thread::hardware_concurrency();
      }
      auVar14._8_8_ = 0;
      auVar14._0_8_ = auStack_1b8._8_8_;
      auStack_1b8 = auVar14 << 0x40;
      uVar37 = uVar35 + (uVar35 == 0);
      uVar29 = (ulong)uVar37;
      _auStack_1c8 = (undefined1  [16])0x0;
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                (&vStack_150,uVar29,(allocator_type *)auStack_138);
      best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
      ::best_solution_recorder
                ((best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
                  *)auStack_138,(random_engine *)&rStack_1d0,uVar37,
                 (quadratic_cost_type<float> *)auStack_188,dStack_1a8,(int)((ulong)lVar41 >> 0x20),
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)auStack_1a0,(ctx->parameters).init_population_size);
      prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
      uStack_200 = ctx;
      memset(prVar30,0,uVar29 * 8);
      tStack_1f8.tv_sec = 0;
      tStack_1f8.tv_nsec = -1;
      rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                         ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          &rStack_1d0,(param_type *)&tStack_1f8);
      uVar94 = (uint)((ulong)lVar41 >> 0x20);
      *prVar30 = rVar31;
      if (1 < uVar35) {
        uVar42 = 1;
        do {
          rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)&rStack_1d0,(param_type *)&tStack_1f8);
          prVar30[uVar42] = rVar31;
          uVar32 = uVar42 - 1;
          if (uVar32 != 0) {
            do {
              iVar26 = (int)uVar32;
              if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                   ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                    (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                     *)&rStack_1d0,(param_type *)&tStack_1f8);
                prVar30[uVar32 & 0xffffffff] = rVar31;
                iVar26 = (int)uVar42;
              }
              uVar32 = (ulong)(iVar26 - 1U);
            } while (iVar26 - 1U != 0);
          }
          uVar94 = (uint)((ulong)lVar41 >> 0x20);
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar29);
      }
      pcVar24 = uStack_200;
      uVar35 = 0;
      LOCK();
      lVar41 = (ulong)uVar94 << 0x20;
      UNLOCK();
      tStack_1f8.tv_sec = tStack_1f8.tv_sec & 0xffffffff00000000;
      pvVar3 = (variables *)(auStack_1b8._8_8_ + 0x90);
      do {
        std::
        vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>>>
        ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                  ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>>>
                    *)auStack_1c8,pcVar24,(uint *)&tStack_1f8,prVar30 + uVar35);
        uVar35 = (int)tStack_1f8.tv_sec + 1;
        tStack_1f8.tv_sec = CONCAT44(tStack_1f8.tv_sec._4_4_,uVar35);
      } while (uVar35 != uVar37);
      lVar40 = 0;
      lVar43 = 0;
      qStack_178.quadratic_elements._M_t.
      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl
           = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
              )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                )pvVar3;
      do {
        tStack_1e8.tv_nsec = (long)&stack0xfffffffffffffdf3;
        tStack_1e8.tv_sec = (__time_t)auStack_138;
        rStack_158._M_data =
             (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              *)auStack_1a0;
        rStack_1d8._M_data =
             (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
              *)((long)(context **)auStack_1c8 + lVar40);
        qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl =
             (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)auStack_188;
        std::thread::
        thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,float,baryonyx::itm::maximize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::quadratic_cost_type<float>const>,double&,void>
                  ((thread *)&tStack_1f8,&rStack_1d8,
                   (reference_wrapper<std::atomic<bool>_> *)&tStack_1e8.tv_nsec,
                   (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>_>
                    *)&tStack_1e8,&rStack_158,(int *)&stack0xfffffffffffffdf4,
                   (reference_wrapper<const_baryonyx::itm::quadratic_cost_type<float>_> *)
                   &qStack_178.indices,&dStack_1a8);
        if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start[lVar43]._M_id._M_thread != 0) {
          std::terminate();
        }
        lVar40 = lVar40 + 0xc0;
        vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[lVar43]._M_id._M_thread = tStack_1f8.tv_sec;
        lVar43 = lVar43 + 1;
      } while (uVar37 != (uint)lVar43);
      lVar40 = std::chrono::_V2::steady_clock::now();
      auVar57 = vpbroadcastq_avx512f();
      auStack_78 = vmovdqu64_avx512f(auVar57);
      psVar2 = &uStack_200->update;
      do {
        tStack_1f8.tv_sec = 1;
        tStack_1f8.tv_nsec = 0;
        do {
          ptVar39 = &tStack_1f8;
          iVar26 = nanosleep(&tStack_1f8,&tStack_1f8);
          if (iVar26 != -1) break;
          piVar33 = __errno_location();
        } while (*piVar33 == 4);
        if ((uStack_200->update).super__Function_base._M_manager != (_Manager_type)0x0) {
          auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar92 = vmovdqu64_avx512f(auStack_78);
          auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
          auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
          auVar93 = ZEXT1664((undefined1  [16])0x0);
          uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
          do {
            vpmullq_avx512dq(auVar57,auVar58);
            uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
            auVar60 = vmovdqa64_avx512f(auVar93);
            auVar57 = vpaddq_avx512f(auVar57,auVar59);
            uVar42 = uVar42 - 8;
            auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                          ((long)((long)auStack_1c8 + 0xb0) + (long)ptVar39));
            auVar49._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
            auVar49._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
            auVar49._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
            auVar49._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
            auVar49._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
            auVar49._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
            auVar49._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
            auVar49._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
            auVar93 = vpaddq_avx512f(auVar49,auVar60);
          } while (uVar42 != 0);
          auVar57 = vmovdqa64_avx512f(auVar93);
          bVar5 = (bool)((byte)uVar32 & 1);
          auVar50._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
          bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar50._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
          bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar50._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
          bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar50._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
          bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar50._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
          bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar50._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
          bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar50._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
          auVar50._56_8_ =
               (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
          auVar44 = vextracti64x4_avx512f(auVar50,1);
          auVar57 = vpaddq_avx512f(auVar50,ZEXT3264(auVar44));
          auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
          auVar13 = vpshufd_avx(auVar12,0xee);
          auVar12 = vpaddq_avx(auVar12,auVar13);
          storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>::get_best
                    ((storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>
                      *)(auStack_138 + 8),(int *)&tStack_1e8,(double *)&rStack_1d8,
                     (double *)&tStack_1e8.tv_nsec,&tStack_1f8.tv_sec);
          std::function<void_(int,_double,_long,_double,_long)>::operator()
                    (psVar2,(int)tStack_1e8.tv_sec,(double)rStack_1d8._M_data,tStack_1f8.tv_sec,
                     (double)tStack_1e8.tv_nsec,auVar12._0_8_);
        }
        lVar43 = std::chrono::_V2::steady_clock::now();
        pcVar24 = uStack_200;
        dVar4 = (uStack_200->parameters).time_limit;
      } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar40) / 1000000000.0 <= dVar4));
      LOCK();
      iVar95 = (index)((ulong)lVar41 >> 0x20);
      UNLOCK();
      uVar25 = auStack_1b8._8_8_;
      for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ptVar36 !=
          vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
        std::thread::join();
      }
      (__return_storage_ptr__->strings).
      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)uVar25;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(__return_storage_ptr__->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + 8));
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&(__return_storage_ptr__->affected_vars).names,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)(uVar25 + 0xc0));
      std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                (&(__return_storage_ptr__->affected_vars).values,
                 (vector<signed_char,_std::allocator<signed_char>_> *)(uVar25 + 0xd8));
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&__return_storage_ptr__->variable_name,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)qStack_178.quadratic_elements._M_t.
                     super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     .
                     super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                     ._M_head_impl);
      __return_storage_ptr__->variables = iVar95;
      __return_storage_ptr__->constraints =
           (int)((ulong)(auStack_1a0._8_8_ - auStack_1a0._0_8_) >> 3) * -0x33333333;
      iVar26 = *piStack_f8;
      iVar8 = vStack_e0.
              super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
      prVar28 = vStack_e0.
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar26;
      __return_storage_ptr__->status = (uint)(iVar8 != 0) * 3;
      __return_storage_ptr__->duration =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
      __return_storage_ptr__->loop =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
      __return_storage_ptr__->remaining_constraints = iVar8;
      sVar9 = (pcVar24->parameters).storage;
      if (sVar9 == one) {
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,1);
        psVar38 = (__return_storage_ptr__->solutions).
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                  _M_impl.super__Vector_impl_data._M_start;
LAB_0050eb12:
        convert<baryonyx::itm::maximize_tag>(prVar28,psVar38,iVar95);
      }
      else {
        if (sVar9 == bound) {
          pvVar1 = &__return_storage_ptr__->solutions;
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
          convert<baryonyx::itm::maximize_tag>
                    (prVar28,(pvVar1->
                             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                             )._M_impl.super__Vector_impl_data._M_start,iVar95);
          prVar28 = storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>
                    ::get_worst((storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>
                                 *)(auStack_138 + 8));
          psVar38 = (pvVar1->
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                    _M_impl.super__Vector_impl_data._M_start + 1;
          goto LAB_0050eb12;
        }
        if (sVar9 == five) {
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,5);
          lVar40 = 0;
          lVar41 = 0;
          do {
            convert<baryonyx::itm::maximize_tag>
                      (vStack_e0.
                       super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41],
                       (solution *)
                       ((long)&(((__return_storage_ptr__->solutions).
                                 super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->variables).
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                       + lVar40),iVar95);
            lVar41 = lVar41 + 1;
            lVar40 = lVar40 + 0x20;
          } while (lVar41 != 5);
        }
      }
      pcVar24 = uStack_200;
      storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>::
      show_population((storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>
                       *)(auStack_138 + 8),uStack_200);
      if ((pcVar24->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(uStack_200->finish)._M_invoker)((_Any_data *)&uStack_200->finish,__return_storage_ptr__);
      }
      operator_delete__(prVar30);
      if (pdStack_90 != (pointer)0x0) {
        operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
      }
      if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
          (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
        operator_delete__(_Stack_b0._M_head_impl);
      }
      _Stack_b0._M_head_impl = (unsigned_long *)0x0;
      if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
          _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
        operator_delete__(_Stack_c0._M_head_impl);
      }
      _Stack_c0._M_head_impl = (unsigned_long *)0x0;
      std::
      vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
      ::~vector(&vStack_e0);
      if (piStack_f8 != (int *)0x0) {
        operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
      if (auStack_1c8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_1c8,auStack_1b8._0_8_ - (long)auStack_1c8);
      }
      if ((tuple<int_*,_std::default_delete<int[]>_>)
          qStack_178.linear_elements._M_t.
          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0)
      {
        operator_delete__((void *)qStack_178.linear_elements._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl);
      }
      qStack_178.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
      if ((_Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
           )qStack_178.obj != (quad *)0x0) {
        operator_delete__(qStack_178.obj);
      }
      qStack_178.obj = (objective_function *)0x0;
      if ((_Head_base<0UL,_float_*,_false>)auStack_188._8_8_ != (_Head_base<0UL,_float_*,_false>)0x0
         ) {
        operator_delete__((void *)auStack_188._8_8_);
      }
LAB_0050ec51:
      std::
      vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
      ~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)auStack_1a0);
      return __return_storage_ptr__;
    }
    if (poVar10 == poVar11) {
      if (bVar5 == false) {
        if (!is_optimization) {
          prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
                              (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
          return prVar27;
        }
        auVar92 = ZEXT1664((undefined1  [16])0x0);
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->variable_name).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->affected_vars).values.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
        (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
        (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
        (__return_storage_ptr__->affected_vars).names =
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              )auVar57._32_24_;
        (__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)auVar57._56_8_;
        __return_storage_ptr__->remaining_constraints = 0x7fffffff;
        __return_storage_ptr__->annoying_variable = 0;
        __return_storage_ptr__->status = uninitialized;
        if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
        }
        make_merged_constraints
                  ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)(auStack_1a0 + 0x10),ctx,pb);
        if ((auStack_1a0._16_8_ == auStack_188._0_8_) ||
           ((pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          __return_storage_ptr__->status = success;
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,1);
          (__return_storage_ptr__->solutions).
          super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
          (__return_storage_ptr__->strings).
          super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(__return_storage_ptr__->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(pb->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
          std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                    (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
          goto LAB_005279ee;
        }
        uVar29 = std::chrono::_V2::system_clock::now();
        uVar42 = (ulong)(ctx->parameters).seed;
        if (uVar42 != 0) {
          uVar29 = uVar42;
        }
        rStack_1c0._M_x = uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0);
        iVar26 = (int)((ulong)((long)(pb->vars).values.
                                     super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pb->vars).values.
                                    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
        uStack_200 = (context *)CONCAT44(iVar26,(uint)uStack_200);
        default_cost_type<float>::default_cost_type
                  ((default_cost_type<float> *)(auStack_188 + 0x10),&pb->objective,iVar26);
        auStack_1a0._8_8_ = (pb->objective).value;
        uVar35 = (ctx->parameters).thread;
        auStack_1a0._0_8_ = pb;
        if ((int)uVar35 < 1) {
          uVar35 = std::thread::hardware_concurrency();
        }
        dStack_1a8 = 0.0;
        uVar37 = uVar35 + (uVar35 == 0);
        uVar29 = (ulong)uVar37;
        auStack_1b8 = (undefined1  [16])0x0;
        std::vector<std::thread,_std::allocator<std::thread>_>::vector
                  (&vStack_150,uVar29,(allocator_type *)auStack_138);
        tStack_1f8.tv_sec = (__time_t)__return_storage_ptr__;
        best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
        ::best_solution_recorder
                  ((best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
                    *)auStack_138,(random_engine *)(auStack_1c8 + 8),uVar37,
                   (default_cost_type<float> *)(auStack_188 + 0x10),(double)auStack_1a0._8_8_,
                   uStack_200._4_4_,
                   (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)(auStack_1a0 + 0x10),(ctx->parameters).init_population_size);
        prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
        tStack_1f8.tv_nsec = (long)ctx;
        memset(prVar30,0,uVar29 * 8);
        tStack_1e8.tv_sec = 0;
        tStack_1e8.tv_nsec = -1;
        rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                            (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *
                            )(auStack_1c8 + 8),(param_type *)&tStack_1e8);
        *prVar30 = rVar31;
        if (1 < uVar35) {
          uVar42 = 1;
          do {
            rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                 *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
            prVar30[uVar42] = rVar31;
            uVar32 = uVar42 - 1;
            if (uVar32 != 0) {
              do {
                iVar26 = (int)uVar32;
                if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                  rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                     ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                      (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                       *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
                  prVar30[uVar32 & 0xffffffff] = rVar31;
                  iVar26 = (int)uVar42;
                }
                uVar32 = (ulong)(iVar26 - 1U);
              } while (iVar26 - 1U != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar29);
        }
        lVar41 = tStack_1f8.tv_nsec;
        uVar35 = 0;
        uStack_200._0_4_ = (uint)(uint3)uStack_200;
        LOCK();
        UNLOCK();
        tStack_1e8.tv_sec = tStack_1e8.tv_sec & 0xffffffff00000000;
        pvVar3 = (variables *)(auStack_1a0._0_8_ + 0x90);
        do {
          std::
          vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>>>
          ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                    ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>>>
                      *)auStack_1b8,(context *)lVar41,(uint *)&tStack_1e8,prVar30 + uVar35);
          uVar35 = (int)tStack_1e8.tv_sec + 1;
          tStack_1e8.tv_sec = CONCAT44(tStack_1e8.tv_sec._4_4_,uVar35);
        } while (uVar35 != uVar37);
        lVar41 = 0;
        lVar40 = 0;
        qStack_178.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
        _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                        )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                          )pvVar3;
        do {
          rStack_1d0._M_data = (atomic<bool> *)((long)&uStack_200 + 3);
          rStack_1d8._M_data =
               (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                *)auStack_138;
          rStack_158._M_data =
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)(auStack_1a0 + 0x10);
          auStack_1c8 = (undefined1  [8])(auStack_1b8._0_8_ + lVar41);
          qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl =
               (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)(auStack_188 + 0x10);
          std::thread::
          thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<float>,float,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<float>const>,double&,void>
                    ((thread *)&tStack_1e8,
                     (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>_>
                      *)auStack_1c8,&rStack_1d0,
                     (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>_>
                      *)&rStack_1d8,&rStack_158,(int *)((long)&uStack_200 + 4),
                     (reference_wrapper<const_baryonyx::itm::default_cost_type<float>_> *)
                     &qStack_178.indices,(double *)(auStack_1a0 + 8));
          if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start[lVar40]._M_id._M_thread != 0) {
            std::terminate();
          }
          lVar41 = lVar41 + 0xc0;
          vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar40]._M_id._M_thread = tStack_1e8.tv_sec;
          lVar40 = lVar40 + 1;
        } while (uVar37 != (uint)lVar40);
        lVar41 = std::chrono::_V2::steady_clock::now();
        auVar57 = vpbroadcastq_avx512f();
        auStack_78 = vmovdqu64_avx512f(auVar57);
        psVar2 = (solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138);
        do {
          tStack_1e8.tv_sec = 1;
          tStack_1e8.tv_nsec = 0;
          do {
            ptVar39 = &tStack_1e8;
            iVar26 = nanosleep(&tStack_1e8,&tStack_1e8);
            if (iVar26 != -1) break;
            piVar33 = __errno_location();
          } while (*piVar33 == 4);
          if ((((solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138))->super__Function_base)._M_manager
              != (_Manager_type)0x0) {
            auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar92 = vmovdqu64_avx512f(auStack_78);
            auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
            auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
            auVar93 = ZEXT1664((undefined1  [16])0x0);
            uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
            do {
              vpmullq_avx512dq(auVar57,auVar58);
              uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
              auVar60 = vmovdqa64_avx512f(auVar93);
              auVar57 = vpaddq_avx512f(auVar57,auVar59);
              uVar42 = uVar42 - 8;
              auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                            ((long)&ptVar39[0xb].tv_sec + auStack_1b8._0_8_));
              auVar55._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
              auVar55._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
              auVar55._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
              auVar55._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
              auVar55._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
              auVar55._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
              auVar55._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
              auVar55._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
              auVar93 = vpaddq_avx512f(auVar55,auVar60);
            } while (uVar42 != 0);
            auVar57 = vmovdqa64_avx512f(auVar93);
            bVar5 = (bool)((byte)uVar32 & 1);
            auVar56._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
            bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar56._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
            bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar56._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
            bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar56._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
            bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar56._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
            bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar56._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
            bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar56._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
            auVar56._56_8_ =
                 (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
            auVar44 = vextracti64x4_avx512f(auVar56,1);
            auVar57 = vpaddq_avx512f(auVar56,ZEXT3264(auVar44));
            auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
            auVar13 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpaddq_avx(auVar12,auVar13);
            storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>::get_best
                      ((storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>
                        *)(auStack_138 + 8),(int *)&rStack_1d8,(double *)auStack_1c8,
                       (double *)&rStack_1d0,&tStack_1e8.tv_sec);
            std::function<void_(int,_double,_long,_double,_long)>::operator()
                      (psVar2,(int)rStack_1d8._M_data,(double)auStack_1c8,tStack_1e8.tv_sec,
                       (double)rStack_1d0._M_data,auVar12._0_8_);
          }
          lVar43 = std::chrono::_V2::steady_clock::now();
          uVar25 = auStack_1a0._0_8_;
          lVar40 = tStack_1f8.tv_nsec;
          dVar4 = ((solver_parameters *)tStack_1f8.tv_nsec)->time_limit;
        } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar41) / 1000000000.0 <= dVar4));
        LOCK();
        uStack_200._0_4_ = CONCAT13(1,(uint3)uStack_200);
        UNLOCK();
        prVar27 = (result *)tStack_1f8.tv_sec;
        for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            tStack_1f8.tv_sec = (__time_t)prVar27,
            ptVar36 !=
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
          std::thread::join();
          prVar27 = (result *)tStack_1f8.tv_sec;
        }
        (prVar27->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (((string_buffer_ptr *)uVar25)->
                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(prVar27->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(((string_buffer_ptr *)uVar25)->
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(prVar27->affected_vars).names,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)(uVar25 + 0xc0));
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(prVar27->affected_vars).values,&((affected_variables *)(uVar25 + 0xc0))->values
                  );
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&prVar27->variable_name,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)qStack_178.quadratic_elements._M_t.
                       super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       .
                       super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                       ._M_head_impl);
        prVar27->variables = uStack_200._4_4_;
        prVar27->constraints =
             (int)((ulong)(auStack_188._0_8_ - auStack_1a0._16_8_) >> 3) * -0x33333333;
        iVar26 = *piStack_f8;
        iVar8 = vStack_e0.
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
        prVar34 = (raw_result<baryonyx::itm::minimize_tag> *)
                  (vStack_e0.
                   super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar26);
        prVar27->status = (uint)(iVar8 != 0) * 3;
        prVar27->duration =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
        prVar27->loop =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
        prVar27->remaining_constraints = iVar8;
        sVar9 = ((solver_parameters *)lVar40)->storage;
        if (sVar9 == one) {
          pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                   (tStack_1f8.tv_sec + 0x68);
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1);
          psVar38 = (pvVar1->
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                    _M_impl.super__Vector_impl_data._M_start;
LAB_005278eb:
          convert<baryonyx::itm::minimize_tag>(prVar34,psVar38,uStack_200._4_4_);
        }
        else {
          if (sVar9 == bound) {
            pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                     (tStack_1f8.tv_sec + 0x68);
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
            convert<baryonyx::itm::minimize_tag>
                      (prVar34,(pvVar1->
                               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                               )._M_impl.super__Vector_impl_data._M_start,uStack_200._4_4_);
            prVar34 = storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>
                      ::get_worst((storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>
                                   *)(auStack_138 + 8));
            psVar38 = (pvVar1->
                      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1;
            goto LAB_005278eb;
          }
          if (sVar9 == five) {
            pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                     (tStack_1f8.tv_sec + 0x68);
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,5);
            lVar40 = 0;
            lVar41 = 0;
            do {
              convert<baryonyx::itm::minimize_tag>
                        ((raw_result<baryonyx::itm::minimize_tag> *)
                         (vStack_e0.
                          super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41]),
                         (solution *)
                         ((long)&(((pvVar1->
                                   super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->variables).
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl + lVar40),uStack_200._4_4_);
              lVar41 = lVar41 + 1;
              lVar40 = lVar40 + 0x20;
            } while (lVar41 != 5);
          }
        }
        lVar41 = tStack_1f8.tv_nsec;
        storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>::
        show_population((storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>
                         *)(auStack_138 + 8),(context *)tStack_1f8.tv_nsec);
        if ((((solver_finished_cb *)(lVar41 + 0x158))->super__Function_base)._M_manager !=
            (_Manager_type)0x0) {
          (*((solver_finished_cb *)(tStack_1f8.tv_nsec + 0x158))->_M_invoker)
                    ((_Any_data *)(tStack_1f8.tv_nsec + 0x158),(result *)tStack_1f8.tv_sec);
        }
        operator_delete__(prVar30);
        if (pdStack_90 != (pointer)0x0) {
          operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
        }
        __return_storage_ptr__ = (result *)tStack_1f8.tv_sec;
        if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
            (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
          operator_delete__(_Stack_b0._M_head_impl);
        }
        _Stack_b0._M_head_impl = (unsigned_long *)0x0;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
          operator_delete__(_Stack_c0._M_head_impl);
        }
        _Stack_c0._M_head_impl = (unsigned_long *)0x0;
        std::
        vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
        ::~vector((vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                   *)&vStack_e0);
        if (piStack_f8 != (int *)0x0) {
          operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
        if ((void *)auStack_1b8._0_8_ != (void *)0x0) {
          operator_delete((void *)auStack_1b8._0_8_,(long)dStack_1a8 - auStack_1b8._0_8_);
        }
        if ((tuple<int_*,_std::default_delete<int[]>_>)
            qStack_178.linear_elements._M_t.
            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl !=
            (_Head_base<0UL,_int_*,_false>)0x0) {
          operator_delete__((void *)qStack_178.linear_elements._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl);
        }
LAB_005279ee:
        std::
        vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   *)(auStack_1a0 + 0x10));
        return __return_storage_ptr__;
      }
      if (!is_optimization) {
        prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
                            (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
        return prVar27;
      }
      auVar92 = ZEXT1664((undefined1  [16])0x0);
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->variable_name).
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
      (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
      (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
      (__return_storage_ptr__->affected_vars).names =
           (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            )auVar57._32_24_;
      (__return_storage_ptr__->affected_vars).values.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)auVar57._56_8_;
      __return_storage_ptr__->remaining_constraints = 0x7fffffff;
      __return_storage_ptr__->annoying_variable = 0;
      __return_storage_ptr__->status = uninitialized;
      if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
      }
      make_merged_constraints
                ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)(auStack_1a0 + 0x10),ctx,pb);
      if ((auStack_1a0._16_8_ == auStack_188._0_8_) ||
         ((pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        __return_storage_ptr__->status = success;
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,1);
        (__return_storage_ptr__->solutions).
        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
        (__return_storage_ptr__->strings).
        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__return_storage_ptr__->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(pb->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
        goto LAB_00526bcb;
      }
      uVar29 = std::chrono::_V2::system_clock::now();
      uVar42 = (ulong)(ctx->parameters).seed;
      if (uVar42 != 0) {
        uVar29 = uVar42;
      }
      rStack_1c0._M_x = uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0);
      iVar26 = (int)((ulong)((long)(pb->vars).values.
                                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pb->vars).values.
                                  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
      uStack_200 = (context *)CONCAT44(iVar26,(uint)uStack_200);
      default_cost_type<float>::default_cost_type
                ((default_cost_type<float> *)(auStack_188 + 0x10),&pb->objective,iVar26);
      auStack_1a0._8_8_ = (pb->objective).value;
      uVar35 = (ctx->parameters).thread;
      auStack_1a0._0_8_ = pb;
      if ((int)uVar35 < 1) {
        uVar35 = std::thread::hardware_concurrency();
      }
      dStack_1a8 = 0.0;
      uVar37 = uVar35 + (uVar35 == 0);
      uVar29 = (ulong)uVar37;
      auStack_1b8 = (undefined1  [16])0x0;
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                (&vStack_150,uVar29,(allocator_type *)auStack_138);
      tStack_1f8.tv_sec = (__time_t)__return_storage_ptr__;
      best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
      ::best_solution_recorder
                ((best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
                  *)auStack_138,(random_engine *)(auStack_1c8 + 8),uVar37,
                 (default_cost_type<float> *)(auStack_188 + 0x10),(double)auStack_1a0._8_8_,
                 uStack_200._4_4_,
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)(auStack_1a0 + 0x10),(ctx->parameters).init_population_size);
      prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
      tStack_1f8.tv_nsec = (long)ctx;
      memset(prVar30,0,uVar29 * 8);
      tStack_1e8.tv_sec = 0;
      tStack_1e8.tv_nsec = -1;
      rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                         ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          (auStack_1c8 + 8),(param_type *)&tStack_1e8);
      *prVar30 = rVar31;
      if (1 < uVar35) {
        uVar42 = 1;
        do {
          rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
          prVar30[uVar42] = rVar31;
          uVar32 = uVar42 - 1;
          if (uVar32 != 0) {
            do {
              iVar26 = (int)uVar32;
              if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                   ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                    (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                     *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
                prVar30[uVar32 & 0xffffffff] = rVar31;
                iVar26 = (int)uVar42;
              }
              uVar32 = (ulong)(iVar26 - 1U);
            } while (iVar26 - 1U != 0);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar29);
      }
      lVar41 = tStack_1f8.tv_nsec;
      uVar35 = 0;
      uStack_200._0_4_ = (uint)(uint3)uStack_200;
      LOCK();
      UNLOCK();
      tStack_1e8.tv_sec = tStack_1e8.tv_sec & 0xffffffff00000000;
      pvVar3 = (variables *)(auStack_1a0._0_8_ + 0x90);
      do {
        std::
        vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>>>
        ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                  ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>>>
                    *)auStack_1b8,(context *)lVar41,(uint *)&tStack_1e8,prVar30 + uVar35);
        uVar35 = (int)tStack_1e8.tv_sec + 1;
        tStack_1e8.tv_sec = CONCAT44(tStack_1e8.tv_sec._4_4_,uVar35);
      } while (uVar35 != uVar37);
      lVar41 = 0;
      lVar40 = 0;
      qStack_178.quadratic_elements._M_t.
      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl
           = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
              )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                )pvVar3;
      do {
        rStack_1d0._M_data = (atomic<bool> *)((long)&uStack_200 + 3);
        rStack_1d8._M_data =
             (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
              *)auStack_138;
        rStack_158._M_data =
             (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              *)(auStack_1a0 + 0x10);
        auStack_1c8 = (undefined1  [8])(auStack_1b8._0_8_ + lVar41);
        qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl =
             (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)(auStack_188 + 0x10);
        std::thread::
        thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<float>,float,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<float>const>,double&,void>
                  ((thread *)&tStack_1e8,
                   (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>_>
                    *)auStack_1c8,&rStack_1d0,
                   (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>_>
                    *)&rStack_1d8,&rStack_158,(int *)((long)&uStack_200 + 4),
                   (reference_wrapper<const_baryonyx::itm::default_cost_type<float>_> *)
                   &qStack_178.indices,(double *)(auStack_1a0 + 8));
        if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start[lVar40]._M_id._M_thread != 0) {
          std::terminate();
        }
        lVar41 = lVar41 + 0xc0;
        vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[lVar40]._M_id._M_thread = tStack_1e8.tv_sec;
        lVar40 = lVar40 + 1;
      } while (uVar37 != (uint)lVar40);
      lVar41 = std::chrono::_V2::steady_clock::now();
      auVar57 = vpbroadcastq_avx512f();
      auStack_78 = vmovdqu64_avx512f(auVar57);
      psVar2 = (solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138);
      do {
        tStack_1e8.tv_sec = 1;
        tStack_1e8.tv_nsec = 0;
        do {
          ptVar39 = &tStack_1e8;
          iVar26 = nanosleep(&tStack_1e8,&tStack_1e8);
          if (iVar26 != -1) break;
          piVar33 = __errno_location();
        } while (*piVar33 == 4);
        if ((((solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138))->super__Function_base)._M_manager
            != (_Manager_type)0x0) {
          auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar92 = vmovdqu64_avx512f(auStack_78);
          auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
          auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
          auVar93 = ZEXT1664((undefined1  [16])0x0);
          uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
          do {
            vpmullq_avx512dq(auVar57,auVar58);
            uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
            auVar60 = vmovdqa64_avx512f(auVar93);
            auVar57 = vpaddq_avx512f(auVar57,auVar59);
            uVar42 = uVar42 - 8;
            auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                          ((long)&ptVar39[0xb].tv_sec + auStack_1b8._0_8_));
            auVar53._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
            auVar53._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
            auVar53._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
            auVar53._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
            auVar53._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
            auVar53._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
            auVar53._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
            auVar53._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
            auVar93 = vpaddq_avx512f(auVar53,auVar60);
          } while (uVar42 != 0);
          auVar57 = vmovdqa64_avx512f(auVar93);
          bVar5 = (bool)((byte)uVar32 & 1);
          auVar54._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
          bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar54._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
          bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar54._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
          bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar54._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
          bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar54._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
          bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar54._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
          bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar54._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
          auVar54._56_8_ =
               (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
          auVar44 = vextracti64x4_avx512f(auVar54,1);
          auVar57 = vpaddq_avx512f(auVar54,ZEXT3264(auVar44));
          auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
          auVar13 = vpshufd_avx(auVar12,0xee);
          auVar12 = vpaddq_avx(auVar12,auVar13);
          storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>::get_best
                    ((storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>
                      *)(auStack_138 + 8),(int *)&rStack_1d8,(double *)auStack_1c8,
                     (double *)&rStack_1d0,&tStack_1e8.tv_sec);
          std::function<void_(int,_double,_long,_double,_long)>::operator()
                    (psVar2,(int)rStack_1d8._M_data,(double)auStack_1c8,tStack_1e8.tv_sec,
                     (double)rStack_1d0._M_data,auVar12._0_8_);
        }
        lVar43 = std::chrono::_V2::steady_clock::now();
        uVar25 = auStack_1a0._0_8_;
        lVar40 = tStack_1f8.tv_nsec;
        dVar4 = ((solver_parameters *)tStack_1f8.tv_nsec)->time_limit;
      } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar41) / 1000000000.0 <= dVar4));
      LOCK();
      uStack_200._0_4_ = CONCAT13(1,(uint3)uStack_200);
      UNLOCK();
      prVar27 = (result *)tStack_1f8.tv_sec;
      for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                     _M_impl.super__Vector_impl_data._M_start; tStack_1f8.tv_sec = (__time_t)prVar27
          , ptVar36 !=
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
        std::thread::join();
        prVar27 = (result *)tStack_1f8.tv_sec;
      }
      (prVar27->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (((string_buffer_ptr *)uVar25)->
               super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(prVar27->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(((string_buffer_ptr *)uVar25)->
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&(prVar27->affected_vars).names,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)(uVar25 + 0xc0));
      std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                (&(prVar27->affected_vars).values,&((affected_variables *)(uVar25 + 0xc0))->values);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&prVar27->variable_name,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)qStack_178.quadratic_elements._M_t.
                     super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     .
                     super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                     ._M_head_impl);
      prVar27->variables = uStack_200._4_4_;
      prVar27->constraints =
           (int)((ulong)(auStack_188._0_8_ - auStack_1a0._16_8_) >> 3) * -0x33333333;
      iVar26 = *piStack_f8;
      iVar8 = vStack_e0.
              super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
      prVar34 = (raw_result<baryonyx::itm::minimize_tag> *)
                (vStack_e0.
                 super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar26);
      prVar27->status = (uint)(iVar8 != 0) * 3;
      prVar27->duration =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
      prVar27->loop =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
      prVar27->remaining_constraints = iVar8;
      sVar9 = ((solver_parameters *)lVar40)->storage;
      if (sVar9 == one) {
        pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                 (tStack_1f8.tv_sec + 0x68);
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1);
        psVar38 = (pvVar1->
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                  _M_impl.super__Vector_impl_data._M_start;
LAB_00526ac8:
        convert<baryonyx::itm::minimize_tag>(prVar34,psVar38,uStack_200._4_4_);
      }
      else {
        if (sVar9 == bound) {
          pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                   (tStack_1f8.tv_sec + 0x68);
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
          convert<baryonyx::itm::minimize_tag>
                    (prVar34,(pvVar1->
                             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                             )._M_impl.super__Vector_impl_data._M_start,uStack_200._4_4_);
          prVar34 = storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>::
                    get_worst((storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>
                               *)(auStack_138 + 8));
          psVar38 = (pvVar1->
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                    _M_impl.super__Vector_impl_data._M_start + 1;
          goto LAB_00526ac8;
        }
        if (sVar9 == five) {
          pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                   (tStack_1f8.tv_sec + 0x68);
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,5);
          lVar40 = 0;
          lVar41 = 0;
          do {
            convert<baryonyx::itm::minimize_tag>
                      ((raw_result<baryonyx::itm::minimize_tag> *)
                       (vStack_e0.
                        super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41]),
                       (solution *)
                       ((long)&(((pvVar1->
                                 super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->variables).
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                       + lVar40),uStack_200._4_4_);
            lVar41 = lVar41 + 1;
            lVar40 = lVar40 + 0x20;
          } while (lVar41 != 5);
        }
      }
      lVar41 = tStack_1f8.tv_nsec;
      storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>::show_population
                ((storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag> *)
                 (auStack_138 + 8),(context *)tStack_1f8.tv_nsec);
      if ((((solver_finished_cb *)(lVar41 + 0x158))->super__Function_base)._M_manager !=
          (_Manager_type)0x0) {
        (*((solver_finished_cb *)(tStack_1f8.tv_nsec + 0x158))->_M_invoker)
                  ((_Any_data *)(tStack_1f8.tv_nsec + 0x158),(result *)tStack_1f8.tv_sec);
      }
      operator_delete__(prVar30);
      if (pdStack_90 != (pointer)0x0) {
        operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
      }
      __return_storage_ptr__ = (result *)tStack_1f8.tv_sec;
      if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
          (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
        operator_delete__(_Stack_b0._M_head_impl);
      }
      _Stack_b0._M_head_impl = (unsigned_long *)0x0;
      if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
          _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
        operator_delete__(_Stack_c0._M_head_impl);
      }
      _Stack_c0._M_head_impl = (unsigned_long *)0x0;
      std::
      vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
      ::~vector((vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 *)&vStack_e0);
      if (piStack_f8 != (int *)0x0) {
        operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
      if ((void *)auStack_1b8._0_8_ != (void *)0x0) {
        operator_delete((void *)auStack_1b8._0_8_,(long)dStack_1a8 - auStack_1b8._0_8_);
      }
      if ((tuple<int_*,_std::default_delete<int[]>_>)
          qStack_178.linear_elements._M_t.
          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0)
      {
        operator_delete__((void *)qStack_178.linear_elements._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl);
      }
LAB_00526bcb:
      std::
      vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
      ~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)(auStack_1a0 + 0x10));
      return __return_storage_ptr__;
    }
    if (bVar5 == false) {
      if (!is_optimization) {
        prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>
                            (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
        return prVar27;
      }
      auVar92 = ZEXT1664((undefined1  [16])0x0);
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->variable_name).
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
      (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
      (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
      (__return_storage_ptr__->affected_vars).names =
           (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            )auVar57._32_24_;
      (__return_storage_ptr__->affected_vars).values.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)auVar57._56_8_;
      __return_storage_ptr__->remaining_constraints = 0x7fffffff;
      __return_storage_ptr__->annoying_variable = 0;
      __return_storage_ptr__->status = uninitialized;
      if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
      }
      make_merged_constraints
                ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)auStack_1a0,ctx,pb);
      if ((auStack_1a0._0_8_ == auStack_1a0._8_8_) ||
         ((pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        __return_storage_ptr__->status = success;
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,1);
        (__return_storage_ptr__->solutions).
        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
        (__return_storage_ptr__->strings).
        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__return_storage_ptr__->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(pb->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
        goto LAB_005416a6;
      }
      uVar29 = std::chrono::_V2::system_clock::now();
      uVar42 = (ulong)(ctx->parameters).seed;
      if (uVar42 != 0) {
        uVar29 = uVar42;
      }
      rStack_1d0._M_data = (atomic<bool> *)(uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0))
      ;
      uVar35 = (int)((ulong)((long)(pb->vars).values.
                                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pb->vars).values.
                                  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
      lVar41 = (ulong)uVar35 << 0x20;
      quadratic_cost_type<float>::quadratic_cost_type
                ((quadratic_cost_type<float> *)auStack_188,&pb->objective,uVar35);
      dStack_1a8 = (pb->objective).value;
      uVar35 = (ctx->parameters).thread;
      if ((int)uVar35 < 1) {
        uVar35 = std::thread::hardware_concurrency();
      }
      auVar17._8_8_ = 0;
      auVar17._0_8_ = auStack_1b8._8_8_;
      auStack_1b8 = auVar17 << 0x40;
      uVar37 = uVar35 + (uVar35 == 0);
      uVar29 = (ulong)uVar37;
      _auStack_1c8 = (undefined1  [16])0x0;
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                (&vStack_150,uVar29,(allocator_type *)auStack_138);
      best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
      ::best_solution_recorder
                ((best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
                  *)auStack_138,(random_engine *)&rStack_1d0,uVar37,
                 (quadratic_cost_type<float> *)auStack_188,dStack_1a8,(int)((ulong)lVar41 >> 0x20),
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)auStack_1a0,(ctx->parameters).init_population_size);
      prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
      uStack_200 = ctx;
      memset(prVar30,0,uVar29 * 8);
      tStack_1f8.tv_sec = 0;
      tStack_1f8.tv_nsec = -1;
      rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                         ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          &rStack_1d0,(param_type *)&tStack_1f8);
      uVar94 = (uint)((ulong)lVar41 >> 0x20);
      *prVar30 = rVar31;
      if (1 < uVar35) {
        uVar42 = 1;
        do {
          rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)&rStack_1d0,(param_type *)&tStack_1f8);
          prVar30[uVar42] = rVar31;
          uVar32 = uVar42 - 1;
          if (uVar32 != 0) {
            do {
              iVar26 = (int)uVar32;
              if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                   ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                    (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                     *)&rStack_1d0,(param_type *)&tStack_1f8);
                prVar30[uVar32 & 0xffffffff] = rVar31;
                iVar26 = (int)uVar42;
              }
              uVar32 = (ulong)(iVar26 - 1U);
            } while (iVar26 - 1U != 0);
          }
          uVar94 = (uint)((ulong)lVar41 >> 0x20);
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar29);
      }
      pcVar24 = uStack_200;
      uVar35 = 0;
      LOCK();
      lVar41 = (ulong)uVar94 << 0x20;
      UNLOCK();
      tStack_1f8.tv_sec = tStack_1f8.tv_sec & 0xffffffff00000000;
      pvVar3 = (variables *)(auStack_1b8._8_8_ + 0x90);
      do {
        std::
        vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>>>
        ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                  ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>>>
                    *)auStack_1c8,pcVar24,(uint *)&tStack_1f8,prVar30 + uVar35);
        uVar35 = (int)tStack_1f8.tv_sec + 1;
        tStack_1f8.tv_sec = CONCAT44(tStack_1f8.tv_sec._4_4_,uVar35);
      } while (uVar35 != uVar37);
      lVar40 = 0;
      lVar43 = 0;
      qStack_178.quadratic_elements._M_t.
      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl
           = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
              )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                )pvVar3;
      do {
        tStack_1e8.tv_nsec = (long)&stack0xfffffffffffffdf3;
        tStack_1e8.tv_sec = (__time_t)auStack_138;
        rStack_158._M_data =
             (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              *)auStack_1a0;
        rStack_1d8._M_data =
             (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
              *)((long)(context **)auStack_1c8 + lVar40);
        qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl =
             (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)auStack_188;
        std::thread::
        thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,float,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::quadratic_cost_type<float>const>,double&,void>
                  ((thread *)&tStack_1f8,
                   (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>
                    *)&rStack_1d8,(reference_wrapper<std::atomic<bool>_> *)&tStack_1e8.tv_nsec,
                   (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::minimize_tag>_>
                    *)&tStack_1e8,&rStack_158,(int *)&stack0xfffffffffffffdf4,
                   (reference_wrapper<const_baryonyx::itm::quadratic_cost_type<float>_> *)
                   &qStack_178.indices,&dStack_1a8);
        if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start[lVar43]._M_id._M_thread != 0) {
          std::terminate();
        }
        lVar40 = lVar40 + 0xc0;
        vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[lVar43]._M_id._M_thread = tStack_1f8.tv_sec;
        lVar43 = lVar43 + 1;
      } while (uVar37 != (uint)lVar43);
      lVar40 = std::chrono::_V2::steady_clock::now();
      auVar57 = vpbroadcastq_avx512f();
      auStack_78 = vmovdqu64_avx512f(auVar57);
      psVar2 = &uStack_200->update;
      do {
        tStack_1f8.tv_sec = 1;
        tStack_1f8.tv_nsec = 0;
        do {
          ptVar39 = &tStack_1f8;
          iVar26 = nanosleep(&tStack_1f8,&tStack_1f8);
          if (iVar26 != -1) break;
          piVar33 = __errno_location();
        } while (*piVar33 == 4);
        if ((uStack_200->update).super__Function_base._M_manager != (_Manager_type)0x0) {
          auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar92 = vmovdqu64_avx512f(auStack_78);
          auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
          auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
          auVar93 = ZEXT1664((undefined1  [16])0x0);
          uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
          do {
            vpmullq_avx512dq(auVar57,auVar58);
            uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
            auVar60 = vmovdqa64_avx512f(auVar93);
            auVar57 = vpaddq_avx512f(auVar57,auVar59);
            uVar42 = uVar42 - 8;
            auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                          ((long)((long)auStack_1c8 + 0xb0) + (long)ptVar39));
            auVar63._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
            auVar63._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
            auVar63._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
            auVar63._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
            auVar63._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
            auVar63._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
            auVar63._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
            auVar63._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
            auVar93 = vpaddq_avx512f(auVar63,auVar60);
          } while (uVar42 != 0);
          auVar57 = vmovdqa64_avx512f(auVar93);
          bVar5 = (bool)((byte)uVar32 & 1);
          auVar64._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
          bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar64._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
          bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar64._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
          bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar64._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
          bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar64._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
          bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar64._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
          bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar64._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
          auVar64._56_8_ =
               (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
          auVar44 = vextracti64x4_avx512f(auVar64,1);
          auVar57 = vpaddq_avx512f(auVar64,ZEXT3264(auVar44));
          auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
          auVar13 = vpshufd_avx(auVar12,0xee);
          auVar12 = vpaddq_avx(auVar12,auVar13);
          storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>::get_best
                    ((storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>
                      *)(auStack_138 + 8),(int *)&tStack_1e8,(double *)&rStack_1d8,
                     (double *)&tStack_1e8.tv_nsec,&tStack_1f8.tv_sec);
          std::function<void_(int,_double,_long,_double,_long)>::operator()
                    (psVar2,(int)tStack_1e8.tv_sec,(double)rStack_1d8._M_data,tStack_1f8.tv_sec,
                     (double)tStack_1e8.tv_nsec,auVar12._0_8_);
        }
        lVar43 = std::chrono::_V2::steady_clock::now();
        pcVar24 = uStack_200;
        dVar4 = (uStack_200->parameters).time_limit;
      } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar40) / 1000000000.0 <= dVar4));
      LOCK();
      iVar95 = (index)((ulong)lVar41 >> 0x20);
      UNLOCK();
      uVar25 = auStack_1b8._8_8_;
      for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ptVar36 !=
          vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
        std::thread::join();
      }
      (__return_storage_ptr__->strings).
      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)uVar25;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(__return_storage_ptr__->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + 8));
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&(__return_storage_ptr__->affected_vars).names,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)(uVar25 + 0xc0));
      std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                (&(__return_storage_ptr__->affected_vars).values,
                 (vector<signed_char,_std::allocator<signed_char>_> *)(uVar25 + 0xd8));
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&__return_storage_ptr__->variable_name,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)qStack_178.quadratic_elements._M_t.
                     super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     .
                     super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                     ._M_head_impl);
      __return_storage_ptr__->variables = iVar95;
      __return_storage_ptr__->constraints =
           (int)((ulong)(auStack_1a0._8_8_ - auStack_1a0._0_8_) >> 3) * -0x33333333;
      iVar26 = *piStack_f8;
      iVar8 = vStack_e0.
              super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
      prVar34 = (raw_result<baryonyx::itm::minimize_tag> *)
                (vStack_e0.
                 super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar26);
      __return_storage_ptr__->status = (uint)(iVar8 != 0) * 3;
      __return_storage_ptr__->duration =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
      __return_storage_ptr__->loop =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
      __return_storage_ptr__->remaining_constraints = iVar8;
      sVar9 = (pcVar24->parameters).storage;
      if (sVar9 == one) {
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,1);
        psVar38 = (__return_storage_ptr__->solutions).
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                  _M_impl.super__Vector_impl_data._M_start;
LAB_00541567:
        convert<baryonyx::itm::minimize_tag>(prVar34,psVar38,iVar95);
      }
      else {
        if (sVar9 == bound) {
          pvVar1 = &__return_storage_ptr__->solutions;
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
          convert<baryonyx::itm::minimize_tag>
                    (prVar34,(pvVar1->
                             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                             )._M_impl.super__Vector_impl_data._M_start,iVar95);
          prVar34 = storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>
                    ::get_worst((storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>
                                 *)(auStack_138 + 8));
          psVar38 = (pvVar1->
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                    _M_impl.super__Vector_impl_data._M_start + 1;
          goto LAB_00541567;
        }
        if (sVar9 == five) {
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,5);
          lVar40 = 0;
          lVar41 = 0;
          do {
            convert<baryonyx::itm::minimize_tag>
                      ((raw_result<baryonyx::itm::minimize_tag> *)
                       (vStack_e0.
                        super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41]),
                       (solution *)
                       ((long)&(((__return_storage_ptr__->solutions).
                                 super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->variables).
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                       + lVar40),iVar95);
            lVar41 = lVar41 + 1;
            lVar40 = lVar40 + 0x20;
          } while (lVar41 != 5);
        }
      }
      pcVar24 = uStack_200;
      storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>::
      show_population((storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>
                       *)(auStack_138 + 8),uStack_200);
      if ((pcVar24->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(uStack_200->finish)._M_invoker)((_Any_data *)&uStack_200->finish,__return_storage_ptr__);
      }
      operator_delete__(prVar30);
      if (pdStack_90 != (pointer)0x0) {
        operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
      }
      if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
          (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
        operator_delete__(_Stack_b0._M_head_impl);
      }
      _Stack_b0._M_head_impl = (unsigned_long *)0x0;
      if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
          _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
        operator_delete__(_Stack_c0._M_head_impl);
      }
      _Stack_c0._M_head_impl = (unsigned_long *)0x0;
      std::
      vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
      ::~vector((vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 *)&vStack_e0);
      if (piStack_f8 != (int *)0x0) {
        operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
      if (auStack_1c8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_1c8,auStack_1b8._0_8_ - (long)auStack_1c8);
      }
      if ((tuple<int_*,_std::default_delete<int[]>_>)
          qStack_178.linear_elements._M_t.
          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0)
      {
        operator_delete__((void *)qStack_178.linear_elements._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl);
      }
      qStack_178.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
      if ((_Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
           )qStack_178.obj != (quad *)0x0) {
        operator_delete__(qStack_178.obj);
      }
      qStack_178.obj = (objective_function *)0x0;
      if ((_Head_base<0UL,_float_*,_false>)auStack_188._8_8_ != (_Head_base<0UL,_float_*,_false>)0x0
         ) {
        operator_delete__((void *)auStack_188._8_8_);
      }
LAB_005416a6:
      std::
      vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
      ~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)auStack_1a0);
      return __return_storage_ptr__;
    }
    if (!is_optimization) {
      prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>
                          (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
      return prVar27;
    }
    auVar92 = ZEXT1664((undefined1  [16])0x0);
    auVar57 = vmovdqu64_avx512f(auVar92);
    *(undefined1 (*) [64])
     &(__return_storage_ptr__->variable_name).
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = auVar57;
    auVar57 = vmovdqu64_avx512f(auVar92);
    *(undefined1 (*) [64])
     &(__return_storage_ptr__->affected_vars).values.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_finish = auVar57;
    auVar57 = vmovdqu64_avx512f(auVar92);
    __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
    (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
    (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
    (__return_storage_ptr__->affected_vars).names =
         (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          )auVar57._32_24_;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)auVar57._56_8_;
    __return_storage_ptr__->remaining_constraints = 0x7fffffff;
    __return_storage_ptr__->annoying_variable = 0;
    __return_storage_ptr__->status = uninitialized;
    if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
    }
    make_merged_constraints
              ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)auStack_1a0,ctx,pb);
    if ((auStack_1a0._0_8_ == auStack_1a0._8_8_) ||
       ((pb->vars).values.
        super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pb->vars).values.
        super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      __return_storage_ptr__->status = success;
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                (&__return_storage_ptr__->solutions,1);
      (__return_storage_ptr__->solutions).
      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
      (__return_storage_ptr__->strings).
      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(__return_storage_ptr__->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(pb->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
      std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
      goto LAB_00540815;
    }
    uVar29 = std::chrono::_V2::system_clock::now();
    uVar42 = (ulong)(ctx->parameters).seed;
    if (uVar42 != 0) {
      uVar29 = uVar42;
    }
    rStack_1d0._M_data = (atomic<bool> *)(uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0));
    uVar35 = (int)((ulong)((long)(pb->vars).values.
                                 super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pb->vars).values.
                                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    lVar41 = (ulong)uVar35 << 0x20;
    quadratic_cost_type<float>::quadratic_cost_type
              ((quadratic_cost_type<float> *)auStack_188,&pb->objective,uVar35);
    dStack_1a8 = (pb->objective).value;
    uVar35 = (ctx->parameters).thread;
    if ((int)uVar35 < 1) {
      uVar35 = std::thread::hardware_concurrency();
    }
    auVar16._8_8_ = 0;
    auVar16._0_8_ = auStack_1b8._8_8_;
    auStack_1b8 = auVar16 << 0x40;
    uVar37 = uVar35 + (uVar35 == 0);
    uVar29 = (ulong)uVar37;
    _auStack_1c8 = (undefined1  [16])0x0;
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              (&vStack_150,uVar29,(allocator_type *)auStack_138);
    best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
    ::best_solution_recorder
              ((best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
                *)auStack_138,(random_engine *)&rStack_1d0,uVar37,
               (quadratic_cost_type<float> *)auStack_188,dStack_1a8,(int)((ulong)lVar41 >> 0x20),
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)auStack_1a0,(ctx->parameters).init_population_size);
    prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
    uStack_200 = ctx;
    memset(prVar30,0,uVar29 * 8);
    tStack_1f8.tv_sec = 0;
    tStack_1f8.tv_nsec = -1;
    rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                       ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                        (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                        &rStack_1d0,(param_type *)&tStack_1f8);
    uVar94 = (uint)((ulong)lVar41 >> 0x20);
    *prVar30 = rVar31;
    if (1 < uVar35) {
      uVar42 = 1;
      do {
        rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                            (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *
                            )&rStack_1d0,(param_type *)&tStack_1f8);
        prVar30[uVar42] = rVar31;
        uVar32 = uVar42 - 1;
        if (uVar32 != 0) {
          do {
            iVar26 = (int)uVar32;
            if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
              rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                 ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                  (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                   *)&rStack_1d0,(param_type *)&tStack_1f8);
              prVar30[uVar32 & 0xffffffff] = rVar31;
              iVar26 = (int)uVar42;
            }
            uVar32 = (ulong)(iVar26 - 1U);
          } while (iVar26 - 1U != 0);
        }
        uVar94 = (uint)((ulong)lVar41 >> 0x20);
        uVar42 = uVar42 + 1;
      } while (uVar42 != uVar29);
    }
    pcVar24 = uStack_200;
    uVar35 = 0;
    LOCK();
    lVar41 = (ulong)uVar94 << 0x20;
    UNLOCK();
    tStack_1f8.tv_sec = tStack_1f8.tv_sec & 0xffffffff00000000;
    pvVar3 = (variables *)(auStack_1b8._8_8_ + 0x90);
    do {
      std::
      vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>>>
      ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>>>
                  *)auStack_1c8,pcVar24,(uint *)&tStack_1f8,prVar30 + uVar35);
      uVar35 = (int)tStack_1f8.tv_sec + 1;
      tStack_1f8.tv_sec = CONCAT44(tStack_1f8.tv_sec._4_4_,uVar35);
    } while (uVar35 != uVar37);
    lVar40 = 0;
    lVar43 = 0;
    qStack_178.quadratic_elements._M_t.
    super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
    .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl =
         (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
          )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
            )pvVar3;
    do {
      tStack_1e8.tv_nsec = (long)&stack0xfffffffffffffdf3;
      tStack_1e8.tv_sec = (__time_t)auStack_138;
      rStack_158._M_data =
           (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *)auStack_1a0;
      rStack_1d8._M_data =
           (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
            *)((long)(context **)auStack_1c8 + lVar40);
      qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)auStack_188;
      std::thread::
      thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,float,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::quadratic_cost_type<float>const>,double&,void>
                ((thread *)&tStack_1f8,
                 (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>
                  *)&rStack_1d8,(reference_wrapper<std::atomic<bool>_> *)&tStack_1e8.tv_nsec,
                 (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::minimize_tag>_>
                  *)&tStack_1e8,&rStack_158,(int *)&stack0xfffffffffffffdf4,
                 (reference_wrapper<const_baryonyx::itm::quadratic_cost_type<float>_> *)
                 &qStack_178.indices,&dStack_1a8);
      if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar43]._M_id._M_thread != 0) {
        std::terminate();
      }
      lVar40 = lVar40 + 0xc0;
      vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[lVar43]._M_id._M_thread = tStack_1f8.tv_sec;
      lVar43 = lVar43 + 1;
    } while (uVar37 != (uint)lVar43);
    lVar40 = std::chrono::_V2::steady_clock::now();
    auVar57 = vpbroadcastq_avx512f();
    auStack_78 = vmovdqu64_avx512f(auVar57);
    psVar2 = &uStack_200->update;
    do {
      tStack_1f8.tv_sec = 1;
      tStack_1f8.tv_nsec = 0;
      do {
        ptVar39 = &tStack_1f8;
        iVar26 = nanosleep(&tStack_1f8,&tStack_1f8);
        if (iVar26 != -1) break;
        piVar33 = __errno_location();
      } while (*piVar33 == 4);
      if ((uStack_200->update).super__Function_base._M_manager != (_Manager_type)0x0) {
        auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar92 = vmovdqu64_avx512f(auStack_78);
        auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
        auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
        auVar93 = ZEXT1664((undefined1  [16])0x0);
        uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
        do {
          vpmullq_avx512dq(auVar57,auVar58);
          uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
          auVar60 = vmovdqa64_avx512f(auVar93);
          auVar57 = vpaddq_avx512f(auVar57,auVar59);
          uVar42 = uVar42 - 8;
          auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                        ((long)((long)auStack_1c8 + 0xb0) + (long)ptVar39));
          auVar61._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
          auVar61._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
          auVar61._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
          auVar61._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
          auVar61._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
          auVar61._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
          auVar61._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
          auVar61._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
          auVar93 = vpaddq_avx512f(auVar61,auVar60);
        } while (uVar42 != 0);
        auVar57 = vmovdqa64_avx512f(auVar93);
        bVar5 = (bool)((byte)uVar32 & 1);
        auVar62._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
        bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar62._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
        bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar62._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
        bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar62._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
        bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar62._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
        bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar62._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
        bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar62._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
        auVar62._56_8_ =
             (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
        auVar44 = vextracti64x4_avx512f(auVar62,1);
        auVar57 = vpaddq_avx512f(auVar62,ZEXT3264(auVar44));
        auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
        auVar13 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpaddq_avx(auVar12,auVar13);
        storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>::get_best
                  ((storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>
                    *)(auStack_138 + 8),(int *)&tStack_1e8,(double *)&rStack_1d8,
                   (double *)&tStack_1e8.tv_nsec,&tStack_1f8.tv_sec);
        std::function<void_(int,_double,_long,_double,_long)>::operator()
                  (psVar2,(int)tStack_1e8.tv_sec,(double)rStack_1d8._M_data,tStack_1f8.tv_sec,
                   (double)tStack_1e8.tv_nsec,auVar12._0_8_);
      }
      lVar43 = std::chrono::_V2::steady_clock::now();
      pcVar24 = uStack_200;
      dVar4 = (uStack_200->parameters).time_limit;
    } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar40) / 1000000000.0 <= dVar4));
    LOCK();
    iVar95 = (index)((ulong)lVar41 >> 0x20);
    UNLOCK();
    uVar25 = auStack_1b8._8_8_;
    for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ptVar36 !=
        vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
      std::thread::join();
    }
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)uVar25;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__return_storage_ptr__->strings).
                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + 8));
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&(__return_storage_ptr__->affected_vars).names,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)(uVar25 + 0xc0));
    std::vector<signed_char,_std::allocator<signed_char>_>::operator=
              (&(__return_storage_ptr__->affected_vars).values,
               (vector<signed_char,_std::allocator<signed_char>_> *)(uVar25 + 0xd8));
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&__return_storage_ptr__->variable_name,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)qStack_178.quadratic_elements._M_t.
                   super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                   .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                   ._M_head_impl);
    __return_storage_ptr__->variables = iVar95;
    __return_storage_ptr__->constraints =
         (int)((ulong)(auStack_1a0._8_8_ - auStack_1a0._0_8_) >> 3) * -0x33333333;
    iVar26 = *piStack_f8;
    iVar8 = vStack_e0.
            super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
    prVar34 = (raw_result<baryonyx::itm::minimize_tag> *)
              (vStack_e0.
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar26);
    __return_storage_ptr__->status = (uint)(iVar8 != 0) * 3;
    __return_storage_ptr__->duration =
         vStack_e0.
         super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
    __return_storage_ptr__->loop =
         vStack_e0.
         super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
    __return_storage_ptr__->remaining_constraints = iVar8;
    sVar9 = (pcVar24->parameters).storage;
    if (sVar9 == one) {
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                (&__return_storage_ptr__->solutions,1);
      psVar38 = (__return_storage_ptr__->solutions).
                super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
                super__Vector_impl_data._M_start;
LAB_005406d6:
      convert<baryonyx::itm::minimize_tag>(prVar34,psVar38,iVar95);
    }
    else {
      if (sVar9 == bound) {
        pvVar1 = &__return_storage_ptr__->solutions;
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
        convert<baryonyx::itm::minimize_tag>
                  (prVar34,(pvVar1->
                           super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                           )._M_impl.super__Vector_impl_data._M_start,iVar95);
        prVar34 = storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>::
                  get_worst((storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>
                             *)(auStack_138 + 8));
        psVar38 = (pvVar1->
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                  _M_impl.super__Vector_impl_data._M_start + 1;
        goto LAB_005406d6;
      }
      if (sVar9 == five) {
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,5);
        lVar40 = 0;
        lVar41 = 0;
        do {
          convert<baryonyx::itm::minimize_tag>
                    ((raw_result<baryonyx::itm::minimize_tag> *)
                     (vStack_e0.
                      super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41]),
                     (solution *)
                     ((long)&(((__return_storage_ptr__->solutions).
                               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                               ._M_impl.super__Vector_impl_data._M_start)->variables).
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl +
                     lVar40),iVar95);
          lVar41 = lVar41 + 1;
          lVar40 = lVar40 + 0x20;
        } while (lVar41 != 5);
      }
    }
    pcVar24 = uStack_200;
    storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>::show_population
              ((storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag> *)
               (auStack_138 + 8),uStack_200);
    if ((pcVar24->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(uStack_200->finish)._M_invoker)((_Any_data *)&uStack_200->finish,__return_storage_ptr__);
    }
    operator_delete__(prVar30);
    if (pdStack_90 != (pointer)0x0) {
      operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
    }
    if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
        (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
      operator_delete__(_Stack_b0._M_head_impl);
    }
    _Stack_b0._M_head_impl = (unsigned_long *)0x0;
    if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
        _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
      operator_delete__(_Stack_c0._M_head_impl);
    }
    _Stack_c0._M_head_impl = (unsigned_long *)0x0;
    std::
    vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
    ::~vector((vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
               *)&vStack_e0);
    if (piStack_f8 != (int *)0x0) {
      operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
    if (auStack_1c8 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_1c8,auStack_1b8._0_8_ - (long)auStack_1c8);
    }
    if ((tuple<int_*,_std::default_delete<int[]>_>)
        qStack_178.linear_elements._M_t.
        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0) {
      operator_delete__((void *)qStack_178.linear_elements._M_t.
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl);
    }
    qStack_178.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
    _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
         (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
    if ((_Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
         )qStack_178.obj != (quad *)0x0) {
      operator_delete__(qStack_178.obj);
    }
    qStack_178.obj = (objective_function *)0x0;
    if ((_Head_base<0UL,_float_*,_false>)auStack_188._8_8_ != (_Head_base<0UL,_float_*,_false>)0x0)
    {
      operator_delete__((void *)auStack_188._8_8_);
    }
LAB_00540815:
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)auStack_1a0);
    return __return_storage_ptr__;
  }
  if (oVar7 == maximize) {
    if (poVar10 == poVar11) {
      if (bVar5 == false) {
        if (!is_optimization) {
          prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
                              (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
          return prVar27;
        }
        auVar92 = ZEXT1664((undefined1  [16])0x0);
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->variable_name).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        *(undefined1 (*) [64])
         &(__return_storage_ptr__->affected_vars).values.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = auVar57;
        auVar57 = vmovdqu64_avx512f(auVar92);
        __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
        (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
        (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
        (__return_storage_ptr__->affected_vars).names =
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              )auVar57._32_24_;
        (__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)auVar57._56_8_;
        __return_storage_ptr__->remaining_constraints = 0x7fffffff;
        __return_storage_ptr__->annoying_variable = 0;
        __return_storage_ptr__->status = uninitialized;
        if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
        }
        make_merged_constraints
                  ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)(auStack_1a0 + 0x10),ctx,pb);
        if ((auStack_1a0._16_8_ == auStack_188._0_8_) ||
           ((pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          __return_storage_ptr__->status = success;
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,1);
          (__return_storage_ptr__->solutions).
          super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
          (__return_storage_ptr__->strings).
          super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(__return_storage_ptr__->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(pb->strings).
                      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
          std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                    (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
          goto LAB_005596b4;
        }
        uVar29 = std::chrono::_V2::system_clock::now();
        uVar42 = (ulong)(ctx->parameters).seed;
        if (uVar42 != 0) {
          uVar29 = uVar42;
        }
        rStack_1c0._M_x = uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0);
        iVar26 = (int)((ulong)((long)(pb->vars).values.
                                     super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pb->vars).values.
                                    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
        uStack_200 = (context *)CONCAT44(iVar26,(uint)uStack_200);
        default_cost_type<double>::default_cost_type
                  ((default_cost_type<double> *)(auStack_188 + 0x10),&pb->objective,iVar26);
        auStack_1a0._8_8_ = (pb->objective).value;
        uVar35 = (ctx->parameters).thread;
        auStack_1a0._0_8_ = pb;
        if ((int)uVar35 < 1) {
          uVar35 = std::thread::hardware_concurrency();
        }
        dStack_1a8 = 0.0;
        uVar37 = uVar35 + (uVar35 == 0);
        uVar29 = (ulong)uVar37;
        auStack_1b8 = (undefined1  [16])0x0;
        std::vector<std::thread,_std::allocator<std::thread>_>::vector
                  (&vStack_150,uVar29,(allocator_type *)auStack_138);
        tStack_1f8.tv_sec = (__time_t)__return_storage_ptr__;
        best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::maximize_tag>
        ::best_solution_recorder
                  ((best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::maximize_tag>
                    *)auStack_138,(random_engine *)(auStack_1c8 + 8),uVar37,
                   (default_cost_type<double> *)(auStack_188 + 0x10),(double)auStack_1a0._8_8_,
                   uStack_200._4_4_,
                   (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)(auStack_1a0 + 0x10),(ctx->parameters).init_population_size);
        prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
        tStack_1f8.tv_nsec = (long)ctx;
        memset(prVar30,0,uVar29 * 8);
        tStack_1e8.tv_sec = 0;
        tStack_1e8.tv_nsec = -1;
        rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                            (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *
                            )(auStack_1c8 + 8),(param_type *)&tStack_1e8);
        *prVar30 = rVar31;
        if (1 < uVar35) {
          uVar42 = 1;
          do {
            rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                 *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
            prVar30[uVar42] = rVar31;
            uVar32 = uVar42 - 1;
            if (uVar32 != 0) {
              do {
                iVar26 = (int)uVar32;
                if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                  rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                     ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                      (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                       *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
                  prVar30[uVar32 & 0xffffffff] = rVar31;
                  iVar26 = (int)uVar42;
                }
                uVar32 = (ulong)(iVar26 - 1U);
              } while (iVar26 - 1U != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar29);
        }
        lVar41 = tStack_1f8.tv_nsec;
        uVar35 = 0;
        uStack_200._0_4_ = (uint)(uint3)uStack_200;
        LOCK();
        UNLOCK();
        tStack_1e8.tv_sec = tStack_1e8.tv_sec & 0xffffffff00000000;
        pvVar3 = (variables *)(auStack_1a0._0_8_ + 0x90);
        do {
          std::
          vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>>>
          ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                    ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>>>
                      *)auStack_1b8,(context *)lVar41,(uint *)&tStack_1e8,prVar30 + uVar35);
          uVar35 = (int)tStack_1e8.tv_sec + 1;
          tStack_1e8.tv_sec = CONCAT44(tStack_1e8.tv_sec._4_4_,uVar35);
        } while (uVar35 != uVar37);
        lVar41 = 0;
        lVar40 = 0;
        qStack_178.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
        _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                        )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                          )pvVar3;
        do {
          rStack_1d0._M_data = (atomic<bool> *)((long)&uStack_200 + 3);
          rStack_1d8._M_data =
               (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                *)auStack_138;
          rStack_158._M_data =
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)(auStack_1a0 + 0x10);
          auStack_1c8 = (undefined1  [8])(auStack_1b8._0_8_ + lVar41);
          qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl =
               (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)(auStack_188 + 0x10);
          std::thread::
          thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<double>,double,baryonyx::itm::maximize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<double>const>,double&,void>
                    ((thread *)&tStack_1e8,
                     (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>_>
                      *)auStack_1c8,&rStack_1d0,
                     (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::maximize_tag>_>
                      *)&rStack_1d8,&rStack_158,(int *)((long)&uStack_200 + 4),
                     (reference_wrapper<const_baryonyx::itm::default_cost_type<double>_> *)
                     &qStack_178.indices,(double *)(auStack_1a0 + 8));
          if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start[lVar40]._M_id._M_thread != 0) {
            std::terminate();
          }
          lVar41 = lVar41 + 0xc0;
          vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar40]._M_id._M_thread = tStack_1e8.tv_sec;
          lVar40 = lVar40 + 1;
        } while (uVar37 != (uint)lVar40);
        lVar41 = std::chrono::_V2::steady_clock::now();
        auVar57 = vpbroadcastq_avx512f();
        auStack_78 = vmovdqu64_avx512f(auVar57);
        psVar2 = (solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138);
        do {
          tStack_1e8.tv_sec = 1;
          tStack_1e8.tv_nsec = 0;
          do {
            ptVar39 = &tStack_1e8;
            iVar26 = nanosleep(&tStack_1e8,&tStack_1e8);
            if (iVar26 != -1) break;
            piVar33 = __errno_location();
          } while (*piVar33 == 4);
          if ((((solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138))->super__Function_base)._M_manager
              != (_Manager_type)0x0) {
            auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar92 = vmovdqu64_avx512f(auStack_78);
            auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
            auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
            auVar93 = ZEXT1664((undefined1  [16])0x0);
            uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
            do {
              vpmullq_avx512dq(auVar57,auVar58);
              uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
              auVar60 = vmovdqa64_avx512f(auVar93);
              auVar57 = vpaddq_avx512f(auVar57,auVar59);
              uVar42 = uVar42 - 8;
              auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                            ((long)&ptVar39[0xb].tv_sec + auStack_1b8._0_8_));
              auVar67._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
              auVar67._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
              auVar67._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
              auVar67._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
              auVar67._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
              auVar67._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
              auVar67._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
              auVar67._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
              auVar93 = vpaddq_avx512f(auVar67,auVar60);
            } while (uVar42 != 0);
            auVar57 = vmovdqa64_avx512f(auVar93);
            bVar5 = (bool)((byte)uVar32 & 1);
            auVar68._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
            bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar68._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
            bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar68._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
            bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar68._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
            bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar68._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
            bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar68._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
            bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar68._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
            auVar68._56_8_ =
                 (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
            auVar44 = vextracti64x4_avx512f(auVar68,1);
            auVar57 = vpaddq_avx512f(auVar68,ZEXT3264(auVar44));
            auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
            auVar13 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpaddq_avx(auVar12,auVar13);
            storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>::get_best
                      ((storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>
                        *)(auStack_138 + 8),(int *)&rStack_1d8,(double *)auStack_1c8,
                       (double *)&rStack_1d0,&tStack_1e8.tv_sec);
            std::function<void_(int,_double,_long,_double,_long)>::operator()
                      (psVar2,(int)rStack_1d8._M_data,(double)auStack_1c8,tStack_1e8.tv_sec,
                       (double)rStack_1d0._M_data,auVar12._0_8_);
          }
          lVar43 = std::chrono::_V2::steady_clock::now();
          uVar25 = auStack_1a0._0_8_;
          lVar40 = tStack_1f8.tv_nsec;
          dVar4 = ((solver_parameters *)tStack_1f8.tv_nsec)->time_limit;
        } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar41) / 1000000000.0 <= dVar4));
        LOCK();
        uStack_200._0_4_ = CONCAT13(1,(uint3)uStack_200);
        UNLOCK();
        prVar27 = (result *)tStack_1f8.tv_sec;
        for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            tStack_1f8.tv_sec = (__time_t)prVar27,
            ptVar36 !=
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
          std::thread::join();
          prVar27 = (result *)tStack_1f8.tv_sec;
        }
        (prVar27->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (((string_buffer_ptr *)uVar25)->
                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(prVar27->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(((string_buffer_ptr *)uVar25)->
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(prVar27->affected_vars).names,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)(uVar25 + 0xc0));
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(prVar27->affected_vars).values,&((affected_variables *)(uVar25 + 0xc0))->values
                  );
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&prVar27->variable_name,
                    (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)qStack_178.quadratic_elements._M_t.
                       super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                       .
                       super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                       ._M_head_impl);
        prVar27->variables = uStack_200._4_4_;
        prVar27->constraints =
             (int)((ulong)(auStack_188._0_8_ - auStack_1a0._16_8_) >> 3) * -0x33333333;
        iVar26 = *piStack_f8;
        iVar8 = vStack_e0.
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
        prVar28 = vStack_e0.
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar26;
        prVar27->status = (uint)(iVar8 != 0) * 3;
        prVar27->duration =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
        prVar27->loop =
             vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
        prVar27->remaining_constraints = iVar8;
        sVar9 = ((solver_parameters *)lVar40)->storage;
        if (sVar9 == one) {
          pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                   (tStack_1f8.tv_sec + 0x68);
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1);
          psVar38 = (pvVar1->
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                    _M_impl.super__Vector_impl_data._M_start;
LAB_005595b1:
          convert<baryonyx::itm::maximize_tag>(prVar28,psVar38,uStack_200._4_4_);
        }
        else {
          if (sVar9 == bound) {
            pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                     (tStack_1f8.tv_sec + 0x68);
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
            convert<baryonyx::itm::maximize_tag>
                      (prVar28,(pvVar1->
                               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                               )._M_impl.super__Vector_impl_data._M_start,uStack_200._4_4_);
            prVar28 = storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>
                      ::get_worst((storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>
                                   *)(auStack_138 + 8));
            psVar38 = (pvVar1->
                      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1;
            goto LAB_005595b1;
          }
          if (sVar9 == five) {
            pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                     (tStack_1f8.tv_sec + 0x68);
            std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,5);
            lVar40 = 0;
            lVar41 = 0;
            do {
              convert<baryonyx::itm::maximize_tag>
                        (vStack_e0.
                         super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41],
                         (solution *)
                         ((long)&(((pvVar1->
                                   super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->variables).
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl + lVar40),uStack_200._4_4_);
              lVar41 = lVar41 + 1;
              lVar40 = lVar40 + 0x20;
            } while (lVar41 != 5);
          }
        }
        lVar41 = tStack_1f8.tv_nsec;
        storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>::
        show_population((storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>
                         *)(auStack_138 + 8),(context *)tStack_1f8.tv_nsec);
        if ((((solver_finished_cb *)(lVar41 + 0x158))->super__Function_base)._M_manager !=
            (_Manager_type)0x0) {
          (*((solver_finished_cb *)(tStack_1f8.tv_nsec + 0x158))->_M_invoker)
                    ((_Any_data *)(tStack_1f8.tv_nsec + 0x158),(result *)tStack_1f8.tv_sec);
        }
        operator_delete__(prVar30);
        if (pdStack_90 != (pointer)0x0) {
          operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
        }
        __return_storage_ptr__ = (result *)tStack_1f8.tv_sec;
        if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
            (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
          operator_delete__(_Stack_b0._M_head_impl);
        }
        _Stack_b0._M_head_impl = (unsigned_long *)0x0;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
          operator_delete__(_Stack_c0._M_head_impl);
        }
        _Stack_c0._M_head_impl = (unsigned_long *)0x0;
        std::
        vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
        ::~vector(&vStack_e0);
        if (piStack_f8 != (int *)0x0) {
          operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
        if ((void *)auStack_1b8._0_8_ != (void *)0x0) {
          operator_delete((void *)auStack_1b8._0_8_,(long)dStack_1a8 - auStack_1b8._0_8_);
        }
        if ((tuple<int_*,_std::default_delete<int[]>_>)
            qStack_178.linear_elements._M_t.
            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl !=
            (_Head_base<0UL,_int_*,_false>)0x0) {
          operator_delete__((void *)qStack_178.linear_elements._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl);
        }
LAB_005596b4:
        std::
        vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   *)(auStack_1a0 + 0x10));
        return __return_storage_ptr__;
      }
      if (!is_optimization) {
        prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
                            (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
        return prVar27;
      }
      auVar92 = ZEXT1664((undefined1  [16])0x0);
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->variable_name).
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
      (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
      (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
      (__return_storage_ptr__->affected_vars).names =
           (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            )auVar57._32_24_;
      (__return_storage_ptr__->affected_vars).values.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)auVar57._56_8_;
      __return_storage_ptr__->remaining_constraints = 0x7fffffff;
      __return_storage_ptr__->annoying_variable = 0;
      __return_storage_ptr__->status = uninitialized;
      if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
      }
      make_merged_constraints
                ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)(auStack_1a0 + 0x10),ctx,pb);
      if ((auStack_1a0._16_8_ == auStack_188._0_8_) ||
         ((pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        __return_storage_ptr__->status = success;
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,1);
        (__return_storage_ptr__->solutions).
        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
        (__return_storage_ptr__->strings).
        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__return_storage_ptr__->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(pb->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
        goto LAB_00558891;
      }
      uVar29 = std::chrono::_V2::system_clock::now();
      uVar42 = (ulong)(ctx->parameters).seed;
      if (uVar42 != 0) {
        uVar29 = uVar42;
      }
      rStack_1c0._M_x = uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0);
      iVar26 = (int)((ulong)((long)(pb->vars).values.
                                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pb->vars).values.
                                  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
      uStack_200 = (context *)CONCAT44(iVar26,(uint)uStack_200);
      default_cost_type<double>::default_cost_type
                ((default_cost_type<double> *)(auStack_188 + 0x10),&pb->objective,iVar26);
      auStack_1a0._8_8_ = (pb->objective).value;
      uVar35 = (ctx->parameters).thread;
      auStack_1a0._0_8_ = pb;
      if ((int)uVar35 < 1) {
        uVar35 = std::thread::hardware_concurrency();
      }
      dStack_1a8 = 0.0;
      uVar37 = uVar35 + (uVar35 == 0);
      uVar29 = (ulong)uVar37;
      auStack_1b8 = (undefined1  [16])0x0;
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                (&vStack_150,uVar29,(allocator_type *)auStack_138);
      tStack_1f8.tv_sec = (__time_t)__return_storage_ptr__;
      best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::maximize_tag>
      ::best_solution_recorder
                ((best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::maximize_tag>
                  *)auStack_138,(random_engine *)(auStack_1c8 + 8),uVar37,
                 (default_cost_type<double> *)(auStack_188 + 0x10),(double)auStack_1a0._8_8_,
                 uStack_200._4_4_,
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)(auStack_1a0 + 0x10),(ctx->parameters).init_population_size);
      prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
      tStack_1f8.tv_nsec = (long)ctx;
      memset(prVar30,0,uVar29 * 8);
      tStack_1e8.tv_sec = 0;
      tStack_1e8.tv_nsec = -1;
      rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                         ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          (auStack_1c8 + 8),(param_type *)&tStack_1e8);
      *prVar30 = rVar31;
      if (1 < uVar35) {
        uVar42 = 1;
        do {
          rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
          prVar30[uVar42] = rVar31;
          uVar32 = uVar42 - 1;
          if (uVar32 != 0) {
            do {
              iVar26 = (int)uVar32;
              if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                   ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                    (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                     *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
                prVar30[uVar32 & 0xffffffff] = rVar31;
                iVar26 = (int)uVar42;
              }
              uVar32 = (ulong)(iVar26 - 1U);
            } while (iVar26 - 1U != 0);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar29);
      }
      lVar41 = tStack_1f8.tv_nsec;
      uVar35 = 0;
      uStack_200._0_4_ = (uint)(uint3)uStack_200;
      LOCK();
      UNLOCK();
      tStack_1e8.tv_sec = tStack_1e8.tv_sec & 0xffffffff00000000;
      pvVar3 = (variables *)(auStack_1a0._0_8_ + 0x90);
      do {
        std::
        vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>>>
        ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                  ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>>>
                    *)auStack_1b8,(context *)lVar41,(uint *)&tStack_1e8,prVar30 + uVar35);
        uVar35 = (int)tStack_1e8.tv_sec + 1;
        tStack_1e8.tv_sec = CONCAT44(tStack_1e8.tv_sec._4_4_,uVar35);
      } while (uVar35 != uVar37);
      lVar41 = 0;
      lVar40 = 0;
      qStack_178.quadratic_elements._M_t.
      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl
           = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
              )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                )pvVar3;
      do {
        rStack_1d0._M_data = (atomic<bool> *)((long)&uStack_200 + 3);
        rStack_1d8._M_data =
             (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
              *)auStack_138;
        rStack_158._M_data =
             (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              *)(auStack_1a0 + 0x10);
        auStack_1c8 = (undefined1  [8])(auStack_1b8._0_8_ + lVar41);
        qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl =
             (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)(auStack_188 + 0x10);
        std::thread::
        thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<double>,double,baryonyx::itm::maximize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<double>const>,double&,void>
                  ((thread *)&tStack_1e8,
                   (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>_>
                    *)auStack_1c8,&rStack_1d0,
                   (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::maximize_tag>_>
                    *)&rStack_1d8,&rStack_158,(int *)((long)&uStack_200 + 4),
                   (reference_wrapper<const_baryonyx::itm::default_cost_type<double>_> *)
                   &qStack_178.indices,(double *)(auStack_1a0 + 8));
        if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start[lVar40]._M_id._M_thread != 0) {
          std::terminate();
        }
        lVar41 = lVar41 + 0xc0;
        vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[lVar40]._M_id._M_thread = tStack_1e8.tv_sec;
        lVar40 = lVar40 + 1;
      } while (uVar37 != (uint)lVar40);
      lVar41 = std::chrono::_V2::steady_clock::now();
      auVar57 = vpbroadcastq_avx512f();
      auStack_78 = vmovdqu64_avx512f(auVar57);
      psVar2 = (solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138);
      do {
        tStack_1e8.tv_sec = 1;
        tStack_1e8.tv_nsec = 0;
        do {
          ptVar39 = &tStack_1e8;
          iVar26 = nanosleep(&tStack_1e8,&tStack_1e8);
          if (iVar26 != -1) break;
          piVar33 = __errno_location();
        } while (*piVar33 == 4);
        if ((((solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138))->super__Function_base)._M_manager
            != (_Manager_type)0x0) {
          auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar92 = vmovdqu64_avx512f(auStack_78);
          auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
          auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
          auVar93 = ZEXT1664((undefined1  [16])0x0);
          uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
          do {
            vpmullq_avx512dq(auVar57,auVar58);
            uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
            auVar60 = vmovdqa64_avx512f(auVar93);
            auVar57 = vpaddq_avx512f(auVar57,auVar59);
            uVar42 = uVar42 - 8;
            auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                          ((long)&ptVar39[0xb].tv_sec + auStack_1b8._0_8_));
            auVar65._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
            auVar65._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
            auVar65._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
            auVar65._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
            auVar65._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
            auVar65._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
            auVar65._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
            auVar65._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
            auVar93 = vpaddq_avx512f(auVar65,auVar60);
          } while (uVar42 != 0);
          auVar57 = vmovdqa64_avx512f(auVar93);
          bVar5 = (bool)((byte)uVar32 & 1);
          auVar66._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
          bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar66._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
          bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar66._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
          bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar66._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
          bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar66._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
          bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar66._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
          bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar66._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
          auVar66._56_8_ =
               (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
          auVar44 = vextracti64x4_avx512f(auVar66,1);
          auVar57 = vpaddq_avx512f(auVar66,ZEXT3264(auVar44));
          auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
          auVar13 = vpshufd_avx(auVar12,0xee);
          auVar12 = vpaddq_avx(auVar12,auVar13);
          storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>::get_best
                    ((storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>
                      *)(auStack_138 + 8),(int *)&rStack_1d8,(double *)auStack_1c8,
                     (double *)&rStack_1d0,&tStack_1e8.tv_sec);
          std::function<void_(int,_double,_long,_double,_long)>::operator()
                    (psVar2,(int)rStack_1d8._M_data,(double)auStack_1c8,tStack_1e8.tv_sec,
                     (double)rStack_1d0._M_data,auVar12._0_8_);
        }
        lVar43 = std::chrono::_V2::steady_clock::now();
        uVar25 = auStack_1a0._0_8_;
        lVar40 = tStack_1f8.tv_nsec;
        dVar4 = ((solver_parameters *)tStack_1f8.tv_nsec)->time_limit;
      } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar41) / 1000000000.0 <= dVar4));
      LOCK();
      uStack_200._0_4_ = CONCAT13(1,(uint3)uStack_200);
      UNLOCK();
      prVar27 = (result *)tStack_1f8.tv_sec;
      for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                     _M_impl.super__Vector_impl_data._M_start; tStack_1f8.tv_sec = (__time_t)prVar27
          , ptVar36 !=
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
        std::thread::join();
        prVar27 = (result *)tStack_1f8.tv_sec;
      }
      (prVar27->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (((string_buffer_ptr *)uVar25)->
               super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(prVar27->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(((string_buffer_ptr *)uVar25)->
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&(prVar27->affected_vars).names,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)(uVar25 + 0xc0));
      std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                (&(prVar27->affected_vars).values,&((affected_variables *)(uVar25 + 0xc0))->values);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&prVar27->variable_name,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)qStack_178.quadratic_elements._M_t.
                     super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     .
                     super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                     ._M_head_impl);
      prVar27->variables = uStack_200._4_4_;
      prVar27->constraints =
           (int)((ulong)(auStack_188._0_8_ - auStack_1a0._16_8_) >> 3) * -0x33333333;
      iVar26 = *piStack_f8;
      iVar8 = vStack_e0.
              super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
      prVar28 = vStack_e0.
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar26;
      prVar27->status = (uint)(iVar8 != 0) * 3;
      prVar27->duration =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
      prVar27->loop =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
      prVar27->remaining_constraints = iVar8;
      sVar9 = ((solver_parameters *)lVar40)->storage;
      if (sVar9 == one) {
        pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                 (tStack_1f8.tv_sec + 0x68);
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1);
        psVar38 = (pvVar1->
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                  _M_impl.super__Vector_impl_data._M_start;
LAB_0055878e:
        convert<baryonyx::itm::maximize_tag>(prVar28,psVar38,uStack_200._4_4_);
      }
      else {
        if (sVar9 == bound) {
          pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                   (tStack_1f8.tv_sec + 0x68);
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
          convert<baryonyx::itm::maximize_tag>
                    (prVar28,(pvVar1->
                             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                             )._M_impl.super__Vector_impl_data._M_start,uStack_200._4_4_);
          prVar28 = storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>::
                    get_worst((storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>
                               *)(auStack_138 + 8));
          psVar38 = (pvVar1->
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                    _M_impl.super__Vector_impl_data._M_start + 1;
          goto LAB_0055878e;
        }
        if (sVar9 == five) {
          pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                   (tStack_1f8.tv_sec + 0x68);
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,5);
          lVar40 = 0;
          lVar41 = 0;
          do {
            convert<baryonyx::itm::maximize_tag>
                      (vStack_e0.
                       super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41],
                       (solution *)
                       ((long)&(((pvVar1->
                                 super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->variables).
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                       + lVar40),uStack_200._4_4_);
            lVar41 = lVar41 + 1;
            lVar40 = lVar40 + 0x20;
          } while (lVar41 != 5);
        }
      }
      lVar41 = tStack_1f8.tv_nsec;
      storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>::
      show_population((storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>
                       *)(auStack_138 + 8),(context *)tStack_1f8.tv_nsec);
      if ((((solver_finished_cb *)(lVar41 + 0x158))->super__Function_base)._M_manager !=
          (_Manager_type)0x0) {
        (*((solver_finished_cb *)(tStack_1f8.tv_nsec + 0x158))->_M_invoker)
                  ((_Any_data *)(tStack_1f8.tv_nsec + 0x158),(result *)tStack_1f8.tv_sec);
      }
      operator_delete__(prVar30);
      if (pdStack_90 != (pointer)0x0) {
        operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
      }
      __return_storage_ptr__ = (result *)tStack_1f8.tv_sec;
      if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
          (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
        operator_delete__(_Stack_b0._M_head_impl);
      }
      _Stack_b0._M_head_impl = (unsigned_long *)0x0;
      if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
          _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
        operator_delete__(_Stack_c0._M_head_impl);
      }
      _Stack_c0._M_head_impl = (unsigned_long *)0x0;
      std::
      vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
      ::~vector(&vStack_e0);
      if (piStack_f8 != (int *)0x0) {
        operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
      if ((void *)auStack_1b8._0_8_ != (void *)0x0) {
        operator_delete((void *)auStack_1b8._0_8_,(long)dStack_1a8 - auStack_1b8._0_8_);
      }
      if ((tuple<int_*,_std::default_delete<int[]>_>)
          qStack_178.linear_elements._M_t.
          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0)
      {
        operator_delete__((void *)qStack_178.linear_elements._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl);
      }
LAB_00558891:
      std::
      vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
      ~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)(auStack_1a0 + 0x10));
      return __return_storage_ptr__;
    }
    if (bVar5 == false) {
      if (!is_optimization) {
        prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
                            (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
        return prVar27;
      }
      auVar92 = ZEXT1664((undefined1  [16])0x0);
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->variable_name).
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
      (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
      (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
      (__return_storage_ptr__->affected_vars).names =
           (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            )auVar57._32_24_;
      (__return_storage_ptr__->affected_vars).values.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)auVar57._56_8_;
      __return_storage_ptr__->remaining_constraints = 0x7fffffff;
      __return_storage_ptr__->annoying_variable = 0;
      __return_storage_ptr__->status = uninitialized;
      if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
      }
      make_merged_constraints
                ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)auStack_1a0,ctx,pb);
      if ((auStack_1a0._0_8_ == auStack_1a0._8_8_) ||
         ((pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        __return_storage_ptr__->status = success;
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,1);
        (__return_storage_ptr__->solutions).
        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
        (__return_storage_ptr__->strings).
        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__return_storage_ptr__->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(pb->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
        goto LAB_0057251c;
      }
      uVar29 = std::chrono::_V2::system_clock::now();
      uVar42 = (ulong)(ctx->parameters).seed;
      if (uVar42 != 0) {
        uVar29 = uVar42;
      }
      rStack_1d0._M_data = (atomic<bool> *)(uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0))
      ;
      uVar35 = (int)((ulong)((long)(pb->vars).values.
                                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pb->vars).values.
                                  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
      lVar41 = (ulong)uVar35 << 0x20;
      quadratic_cost_type<double>::quadratic_cost_type
                ((quadratic_cost_type<double> *)auStack_188,&pb->objective,uVar35);
      dStack_1a8 = (pb->objective).value;
      uVar35 = (ctx->parameters).thread;
      if ((int)uVar35 < 1) {
        uVar35 = std::thread::hardware_concurrency();
      }
      auVar19._8_8_ = 0;
      auVar19._0_8_ = auStack_1b8._8_8_;
      auStack_1b8 = auVar19 << 0x40;
      uVar37 = uVar35 + (uVar35 == 0);
      uVar29 = (ulong)uVar37;
      _auStack_1c8 = (undefined1  [16])0x0;
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                (&vStack_150,uVar29,(allocator_type *)auStack_138);
      best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::maximize_tag>
      ::best_solution_recorder
                ((best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::maximize_tag>
                  *)auStack_138,(random_engine *)&rStack_1d0,uVar37,
                 (quadratic_cost_type<double> *)auStack_188,dStack_1a8,(int)((ulong)lVar41 >> 0x20),
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)auStack_1a0,(ctx->parameters).init_population_size);
      prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
      uStack_200 = ctx;
      memset(prVar30,0,uVar29 * 8);
      tStack_1f8.tv_sec = 0;
      tStack_1f8.tv_nsec = -1;
      rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                         ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          &rStack_1d0,(param_type *)&tStack_1f8);
      uVar94 = (uint)((ulong)lVar41 >> 0x20);
      *prVar30 = rVar31;
      if (1 < uVar35) {
        uVar42 = 1;
        do {
          rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)&rStack_1d0,(param_type *)&tStack_1f8);
          prVar30[uVar42] = rVar31;
          uVar32 = uVar42 - 1;
          if (uVar32 != 0) {
            do {
              iVar26 = (int)uVar32;
              if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                   ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                    (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                     *)&rStack_1d0,(param_type *)&tStack_1f8);
                prVar30[uVar32 & 0xffffffff] = rVar31;
                iVar26 = (int)uVar42;
              }
              uVar32 = (ulong)(iVar26 - 1U);
            } while (iVar26 - 1U != 0);
          }
          uVar94 = (uint)((ulong)lVar41 >> 0x20);
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar29);
      }
      pcVar24 = uStack_200;
      uVar35 = 0;
      LOCK();
      lVar41 = (ulong)uVar94 << 0x20;
      UNLOCK();
      tStack_1f8.tv_sec = tStack_1f8.tv_sec & 0xffffffff00000000;
      pvVar3 = (variables *)(auStack_1b8._8_8_ + 0x90);
      do {
        std::
        vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>>>
        ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                  ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>>>
                    *)auStack_1c8,pcVar24,(uint *)&tStack_1f8,prVar30 + uVar35);
        uVar35 = (int)tStack_1f8.tv_sec + 1;
        tStack_1f8.tv_sec = CONCAT44(tStack_1f8.tv_sec._4_4_,uVar35);
      } while (uVar35 != uVar37);
      lVar40 = 0;
      lVar43 = 0;
      qStack_178.quadratic_elements._M_t.
      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl
           = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
              )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                )pvVar3;
      do {
        tStack_1e8.tv_nsec = (long)&stack0xfffffffffffffdf3;
        tStack_1e8.tv_sec = (__time_t)auStack_138;
        rStack_158._M_data =
             (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              *)auStack_1a0;
        rStack_1d8._M_data =
             (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
              *)((long)(context **)auStack_1c8 + lVar40);
        qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl =
             (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)auStack_188;
        std::thread::
        thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,double,baryonyx::itm::maximize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::quadratic_cost_type<double>const>,double&,void>
                  ((thread *)&tStack_1f8,
                   (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>_>
                    *)&rStack_1d8,(reference_wrapper<std::atomic<bool>_> *)&tStack_1e8.tv_nsec,
                   (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::maximize_tag>_>
                    *)&tStack_1e8,&rStack_158,(int *)&stack0xfffffffffffffdf4,
                   (reference_wrapper<const_baryonyx::itm::quadratic_cost_type<double>_> *)
                   &qStack_178.indices,&dStack_1a8);
        if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start[lVar43]._M_id._M_thread != 0) {
          std::terminate();
        }
        lVar40 = lVar40 + 0xc0;
        vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[lVar43]._M_id._M_thread = tStack_1f8.tv_sec;
        lVar43 = lVar43 + 1;
      } while (uVar37 != (uint)lVar43);
      lVar40 = std::chrono::_V2::steady_clock::now();
      auVar57 = vpbroadcastq_avx512f();
      auStack_78 = vmovdqu64_avx512f(auVar57);
      psVar2 = &uStack_200->update;
      do {
        tStack_1f8.tv_sec = 1;
        tStack_1f8.tv_nsec = 0;
        do {
          ptVar39 = &tStack_1f8;
          iVar26 = nanosleep(&tStack_1f8,&tStack_1f8);
          if (iVar26 != -1) break;
          piVar33 = __errno_location();
        } while (*piVar33 == 4);
        if ((uStack_200->update).super__Function_base._M_manager != (_Manager_type)0x0) {
          auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar92 = vmovdqu64_avx512f(auStack_78);
          auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
          auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
          auVar93 = ZEXT1664((undefined1  [16])0x0);
          uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
          do {
            vpmullq_avx512dq(auVar57,auVar58);
            uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
            auVar60 = vmovdqa64_avx512f(auVar93);
            auVar57 = vpaddq_avx512f(auVar57,auVar59);
            uVar42 = uVar42 - 8;
            auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                          ((long)((long)auStack_1c8 + 0xb0) + (long)ptVar39));
            auVar71._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
            auVar71._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
            auVar71._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
            auVar71._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
            auVar71._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
            auVar71._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
            auVar71._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
            auVar71._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
            auVar93 = vpaddq_avx512f(auVar71,auVar60);
          } while (uVar42 != 0);
          auVar57 = vmovdqa64_avx512f(auVar93);
          bVar5 = (bool)((byte)uVar32 & 1);
          auVar72._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
          bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar72._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
          bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar72._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
          bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar72._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
          bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar72._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
          bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar72._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
          bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar72._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
          auVar72._56_8_ =
               (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
          auVar44 = vextracti64x4_avx512f(auVar72,1);
          auVar57 = vpaddq_avx512f(auVar72,ZEXT3264(auVar44));
          auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
          auVar13 = vpshufd_avx(auVar12,0xee);
          auVar12 = vpaddq_avx(auVar12,auVar13);
          storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::maximize_tag>::get_best
                    ((storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::maximize_tag>
                      *)(auStack_138 + 8),(int *)&tStack_1e8,(double *)&rStack_1d8,
                     (double *)&tStack_1e8.tv_nsec,&tStack_1f8.tv_sec);
          std::function<void_(int,_double,_long,_double,_long)>::operator()
                    (psVar2,(int)tStack_1e8.tv_sec,(double)rStack_1d8._M_data,tStack_1f8.tv_sec,
                     (double)tStack_1e8.tv_nsec,auVar12._0_8_);
        }
        lVar43 = std::chrono::_V2::steady_clock::now();
        pcVar24 = uStack_200;
        dVar4 = (uStack_200->parameters).time_limit;
      } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar40) / 1000000000.0 <= dVar4));
      LOCK();
      iVar95 = (index)((ulong)lVar41 >> 0x20);
      UNLOCK();
      uVar25 = auStack_1b8._8_8_;
      for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ptVar36 !=
          vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
        std::thread::join();
      }
      (__return_storage_ptr__->strings).
      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)uVar25;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(__return_storage_ptr__->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + 8));
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&(__return_storage_ptr__->affected_vars).names,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)(uVar25 + 0xc0));
      std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                (&(__return_storage_ptr__->affected_vars).values,
                 (vector<signed_char,_std::allocator<signed_char>_> *)(uVar25 + 0xd8));
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&__return_storage_ptr__->variable_name,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)qStack_178.quadratic_elements._M_t.
                     super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     .
                     super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                     ._M_head_impl);
      __return_storage_ptr__->variables = iVar95;
      __return_storage_ptr__->constraints =
           (int)((ulong)(auStack_1a0._8_8_ - auStack_1a0._0_8_) >> 3) * -0x33333333;
      iVar26 = *piStack_f8;
      iVar8 = vStack_e0.
              super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
      prVar28 = vStack_e0.
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar26;
      __return_storage_ptr__->status = (uint)(iVar8 != 0) * 3;
      __return_storage_ptr__->duration =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
      __return_storage_ptr__->loop =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
      __return_storage_ptr__->remaining_constraints = iVar8;
      sVar9 = (pcVar24->parameters).storage;
      if (sVar9 == one) {
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,1);
        psVar38 = (__return_storage_ptr__->solutions).
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                  _M_impl.super__Vector_impl_data._M_start;
LAB_005723dd:
        convert<baryonyx::itm::maximize_tag>(prVar28,psVar38,iVar95);
      }
      else {
        if (sVar9 == bound) {
          pvVar1 = &__return_storage_ptr__->solutions;
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
          convert<baryonyx::itm::maximize_tag>
                    (prVar28,(pvVar1->
                             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                             )._M_impl.super__Vector_impl_data._M_start,iVar95);
          prVar28 = storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::maximize_tag>
                    ::get_worst((storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::maximize_tag>
                                 *)(auStack_138 + 8));
          psVar38 = (pvVar1->
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                    _M_impl.super__Vector_impl_data._M_start + 1;
          goto LAB_005723dd;
        }
        if (sVar9 == five) {
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                    (&__return_storage_ptr__->solutions,5);
          lVar40 = 0;
          lVar41 = 0;
          do {
            convert<baryonyx::itm::maximize_tag>
                      (vStack_e0.
                       super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41],
                       (solution *)
                       ((long)&(((__return_storage_ptr__->solutions).
                                 super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->variables).
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                       + lVar40),iVar95);
            lVar41 = lVar41 + 1;
            lVar40 = lVar40 + 0x20;
          } while (lVar41 != 5);
        }
      }
      pcVar24 = uStack_200;
      storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::maximize_tag>::
      show_population((storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::maximize_tag>
                       *)(auStack_138 + 8),uStack_200);
      if ((pcVar24->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(uStack_200->finish)._M_invoker)((_Any_data *)&uStack_200->finish,__return_storage_ptr__);
      }
      operator_delete__(prVar30);
      if (pdStack_90 != (pointer)0x0) {
        operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
      }
      if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
          (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
        operator_delete__(_Stack_b0._M_head_impl);
      }
      _Stack_b0._M_head_impl = (unsigned_long *)0x0;
      if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
          _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
        operator_delete__(_Stack_c0._M_head_impl);
      }
      _Stack_c0._M_head_impl = (unsigned_long *)0x0;
      std::
      vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
      ::~vector(&vStack_e0);
      if (piStack_f8 != (int *)0x0) {
        operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
      if (auStack_1c8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_1c8,auStack_1b8._0_8_ - (long)auStack_1c8);
      }
      if ((tuple<int_*,_std::default_delete<int[]>_>)
          qStack_178.linear_elements._M_t.
          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0)
      {
        operator_delete__((void *)qStack_178.linear_elements._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl);
      }
      qStack_178.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
      if ((_Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
           )qStack_178.obj != (quad *)0x0) {
        operator_delete__(qStack_178.obj);
      }
      qStack_178.obj = (objective_function *)0x0;
      if ((_Head_base<0UL,_float_*,_false>)auStack_188._8_8_ != (_Head_base<0UL,_float_*,_false>)0x0
         ) {
        operator_delete__((void *)auStack_188._8_8_);
      }
LAB_0057251c:
      std::
      vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
      ~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)auStack_1a0);
      return __return_storage_ptr__;
    }
    if (!is_optimization) {
      prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
                          (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
      return prVar27;
    }
    auVar92 = ZEXT1664((undefined1  [16])0x0);
    auVar57 = vmovdqu64_avx512f(auVar92);
    *(undefined1 (*) [64])
     &(__return_storage_ptr__->variable_name).
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = auVar57;
    auVar57 = vmovdqu64_avx512f(auVar92);
    *(undefined1 (*) [64])
     &(__return_storage_ptr__->affected_vars).values.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_finish = auVar57;
    auVar57 = vmovdqu64_avx512f(auVar92);
    __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
    (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
    (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
    (__return_storage_ptr__->affected_vars).names =
         (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          )auVar57._32_24_;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)auVar57._56_8_;
    __return_storage_ptr__->remaining_constraints = 0x7fffffff;
    __return_storage_ptr__->annoying_variable = 0;
    __return_storage_ptr__->status = uninitialized;
    if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
    }
    make_merged_constraints
              ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)auStack_1a0,ctx,pb);
    if ((auStack_1a0._0_8_ == auStack_1a0._8_8_) ||
       ((pb->vars).values.
        super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pb->vars).values.
        super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      __return_storage_ptr__->status = success;
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                (&__return_storage_ptr__->solutions,1);
      (__return_storage_ptr__->solutions).
      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
      (__return_storage_ptr__->strings).
      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(__return_storage_ptr__->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(pb->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
      std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
      goto LAB_0057168b;
    }
    uVar29 = std::chrono::_V2::system_clock::now();
    uVar42 = (ulong)(ctx->parameters).seed;
    if (uVar42 != 0) {
      uVar29 = uVar42;
    }
    rStack_1d0._M_data = (atomic<bool> *)(uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0));
    uVar35 = (int)((ulong)((long)(pb->vars).values.
                                 super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pb->vars).values.
                                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    lVar41 = (ulong)uVar35 << 0x20;
    quadratic_cost_type<double>::quadratic_cost_type
              ((quadratic_cost_type<double> *)auStack_188,&pb->objective,uVar35);
    dStack_1a8 = (pb->objective).value;
    uVar35 = (ctx->parameters).thread;
    if ((int)uVar35 < 1) {
      uVar35 = std::thread::hardware_concurrency();
    }
    auVar18._8_8_ = 0;
    auVar18._0_8_ = auStack_1b8._8_8_;
    auStack_1b8 = auVar18 << 0x40;
    uVar37 = uVar35 + (uVar35 == 0);
    uVar29 = (ulong)uVar37;
    _auStack_1c8 = (undefined1  [16])0x0;
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              (&vStack_150,uVar29,(allocator_type *)auStack_138);
    best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::maximize_tag>
    ::best_solution_recorder
              ((best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::maximize_tag>
                *)auStack_138,(random_engine *)&rStack_1d0,uVar37,
               (quadratic_cost_type<double> *)auStack_188,dStack_1a8,(int)((ulong)lVar41 >> 0x20),
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)auStack_1a0,(ctx->parameters).init_population_size);
    prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
    uStack_200 = ctx;
    memset(prVar30,0,uVar29 * 8);
    tStack_1f8.tv_sec = 0;
    tStack_1f8.tv_nsec = -1;
    rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                       ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                        (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                        &rStack_1d0,(param_type *)&tStack_1f8);
    uVar94 = (uint)((ulong)lVar41 >> 0x20);
    *prVar30 = rVar31;
    if (1 < uVar35) {
      uVar42 = 1;
      do {
        rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                            (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *
                            )&rStack_1d0,(param_type *)&tStack_1f8);
        prVar30[uVar42] = rVar31;
        uVar32 = uVar42 - 1;
        if (uVar32 != 0) {
          do {
            iVar26 = (int)uVar32;
            if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
              rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                 ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                  (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                   *)&rStack_1d0,(param_type *)&tStack_1f8);
              prVar30[uVar32 & 0xffffffff] = rVar31;
              iVar26 = (int)uVar42;
            }
            uVar32 = (ulong)(iVar26 - 1U);
          } while (iVar26 - 1U != 0);
        }
        uVar94 = (uint)((ulong)lVar41 >> 0x20);
        uVar42 = uVar42 + 1;
      } while (uVar42 != uVar29);
    }
    pcVar24 = uStack_200;
    uVar35 = 0;
    LOCK();
    lVar41 = (ulong)uVar94 << 0x20;
    UNLOCK();
    tStack_1f8.tv_sec = tStack_1f8.tv_sec & 0xffffffff00000000;
    pvVar3 = (variables *)(auStack_1b8._8_8_ + 0x90);
    do {
      std::
      vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>>>
      ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>>>
                  *)auStack_1c8,pcVar24,(uint *)&tStack_1f8,prVar30 + uVar35);
      uVar35 = (int)tStack_1f8.tv_sec + 1;
      tStack_1f8.tv_sec = CONCAT44(tStack_1f8.tv_sec._4_4_,uVar35);
    } while (uVar35 != uVar37);
    lVar40 = 0;
    lVar43 = 0;
    qStack_178.quadratic_elements._M_t.
    super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
    .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl =
         (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
          )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
            )pvVar3;
    do {
      tStack_1e8.tv_nsec = (long)&stack0xfffffffffffffdf3;
      tStack_1e8.tv_sec = (__time_t)auStack_138;
      rStack_158._M_data =
           (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *)auStack_1a0;
      rStack_1d8._M_data =
           (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
            *)((long)(context **)auStack_1c8 + lVar40);
      qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)auStack_188;
      std::thread::
      thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,double,baryonyx::itm::maximize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::quadratic_cost_type<double>const>,double&,void>
                ((thread *)&tStack_1f8,
                 (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>_>
                  *)&rStack_1d8,(reference_wrapper<std::atomic<bool>_> *)&tStack_1e8.tv_nsec,
                 (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::maximize_tag>_>
                  *)&tStack_1e8,&rStack_158,(int *)&stack0xfffffffffffffdf4,
                 (reference_wrapper<const_baryonyx::itm::quadratic_cost_type<double>_> *)
                 &qStack_178.indices,&dStack_1a8);
      if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar43]._M_id._M_thread != 0) {
        std::terminate();
      }
      lVar40 = lVar40 + 0xc0;
      vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[lVar43]._M_id._M_thread = tStack_1f8.tv_sec;
      lVar43 = lVar43 + 1;
    } while (uVar37 != (uint)lVar43);
    lVar40 = std::chrono::_V2::steady_clock::now();
    auVar57 = vpbroadcastq_avx512f();
    auStack_78 = vmovdqu64_avx512f(auVar57);
    psVar2 = &uStack_200->update;
    do {
      tStack_1f8.tv_sec = 1;
      tStack_1f8.tv_nsec = 0;
      do {
        ptVar39 = &tStack_1f8;
        iVar26 = nanosleep(&tStack_1f8,&tStack_1f8);
        if (iVar26 != -1) break;
        piVar33 = __errno_location();
      } while (*piVar33 == 4);
      if ((uStack_200->update).super__Function_base._M_manager != (_Manager_type)0x0) {
        auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar92 = vmovdqu64_avx512f(auStack_78);
        auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
        auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
        auVar93 = ZEXT1664((undefined1  [16])0x0);
        uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
        do {
          vpmullq_avx512dq(auVar57,auVar58);
          uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
          auVar60 = vmovdqa64_avx512f(auVar93);
          auVar57 = vpaddq_avx512f(auVar57,auVar59);
          uVar42 = uVar42 - 8;
          auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                        ((long)((long)auStack_1c8 + 0xb0) + (long)ptVar39));
          auVar69._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
          auVar69._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
          auVar69._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
          auVar69._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
          auVar69._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
          auVar69._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
          auVar69._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
          auVar69._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
          auVar93 = vpaddq_avx512f(auVar69,auVar60);
        } while (uVar42 != 0);
        auVar57 = vmovdqa64_avx512f(auVar93);
        bVar5 = (bool)((byte)uVar32 & 1);
        auVar70._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
        bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar70._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
        bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar70._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
        bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar70._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
        bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar70._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
        bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar70._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
        bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar70._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
        auVar70._56_8_ =
             (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
        auVar44 = vextracti64x4_avx512f(auVar70,1);
        auVar57 = vpaddq_avx512f(auVar70,ZEXT3264(auVar44));
        auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
        auVar13 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpaddq_avx(auVar12,auVar13);
        storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::maximize_tag>::get_best
                  ((storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::maximize_tag>
                    *)(auStack_138 + 8),(int *)&tStack_1e8,(double *)&rStack_1d8,
                   (double *)&tStack_1e8.tv_nsec,&tStack_1f8.tv_sec);
        std::function<void_(int,_double,_long,_double,_long)>::operator()
                  (psVar2,(int)tStack_1e8.tv_sec,(double)rStack_1d8._M_data,tStack_1f8.tv_sec,
                   (double)tStack_1e8.tv_nsec,auVar12._0_8_);
      }
      lVar43 = std::chrono::_V2::steady_clock::now();
      pcVar24 = uStack_200;
      dVar4 = (uStack_200->parameters).time_limit;
    } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar40) / 1000000000.0 <= dVar4));
    LOCK();
    iVar95 = (index)((ulong)lVar41 >> 0x20);
    UNLOCK();
    uVar25 = auStack_1b8._8_8_;
    for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ptVar36 !=
        vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
      std::thread::join();
    }
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)uVar25;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__return_storage_ptr__->strings).
                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + 8));
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&(__return_storage_ptr__->affected_vars).names,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)(uVar25 + 0xc0));
    std::vector<signed_char,_std::allocator<signed_char>_>::operator=
              (&(__return_storage_ptr__->affected_vars).values,
               (vector<signed_char,_std::allocator<signed_char>_> *)(uVar25 + 0xd8));
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&__return_storage_ptr__->variable_name,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)qStack_178.quadratic_elements._M_t.
                   super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                   .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                   ._M_head_impl);
    __return_storage_ptr__->variables = iVar95;
    __return_storage_ptr__->constraints =
         (int)((ulong)(auStack_1a0._8_8_ - auStack_1a0._0_8_) >> 3) * -0x33333333;
    iVar26 = *piStack_f8;
    iVar8 = vStack_e0.
            super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
    prVar28 = vStack_e0.
              super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
              ._M_impl.super__Vector_impl_data._M_start + iVar26;
    __return_storage_ptr__->status = (uint)(iVar8 != 0) * 3;
    __return_storage_ptr__->duration =
         vStack_e0.
         super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
    __return_storage_ptr__->loop =
         vStack_e0.
         super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
    __return_storage_ptr__->remaining_constraints = iVar8;
    sVar9 = (pcVar24->parameters).storage;
    if (sVar9 == one) {
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                (&__return_storage_ptr__->solutions,1);
      psVar38 = (__return_storage_ptr__->solutions).
                super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
                super__Vector_impl_data._M_start;
LAB_0057154c:
      convert<baryonyx::itm::maximize_tag>(prVar28,psVar38,iVar95);
    }
    else {
      if (sVar9 == bound) {
        pvVar1 = &__return_storage_ptr__->solutions;
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
        convert<baryonyx::itm::maximize_tag>
                  (prVar28,(pvVar1->
                           super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                           )._M_impl.super__Vector_impl_data._M_start,iVar95);
        prVar28 = storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::maximize_tag>::
                  get_worst((storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::maximize_tag>
                             *)(auStack_138 + 8));
        psVar38 = (pvVar1->
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                  _M_impl.super__Vector_impl_data._M_start + 1;
        goto LAB_0057154c;
      }
      if (sVar9 == five) {
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,5);
        lVar40 = 0;
        lVar41 = 0;
        do {
          convert<baryonyx::itm::maximize_tag>
                    (vStack_e0.
                     super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41],
                     (solution *)
                     ((long)&(((__return_storage_ptr__->solutions).
                               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                               ._M_impl.super__Vector_impl_data._M_start)->variables).
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl +
                     lVar40),iVar95);
          lVar41 = lVar41 + 1;
          lVar40 = lVar40 + 0x20;
        } while (lVar41 != 5);
      }
    }
    pcVar24 = uStack_200;
    storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::maximize_tag>::
    show_population((storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::maximize_tag>
                     *)(auStack_138 + 8),uStack_200);
    if ((pcVar24->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(uStack_200->finish)._M_invoker)((_Any_data *)&uStack_200->finish,__return_storage_ptr__);
    }
    operator_delete__(prVar30);
    if (pdStack_90 != (pointer)0x0) {
      operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
    }
    if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
        (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
      operator_delete__(_Stack_b0._M_head_impl);
    }
    _Stack_b0._M_head_impl = (unsigned_long *)0x0;
    if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
        _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
      operator_delete__(_Stack_c0._M_head_impl);
    }
    _Stack_c0._M_head_impl = (unsigned_long *)0x0;
    std::
    vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
    ::~vector(&vStack_e0);
    if (piStack_f8 != (int *)0x0) {
      operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
    if (auStack_1c8 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_1c8,auStack_1b8._0_8_ - (long)auStack_1c8);
    }
    if ((tuple<int_*,_std::default_delete<int[]>_>)
        qStack_178.linear_elements._M_t.
        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0) {
      operator_delete__((void *)qStack_178.linear_elements._M_t.
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl);
    }
    qStack_178.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
    _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
         (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
    if ((_Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
         )qStack_178.obj != (quad *)0x0) {
      operator_delete__(qStack_178.obj);
    }
    qStack_178.obj = (objective_function *)0x0;
    if ((_Head_base<0UL,_float_*,_false>)auStack_188._8_8_ != (_Head_base<0UL,_float_*,_false>)0x0)
    {
      operator_delete__((void *)auStack_188._8_8_);
    }
LAB_0057168b:
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)auStack_1a0);
    return __return_storage_ptr__;
  }
  if (poVar10 == poVar11) {
    if (bVar5 == false) {
      if (!is_optimization) {
        prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
                            (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
        return prVar27;
      }
      auVar92 = ZEXT1664((undefined1  [16])0x0);
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->variable_name).
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      *(undefined1 (*) [64])
       &(__return_storage_ptr__->affected_vars).values.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = auVar57;
      auVar57 = vmovdqu64_avx512f(auVar92);
      __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
      (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
      (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
      (__return_storage_ptr__->affected_vars).names =
           (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            )auVar57._32_24_;
      (__return_storage_ptr__->affected_vars).values.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)auVar57._56_8_;
      __return_storage_ptr__->remaining_constraints = 0x7fffffff;
      __return_storage_ptr__->annoying_variable = 0;
      __return_storage_ptr__->status = uninitialized;
      if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
      }
      make_merged_constraints
                ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)(auStack_1a0 + 0x10),ctx,pb);
      if ((auStack_1a0._16_8_ == auStack_188._0_8_) ||
         ((pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (pb->vars).values.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        __return_storage_ptr__->status = success;
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,1);
        (__return_storage_ptr__->solutions).
        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
        (__return_storage_ptr__->strings).
        super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__return_storage_ptr__->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(pb->strings).
                    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
        std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                  (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
        goto LAB_00589806;
      }
      uVar29 = std::chrono::_V2::system_clock::now();
      uVar42 = (ulong)(ctx->parameters).seed;
      if (uVar42 != 0) {
        uVar29 = uVar42;
      }
      rStack_1c0._M_x = uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0);
      iVar26 = (int)((ulong)((long)(pb->vars).values.
                                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pb->vars).values.
                                  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
      uStack_200 = (context *)CONCAT44(iVar26,(uint)uStack_200);
      default_cost_type<double>::default_cost_type
                ((default_cost_type<double> *)(auStack_188 + 0x10),&pb->objective,iVar26);
      auStack_1a0._8_8_ = (pb->objective).value;
      uVar35 = (ctx->parameters).thread;
      auStack_1a0._0_8_ = pb;
      if ((int)uVar35 < 1) {
        uVar35 = std::thread::hardware_concurrency();
      }
      dStack_1a8 = 0.0;
      uVar37 = uVar35 + (uVar35 == 0);
      uVar29 = (ulong)uVar37;
      auStack_1b8 = (undefined1  [16])0x0;
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                (&vStack_150,uVar29,(allocator_type *)auStack_138);
      tStack_1f8.tv_sec = (__time_t)__return_storage_ptr__;
      best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
      ::best_solution_recorder
                ((best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
                  *)auStack_138,(random_engine *)(auStack_1c8 + 8),uVar37,
                 (default_cost_type<double> *)(auStack_188 + 0x10),(double)auStack_1a0._8_8_,
                 uStack_200._4_4_,
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)(auStack_1a0 + 0x10),(ctx->parameters).init_population_size);
      prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
      tStack_1f8.tv_nsec = (long)ctx;
      memset(prVar30,0,uVar29 * 8);
      tStack_1e8.tv_sec = 0;
      tStack_1e8.tv_nsec = -1;
      rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                         ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          (auStack_1c8 + 8),(param_type *)&tStack_1e8);
      *prVar30 = rVar31;
      if (1 < uVar35) {
        uVar42 = 1;
        do {
          rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
          prVar30[uVar42] = rVar31;
          uVar32 = uVar42 - 1;
          if (uVar32 != 0) {
            do {
              iVar26 = (int)uVar32;
              if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
                rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                   ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                    (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                     *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
                prVar30[uVar32 & 0xffffffff] = rVar31;
                iVar26 = (int)uVar42;
              }
              uVar32 = (ulong)(iVar26 - 1U);
            } while (iVar26 - 1U != 0);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar29);
      }
      lVar41 = tStack_1f8.tv_nsec;
      uVar35 = 0;
      uStack_200._0_4_ = (uint)(uint3)uStack_200;
      LOCK();
      UNLOCK();
      tStack_1e8.tv_sec = tStack_1e8.tv_sec & 0xffffffff00000000;
      pvVar3 = (variables *)(auStack_1a0._0_8_ + 0x90);
      do {
        std::
        vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>>>
        ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                  ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>>>
                    *)auStack_1b8,(context *)lVar41,(uint *)&tStack_1e8,prVar30 + uVar35);
        uVar35 = (int)tStack_1e8.tv_sec + 1;
        tStack_1e8.tv_sec = CONCAT44(tStack_1e8.tv_sec._4_4_,uVar35);
      } while (uVar35 != uVar37);
      lVar41 = 0;
      lVar40 = 0;
      qStack_178.quadratic_elements._M_t.
      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl
           = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
              )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
                )pvVar3;
      do {
        rStack_1d0._M_data = (atomic<bool> *)((long)&uStack_200 + 3);
        rStack_1d8._M_data =
             (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
              *)auStack_138;
        rStack_158._M_data =
             (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              *)(auStack_1a0 + 0x10);
        auStack_1c8 = (undefined1  [8])(auStack_1b8._0_8_ + lVar41);
        qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl =
             (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)(auStack_188 + 0x10);
        std::thread::
        thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<double>,double,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<double>const>,double&,void>
                  ((thread *)&tStack_1e8,
                   (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>_>
                    *)auStack_1c8,&rStack_1d0,
                   (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>_>
                    *)&rStack_1d8,&rStack_158,(int *)((long)&uStack_200 + 4),
                   (reference_wrapper<const_baryonyx::itm::default_cost_type<double>_> *)
                   &qStack_178.indices,(double *)(auStack_1a0 + 8));
        if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start[lVar40]._M_id._M_thread != 0) {
          std::terminate();
        }
        lVar41 = lVar41 + 0xc0;
        vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[lVar40]._M_id._M_thread = tStack_1e8.tv_sec;
        lVar40 = lVar40 + 1;
      } while (uVar37 != (uint)lVar40);
      lVar41 = std::chrono::_V2::steady_clock::now();
      auVar57 = vpbroadcastq_avx512f();
      auStack_78 = vmovdqu64_avx512f(auVar57);
      psVar2 = (solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138);
      do {
        tStack_1e8.tv_sec = 1;
        tStack_1e8.tv_nsec = 0;
        do {
          ptVar39 = &tStack_1e8;
          iVar26 = nanosleep(&tStack_1e8,&tStack_1e8);
          if (iVar26 != -1) break;
          piVar33 = __errno_location();
        } while (*piVar33 == 4);
        if ((((solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138))->super__Function_base)._M_manager
            != (_Manager_type)0x0) {
          auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar92 = vmovdqu64_avx512f(auStack_78);
          auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
          auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
          auVar93 = ZEXT1664((undefined1  [16])0x0);
          uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
          do {
            vpmullq_avx512dq(auVar57,auVar58);
            uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
            auVar60 = vmovdqa64_avx512f(auVar93);
            auVar57 = vpaddq_avx512f(auVar57,auVar59);
            uVar42 = uVar42 - 8;
            auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                          ((long)&ptVar39[0xb].tv_sec + auStack_1b8._0_8_));
            auVar75._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
            auVar75._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
            auVar75._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
            auVar75._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
            auVar75._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
            auVar75._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
            auVar75._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
            auVar75._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
            auVar93 = vpaddq_avx512f(auVar75,auVar60);
          } while (uVar42 != 0);
          auVar57 = vmovdqa64_avx512f(auVar93);
          bVar5 = (bool)((byte)uVar32 & 1);
          auVar76._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
          bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar76._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
          bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar76._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
          bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar76._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
          bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar76._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
          bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar76._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
          bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar76._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
          auVar76._56_8_ =
               (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
          auVar44 = vextracti64x4_avx512f(auVar76,1);
          auVar57 = vpaddq_avx512f(auVar76,ZEXT3264(auVar44));
          auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
          auVar13 = vpshufd_avx(auVar12,0xee);
          auVar12 = vpaddq_avx(auVar12,auVar13);
          storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>::get_best
                    ((storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>
                      *)(auStack_138 + 8),(int *)&rStack_1d8,(double *)auStack_1c8,
                     (double *)&rStack_1d0,&tStack_1e8.tv_sec);
          std::function<void_(int,_double,_long,_double,_long)>::operator()
                    (psVar2,(int)rStack_1d8._M_data,(double)auStack_1c8,tStack_1e8.tv_sec,
                     (double)rStack_1d0._M_data,auVar12._0_8_);
        }
        lVar43 = std::chrono::_V2::steady_clock::now();
        uVar25 = auStack_1a0._0_8_;
        lVar40 = tStack_1f8.tv_nsec;
        dVar4 = ((solver_parameters *)tStack_1f8.tv_nsec)->time_limit;
      } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar41) / 1000000000.0 <= dVar4));
      LOCK();
      uStack_200._0_4_ = CONCAT13(1,(uint3)uStack_200);
      UNLOCK();
      prVar27 = (result *)tStack_1f8.tv_sec;
      for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                     _M_impl.super__Vector_impl_data._M_start; tStack_1f8.tv_sec = (__time_t)prVar27
          , ptVar36 !=
            vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
        std::thread::join();
        prVar27 = (result *)tStack_1f8.tv_sec;
      }
      (prVar27->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (((string_buffer_ptr *)uVar25)->
               super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(prVar27->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(((string_buffer_ptr *)uVar25)->
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&(prVar27->affected_vars).names,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)(uVar25 + 0xc0));
      std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                (&(prVar27->affected_vars).values,&((affected_variables *)(uVar25 + 0xc0))->values);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&prVar27->variable_name,
                  (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)qStack_178.quadratic_elements._M_t.
                     super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     .
                     super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                     ._M_head_impl);
      prVar27->variables = uStack_200._4_4_;
      prVar27->constraints =
           (int)((ulong)(auStack_188._0_8_ - auStack_1a0._16_8_) >> 3) * -0x33333333;
      iVar26 = *piStack_f8;
      iVar8 = vStack_e0.
              super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
      prVar34 = (raw_result<baryonyx::itm::minimize_tag> *)
                (vStack_e0.
                 super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar26);
      prVar27->status = (uint)(iVar8 != 0) * 3;
      prVar27->duration =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
      prVar27->loop =
           vStack_e0.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
      prVar27->remaining_constraints = iVar8;
      sVar9 = ((solver_parameters *)lVar40)->storage;
      if (sVar9 == one) {
        pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                 (tStack_1f8.tv_sec + 0x68);
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1);
        psVar38 = (pvVar1->
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                  _M_impl.super__Vector_impl_data._M_start;
LAB_00589703:
        convert<baryonyx::itm::minimize_tag>(prVar34,psVar38,uStack_200._4_4_);
      }
      else {
        if (sVar9 == bound) {
          pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                   (tStack_1f8.tv_sec + 0x68);
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
          convert<baryonyx::itm::minimize_tag>
                    (prVar34,(pvVar1->
                             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                             )._M_impl.super__Vector_impl_data._M_start,uStack_200._4_4_);
          prVar34 = storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>::
                    get_worst((storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>
                               *)(auStack_138 + 8));
          psVar38 = (pvVar1->
                    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                    _M_impl.super__Vector_impl_data._M_start + 1;
          goto LAB_00589703;
        }
        if (sVar9 == five) {
          pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                   (tStack_1f8.tv_sec + 0x68);
          std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,5);
          lVar40 = 0;
          lVar41 = 0;
          do {
            convert<baryonyx::itm::minimize_tag>
                      ((raw_result<baryonyx::itm::minimize_tag> *)
                       (vStack_e0.
                        super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41]),
                       (solution *)
                       ((long)&(((pvVar1->
                                 super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->variables).
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                       + lVar40),uStack_200._4_4_);
            lVar41 = lVar41 + 1;
            lVar40 = lVar40 + 0x20;
          } while (lVar41 != 5);
        }
      }
      lVar41 = tStack_1f8.tv_nsec;
      storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>::
      show_population((storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>
                       *)(auStack_138 + 8),(context *)tStack_1f8.tv_nsec);
      if ((((solver_finished_cb *)(lVar41 + 0x158))->super__Function_base)._M_manager !=
          (_Manager_type)0x0) {
        (*((solver_finished_cb *)(tStack_1f8.tv_nsec + 0x158))->_M_invoker)
                  ((_Any_data *)(tStack_1f8.tv_nsec + 0x158),(result *)tStack_1f8.tv_sec);
      }
      operator_delete__(prVar30);
      if (pdStack_90 != (pointer)0x0) {
        operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
      }
      __return_storage_ptr__ = (result *)tStack_1f8.tv_sec;
      if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
          (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
        operator_delete__(_Stack_b0._M_head_impl);
      }
      _Stack_b0._M_head_impl = (unsigned_long *)0x0;
      if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
          _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
        operator_delete__(_Stack_c0._M_head_impl);
      }
      _Stack_c0._M_head_impl = (unsigned_long *)0x0;
      std::
      vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
      ::~vector((vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 *)&vStack_e0);
      if (piStack_f8 != (int *)0x0) {
        operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
      if ((void *)auStack_1b8._0_8_ != (void *)0x0) {
        operator_delete((void *)auStack_1b8._0_8_,(long)dStack_1a8 - auStack_1b8._0_8_);
      }
      if ((tuple<int_*,_std::default_delete<int[]>_>)
          qStack_178.linear_elements._M_t.
          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0)
      {
        operator_delete__((void *)qStack_178.linear_elements._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl);
      }
LAB_00589806:
      std::
      vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
      ~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)(auStack_1a0 + 0x10));
      return __return_storage_ptr__;
    }
    if (!is_optimization) {
      prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
                          (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
      return prVar27;
    }
    auVar92 = ZEXT1664((undefined1  [16])0x0);
    auVar57 = vmovdqu64_avx512f(auVar92);
    *(undefined1 (*) [64])
     &(__return_storage_ptr__->variable_name).
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = auVar57;
    auVar57 = vmovdqu64_avx512f(auVar92);
    *(undefined1 (*) [64])
     &(__return_storage_ptr__->affected_vars).values.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_finish = auVar57;
    auVar57 = vmovdqu64_avx512f(auVar92);
    __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
    (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
    (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
    (__return_storage_ptr__->affected_vars).names =
         (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          )auVar57._32_24_;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)auVar57._56_8_;
    __return_storage_ptr__->remaining_constraints = 0x7fffffff;
    __return_storage_ptr__->annoying_variable = 0;
    __return_storage_ptr__->status = uninitialized;
    if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
    }
    make_merged_constraints
              ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)(auStack_1a0 + 0x10),ctx,pb);
    if ((auStack_1a0._16_8_ == auStack_188._0_8_) ||
       ((pb->vars).values.
        super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pb->vars).values.
        super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      __return_storage_ptr__->status = success;
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                (&__return_storage_ptr__->solutions,1);
      (__return_storage_ptr__->solutions).
      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
      (__return_storage_ptr__->strings).
      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(__return_storage_ptr__->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(pb->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
      std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
      goto LAB_005889e3;
    }
    uVar29 = std::chrono::_V2::system_clock::now();
    uVar42 = (ulong)(ctx->parameters).seed;
    if (uVar42 != 0) {
      uVar29 = uVar42;
    }
    rStack_1c0._M_x = uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0);
    iVar26 = (int)((ulong)((long)(pb->vars).values.
                                 super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pb->vars).values.
                                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    uStack_200 = (context *)CONCAT44(iVar26,(uint)uStack_200);
    default_cost_type<double>::default_cost_type
              ((default_cost_type<double> *)(auStack_188 + 0x10),&pb->objective,iVar26);
    auStack_1a0._8_8_ = (pb->objective).value;
    uVar35 = (ctx->parameters).thread;
    auStack_1a0._0_8_ = pb;
    if ((int)uVar35 < 1) {
      uVar35 = std::thread::hardware_concurrency();
    }
    dStack_1a8 = 0.0;
    uVar37 = uVar35 + (uVar35 == 0);
    uVar29 = (ulong)uVar37;
    auStack_1b8 = (undefined1  [16])0x0;
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              (&vStack_150,uVar29,(allocator_type *)auStack_138);
    tStack_1f8.tv_sec = (__time_t)__return_storage_ptr__;
    best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
    ::best_solution_recorder
              ((best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
                *)auStack_138,(random_engine *)(auStack_1c8 + 8),uVar37,
               (default_cost_type<double> *)(auStack_188 + 0x10),(double)auStack_1a0._8_8_,
               uStack_200._4_4_,
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)(auStack_1a0 + 0x10),(ctx->parameters).init_population_size);
    prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
    tStack_1f8.tv_nsec = (long)ctx;
    memset(prVar30,0,uVar29 * 8);
    tStack_1e8.tv_sec = 0;
    tStack_1e8.tv_nsec = -1;
    rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                       ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                        (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                        (auStack_1c8 + 8),(param_type *)&tStack_1e8);
    *prVar30 = rVar31;
    if (1 < uVar35) {
      uVar42 = 1;
      do {
        rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                            (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *
                            )(auStack_1c8 + 8),(param_type *)&tStack_1e8);
        prVar30[uVar42] = rVar31;
        uVar32 = uVar42 - 1;
        if (uVar32 != 0) {
          do {
            iVar26 = (int)uVar32;
            if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
              rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                 ((uniform_int_distribution<unsigned_long> *)&tStack_1e8,
                                  (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                   *)(auStack_1c8 + 8),(param_type *)&tStack_1e8);
              prVar30[uVar32 & 0xffffffff] = rVar31;
              iVar26 = (int)uVar42;
            }
            uVar32 = (ulong)(iVar26 - 1U);
          } while (iVar26 - 1U != 0);
        }
        uVar42 = uVar42 + 1;
      } while (uVar42 != uVar29);
    }
    lVar41 = tStack_1f8.tv_nsec;
    uVar35 = 0;
    uStack_200._0_4_ = (uint)(uint3)uStack_200;
    LOCK();
    UNLOCK();
    tStack_1e8.tv_sec = tStack_1e8.tv_sec & 0xffffffff00000000;
    pvVar3 = (variables *)(auStack_1a0._0_8_ + 0x90);
    do {
      std::
      vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>>>
      ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>>>
                  *)auStack_1b8,(context *)lVar41,(uint *)&tStack_1e8,prVar30 + uVar35);
      uVar35 = (int)tStack_1e8.tv_sec + 1;
      tStack_1e8.tv_sec = CONCAT44(tStack_1e8.tv_sec._4_4_,uVar35);
    } while (uVar35 != uVar37);
    lVar41 = 0;
    lVar40 = 0;
    qStack_178.quadratic_elements._M_t.
    super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
    .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl =
         (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
          )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
            )pvVar3;
    do {
      rStack_1d0._M_data = (atomic<bool> *)((long)&uStack_200 + 3);
      rStack_1d8._M_data =
           (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
            *)auStack_138;
      rStack_158._M_data =
           (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *)(auStack_1a0 + 0x10);
      auStack_1c8 = (undefined1  [8])(auStack_1b8._0_8_ + lVar41);
      qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)(auStack_188 + 0x10);
      std::thread::
      thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<double>,double,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<double>const>,double&,void>
                ((thread *)&tStack_1e8,
                 (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>_>
                  *)auStack_1c8,&rStack_1d0,
                 (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>_>
                  *)&rStack_1d8,&rStack_158,(int *)((long)&uStack_200 + 4),
                 (reference_wrapper<const_baryonyx::itm::default_cost_type<double>_> *)
                 &qStack_178.indices,(double *)(auStack_1a0 + 8));
      if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar40]._M_id._M_thread != 0) {
        std::terminate();
      }
      lVar41 = lVar41 + 0xc0;
      vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[lVar40]._M_id._M_thread = tStack_1e8.tv_sec;
      lVar40 = lVar40 + 1;
    } while (uVar37 != (uint)lVar40);
    lVar41 = std::chrono::_V2::steady_clock::now();
    auVar57 = vpbroadcastq_avx512f();
    auStack_78 = vmovdqu64_avx512f(auVar57);
    psVar2 = (solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138);
    do {
      tStack_1e8.tv_sec = 1;
      tStack_1e8.tv_nsec = 0;
      do {
        ptVar39 = &tStack_1e8;
        iVar26 = nanosleep(&tStack_1e8,&tStack_1e8);
        if (iVar26 != -1) break;
        piVar33 = __errno_location();
      } while (*piVar33 == 4);
      if ((((solver_updated_cb *)(tStack_1f8.tv_nsec + 0x138))->super__Function_base)._M_manager !=
          (_Manager_type)0x0) {
        auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar92 = vmovdqu64_avx512f(auStack_78);
        auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
        auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
        auVar93 = ZEXT1664((undefined1  [16])0x0);
        uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
        do {
          vpmullq_avx512dq(auVar57,auVar58);
          uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
          auVar60 = vmovdqa64_avx512f(auVar93);
          auVar57 = vpaddq_avx512f(auVar57,auVar59);
          uVar42 = uVar42 - 8;
          auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                        ((long)&ptVar39[0xb].tv_sec + auStack_1b8._0_8_));
          auVar73._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
          auVar73._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
          auVar73._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
          auVar73._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
          auVar73._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
          auVar73._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
          auVar73._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
          auVar73._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
          auVar93 = vpaddq_avx512f(auVar73,auVar60);
        } while (uVar42 != 0);
        auVar57 = vmovdqa64_avx512f(auVar93);
        bVar5 = (bool)((byte)uVar32 & 1);
        auVar74._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
        bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar74._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
        bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar74._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
        bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar74._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
        bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar74._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
        bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar74._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
        bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar74._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
        auVar74._56_8_ =
             (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
        auVar44 = vextracti64x4_avx512f(auVar74,1);
        auVar57 = vpaddq_avx512f(auVar74,ZEXT3264(auVar44));
        auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
        auVar13 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpaddq_avx(auVar12,auVar13);
        storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>::get_best
                  ((storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag> *
                   )(auStack_138 + 8),(int *)&rStack_1d8,(double *)auStack_1c8,(double *)&rStack_1d0
                   ,&tStack_1e8.tv_sec);
        std::function<void_(int,_double,_long,_double,_long)>::operator()
                  (psVar2,(int)rStack_1d8._M_data,(double)auStack_1c8,tStack_1e8.tv_sec,
                   (double)rStack_1d0._M_data,auVar12._0_8_);
      }
      lVar43 = std::chrono::_V2::steady_clock::now();
      uVar25 = auStack_1a0._0_8_;
      lVar40 = tStack_1f8.tv_nsec;
      dVar4 = ((solver_parameters *)tStack_1f8.tv_nsec)->time_limit;
    } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar41) / 1000000000.0 <= dVar4));
    LOCK();
    uStack_200._0_4_ = CONCAT13(1,(uint3)uStack_200);
    UNLOCK();
    prVar27 = (result *)tStack_1f8.tv_sec;
    for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_start; tStack_1f8.tv_sec = (__time_t)prVar27,
        ptVar36 !=
        vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
      std::thread::join();
      prVar27 = (result *)tStack_1f8.tv_sec;
    }
    (prVar27->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (((string_buffer_ptr *)uVar25)->
             super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(prVar27->strings).
                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(((string_buffer_ptr *)uVar25)->
                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
              );
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&(prVar27->affected_vars).names,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)(uVar25 + 0xc0));
    std::vector<signed_char,_std::allocator<signed_char>_>::operator=
              (&(prVar27->affected_vars).values,&((affected_variables *)(uVar25 + 0xc0))->values);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&prVar27->variable_name,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)qStack_178.quadratic_elements._M_t.
                   super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                   .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                   ._M_head_impl);
    prVar27->variables = uStack_200._4_4_;
    prVar27->constraints = (int)((ulong)(auStack_188._0_8_ - auStack_1a0._16_8_) >> 3) * -0x33333333
    ;
    iVar26 = *piStack_f8;
    iVar8 = vStack_e0.
            super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
    prVar34 = (raw_result<baryonyx::itm::minimize_tag> *)
              (vStack_e0.
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar26);
    prVar27->status = (uint)(iVar8 != 0) * 3;
    prVar27->duration =
         vStack_e0.
         super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
    prVar27->loop =
         vStack_e0.
         super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
    prVar27->remaining_constraints = iVar8;
    sVar9 = ((solver_parameters *)lVar40)->storage;
    if (sVar9 == one) {
      pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
               (tStack_1f8.tv_sec + 0x68);
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1);
      psVar38 = (pvVar1->super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                )._M_impl.super__Vector_impl_data._M_start;
LAB_005888e0:
      convert<baryonyx::itm::minimize_tag>(prVar34,psVar38,uStack_200._4_4_);
    }
    else {
      if (sVar9 == bound) {
        pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                 (tStack_1f8.tv_sec + 0x68);
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
        convert<baryonyx::itm::minimize_tag>
                  (prVar34,(pvVar1->
                           super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                           )._M_impl.super__Vector_impl_data._M_start,uStack_200._4_4_);
        prVar34 = storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>::
                  get_worst((storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>
                             *)(auStack_138 + 8));
        psVar38 = (pvVar1->
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                  _M_impl.super__Vector_impl_data._M_start + 1;
        goto LAB_005888e0;
      }
      if (sVar9 == five) {
        pvVar1 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                 (tStack_1f8.tv_sec + 0x68);
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,5);
        lVar40 = 0;
        lVar41 = 0;
        do {
          convert<baryonyx::itm::minimize_tag>
                    ((raw_result<baryonyx::itm::minimize_tag> *)
                     (vStack_e0.
                      super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41]),
                     (solution *)
                     ((long)&(((pvVar1->
                               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                               )._M_impl.super__Vector_impl_data._M_start)->variables).
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl +
                     lVar40),uStack_200._4_4_);
          lVar41 = lVar41 + 1;
          lVar40 = lVar40 + 0x20;
        } while (lVar41 != 5);
      }
    }
    lVar41 = tStack_1f8.tv_nsec;
    storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>::show_population
              ((storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag> *)
               (auStack_138 + 8),(context *)tStack_1f8.tv_nsec);
    if ((((solver_finished_cb *)(lVar41 + 0x158))->super__Function_base)._M_manager !=
        (_Manager_type)0x0) {
      (*((solver_finished_cb *)(tStack_1f8.tv_nsec + 0x158))->_M_invoker)
                ((_Any_data *)(tStack_1f8.tv_nsec + 0x158),(result *)tStack_1f8.tv_sec);
    }
    operator_delete__(prVar30);
    if (pdStack_90 != (pointer)0x0) {
      operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
    }
    __return_storage_ptr__ = (result *)tStack_1f8.tv_sec;
    if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
        (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
      operator_delete__(_Stack_b0._M_head_impl);
    }
    _Stack_b0._M_head_impl = (unsigned_long *)0x0;
    if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
        _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
      operator_delete__(_Stack_c0._M_head_impl);
    }
    _Stack_c0._M_head_impl = (unsigned_long *)0x0;
    std::
    vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
    ::~vector((vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
               *)&vStack_e0);
    if (piStack_f8 != (int *)0x0) {
      operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
    if ((void *)auStack_1b8._0_8_ != (void *)0x0) {
      operator_delete((void *)auStack_1b8._0_8_,(long)dStack_1a8 - auStack_1b8._0_8_);
    }
    if ((tuple<int_*,_std::default_delete<int[]>_>)
        qStack_178.linear_elements._M_t.
        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0) {
      operator_delete__((void *)qStack_178.linear_elements._M_t.
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl);
    }
LAB_005889e3:
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)(auStack_1a0 + 0x10));
    return __return_storage_ptr__;
  }
  if (bVar5 == false) {
    if (!is_optimization) {
      prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
                          (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
      return prVar27;
    }
    auVar92 = ZEXT1664((undefined1  [16])0x0);
    auVar57 = vmovdqu64_avx512f(auVar92);
    *(undefined1 (*) [64])
     &(__return_storage_ptr__->variable_name).
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = auVar57;
    auVar57 = vmovdqu64_avx512f(auVar92);
    *(undefined1 (*) [64])
     &(__return_storage_ptr__->affected_vars).values.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_finish = auVar57;
    auVar57 = vmovdqu64_avx512f(auVar92);
    __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
    (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
    (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
    (__return_storage_ptr__->affected_vars).names =
         (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          )auVar57._32_24_;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)auVar57._56_8_;
    __return_storage_ptr__->remaining_constraints = 0x7fffffff;
    __return_storage_ptr__->annoying_variable = 0;
    __return_storage_ptr__->status = uninitialized;
    if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
    }
    make_merged_constraints
              ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)auStack_1a0,ctx,pb);
    if ((auStack_1a0._0_8_ == auStack_1a0._8_8_) ||
       ((pb->vars).values.
        super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pb->vars).values.
        super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      __return_storage_ptr__->status = success;
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                (&__return_storage_ptr__->solutions,1);
      (__return_storage_ptr__->solutions).
      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
      (__return_storage_ptr__->strings).
      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(__return_storage_ptr__->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(pb->strings).
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
      std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
      goto LAB_005a26e0;
    }
    uVar29 = std::chrono::_V2::system_clock::now();
    uVar42 = (ulong)(ctx->parameters).seed;
    if (uVar42 != 0) {
      uVar29 = uVar42;
    }
    rStack_1d0._M_data = (atomic<bool> *)(uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0));
    uVar35 = (int)((ulong)((long)(pb->vars).values.
                                 super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pb->vars).values.
                                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    lVar41 = (ulong)uVar35 << 0x20;
    quadratic_cost_type<double>::quadratic_cost_type
              ((quadratic_cost_type<double> *)auStack_188,&pb->objective,uVar35);
    dStack_1a8 = (pb->objective).value;
    uVar35 = (ctx->parameters).thread;
    if ((int)uVar35 < 1) {
      uVar35 = std::thread::hardware_concurrency();
    }
    auVar21._8_8_ = 0;
    auVar21._0_8_ = auStack_1b8._8_8_;
    auStack_1b8 = auVar21 << 0x40;
    uVar37 = uVar35 + (uVar35 == 0);
    uVar29 = (ulong)uVar37;
    _auStack_1c8 = (undefined1  [16])0x0;
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              (&vStack_150,uVar29,(allocator_type *)auStack_138);
    best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
    ::best_solution_recorder
              ((best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
                *)auStack_138,(random_engine *)&rStack_1d0,uVar37,
               (quadratic_cost_type<double> *)auStack_188,dStack_1a8,(int)((ulong)lVar41 >> 0x20),
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)auStack_1a0,(ctx->parameters).init_population_size);
    prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
    uStack_200 = ctx;
    memset(prVar30,0,uVar29 * 8);
    tStack_1f8.tv_sec = 0;
    tStack_1f8.tv_nsec = -1;
    rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                       ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                        (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                        &rStack_1d0,(param_type *)&tStack_1f8);
    uVar94 = (uint)((ulong)lVar41 >> 0x20);
    *prVar30 = rVar31;
    if (1 < uVar35) {
      uVar42 = 1;
      do {
        rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                            (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *
                            )&rStack_1d0,(param_type *)&tStack_1f8);
        prVar30[uVar42] = rVar31;
        uVar32 = uVar42 - 1;
        if (uVar32 != 0) {
          do {
            iVar26 = (int)uVar32;
            if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
              rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                                 ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                  (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                   *)&rStack_1d0,(param_type *)&tStack_1f8);
              prVar30[uVar32 & 0xffffffff] = rVar31;
              iVar26 = (int)uVar42;
            }
            uVar32 = (ulong)(iVar26 - 1U);
          } while (iVar26 - 1U != 0);
        }
        uVar94 = (uint)((ulong)lVar41 >> 0x20);
        uVar42 = uVar42 + 1;
      } while (uVar42 != uVar29);
    }
    pcVar24 = uStack_200;
    uVar35 = 0;
    LOCK();
    lVar41 = (ulong)uVar94 << 0x20;
    UNLOCK();
    tStack_1f8.tv_sec = tStack_1f8.tv_sec & 0xffffffff00000000;
    pvVar3 = (variables *)(auStack_1b8._8_8_ + 0x90);
    do {
      std::
      vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>>>
      ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>>>
                  *)auStack_1c8,pcVar24,(uint *)&tStack_1f8,prVar30 + uVar35);
      uVar35 = (int)tStack_1f8.tv_sec + 1;
      tStack_1f8.tv_sec = CONCAT44(tStack_1f8.tv_sec._4_4_,uVar35);
    } while (uVar35 != uVar37);
    lVar40 = 0;
    lVar43 = 0;
    qStack_178.quadratic_elements._M_t.
    super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
    .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl =
         (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
          )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
            )pvVar3;
    do {
      tStack_1e8.tv_nsec = (long)&stack0xfffffffffffffdf3;
      tStack_1e8.tv_sec = (__time_t)auStack_138;
      rStack_158._M_data =
           (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *)auStack_1a0;
      rStack_1d8._M_data =
           (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
            *)((long)(context **)auStack_1c8 + lVar40);
      qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)auStack_188;
      std::thread::
      thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,double,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::quadratic_cost_type<double>const>,double&,void>
                ((thread *)&tStack_1f8,
                 (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>_>
                  *)&rStack_1d8,(reference_wrapper<std::atomic<bool>_> *)&tStack_1e8.tv_nsec,
                 (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>_>
                  *)&tStack_1e8,&rStack_158,(int *)&stack0xfffffffffffffdf4,
                 (reference_wrapper<const_baryonyx::itm::quadratic_cost_type<double>_> *)
                 &qStack_178.indices,&dStack_1a8);
      if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar43]._M_id._M_thread != 0) {
        std::terminate();
      }
      lVar40 = lVar40 + 0xc0;
      vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[lVar43]._M_id._M_thread = tStack_1f8.tv_sec;
      lVar43 = lVar43 + 1;
    } while (uVar37 != (uint)lVar43);
    lVar40 = std::chrono::_V2::steady_clock::now();
    auVar57 = vpbroadcastq_avx512f();
    auStack_78 = vmovdqu64_avx512f(auVar57);
    psVar2 = &uStack_200->update;
    do {
      tStack_1f8.tv_sec = 1;
      tStack_1f8.tv_nsec = 0;
      do {
        ptVar39 = &tStack_1f8;
        iVar26 = nanosleep(&tStack_1f8,&tStack_1f8);
        if (iVar26 != -1) break;
        piVar33 = __errno_location();
      } while (*piVar33 == 4);
      if ((uStack_200->update).super__Function_base._M_manager != (_Manager_type)0x0) {
        auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar92 = vmovdqu64_avx512f(auStack_78);
        auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
        auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
        auVar93 = ZEXT1664((undefined1  [16])0x0);
        uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
        do {
          vpmullq_avx512dq(auVar57,auVar58);
          uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
          auVar60 = vmovdqa64_avx512f(auVar93);
          auVar57 = vpaddq_avx512f(auVar57,auVar59);
          uVar42 = uVar42 - 8;
          auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                        ((long)((long)auStack_1c8 + 0xb0) + (long)ptVar39));
          auVar79._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
          auVar79._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
          auVar79._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
          auVar79._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
          auVar79._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
          auVar79._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
          auVar79._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
          auVar79._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
          auVar93 = vpaddq_avx512f(auVar79,auVar60);
        } while (uVar42 != 0);
        auVar57 = vmovdqa64_avx512f(auVar93);
        bVar5 = (bool)((byte)uVar32 & 1);
        auVar80._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
        bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar80._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
        bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar80._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
        bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar80._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
        bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar80._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
        bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar80._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
        bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar80._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
        auVar80._56_8_ =
             (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
        auVar44 = vextracti64x4_avx512f(auVar80,1);
        auVar57 = vpaddq_avx512f(auVar80,ZEXT3264(auVar44));
        auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
        auVar13 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpaddq_avx(auVar12,auVar13);
        storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>::get_best
                  ((storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>
                    *)(auStack_138 + 8),(int *)&tStack_1e8,(double *)&rStack_1d8,
                   (double *)&tStack_1e8.tv_nsec,&tStack_1f8.tv_sec);
        std::function<void_(int,_double,_long,_double,_long)>::operator()
                  (psVar2,(int)tStack_1e8.tv_sec,(double)rStack_1d8._M_data,tStack_1f8.tv_sec,
                   (double)tStack_1e8.tv_nsec,auVar12._0_8_);
      }
      lVar43 = std::chrono::_V2::steady_clock::now();
      pcVar24 = uStack_200;
      dVar4 = (uStack_200->parameters).time_limit;
    } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar40) / 1000000000.0 <= dVar4));
    LOCK();
    iVar95 = (index)((ulong)lVar41 >> 0x20);
    UNLOCK();
    uVar25 = auStack_1b8._8_8_;
    for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ptVar36 !=
        vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
      std::thread::join();
    }
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)uVar25;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__return_storage_ptr__->strings).
                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + 8));
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&(__return_storage_ptr__->affected_vars).names,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)(uVar25 + 0xc0));
    std::vector<signed_char,_std::allocator<signed_char>_>::operator=
              (&(__return_storage_ptr__->affected_vars).values,
               (vector<signed_char,_std::allocator<signed_char>_> *)(uVar25 + 0xd8));
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&__return_storage_ptr__->variable_name,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)qStack_178.quadratic_elements._M_t.
                   super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                   .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                   ._M_head_impl);
    __return_storage_ptr__->variables = iVar95;
    __return_storage_ptr__->constraints =
         (int)((ulong)(auStack_1a0._8_8_ - auStack_1a0._0_8_) >> 3) * -0x33333333;
    iVar26 = *piStack_f8;
    iVar8 = vStack_e0.
            super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
    prVar34 = (raw_result<baryonyx::itm::minimize_tag> *)
              (vStack_e0.
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar26);
    __return_storage_ptr__->status = (uint)(iVar8 != 0) * 3;
    __return_storage_ptr__->duration =
         vStack_e0.
         super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
    __return_storage_ptr__->loop =
         vStack_e0.
         super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
    __return_storage_ptr__->remaining_constraints = iVar8;
    sVar9 = (pcVar24->parameters).storage;
    if (sVar9 == one) {
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                (&__return_storage_ptr__->solutions,1);
      psVar38 = (__return_storage_ptr__->solutions).
                super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
                super__Vector_impl_data._M_start;
LAB_005a25a1:
      convert<baryonyx::itm::minimize_tag>(prVar34,psVar38,iVar95);
    }
    else {
      if (sVar9 == bound) {
        pvVar1 = &__return_storage_ptr__->solutions;
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
        convert<baryonyx::itm::minimize_tag>
                  (prVar34,(pvVar1->
                           super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                           )._M_impl.super__Vector_impl_data._M_start,iVar95);
        prVar34 = storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>::
                  get_worst((storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>
                             *)(auStack_138 + 8));
        psVar38 = (pvVar1->
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
                  _M_impl.super__Vector_impl_data._M_start + 1;
        goto LAB_005a25a1;
      }
      if (sVar9 == five) {
        std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                  (&__return_storage_ptr__->solutions,5);
        lVar40 = 0;
        lVar41 = 0;
        do {
          convert<baryonyx::itm::minimize_tag>
                    ((raw_result<baryonyx::itm::minimize_tag> *)
                     (vStack_e0.
                      super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41]),
                     (solution *)
                     ((long)&(((__return_storage_ptr__->solutions).
                               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                               ._M_impl.super__Vector_impl_data._M_start)->variables).
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl +
                     lVar40),iVar95);
          lVar41 = lVar41 + 1;
          lVar40 = lVar40 + 0x20;
        } while (lVar41 != 5);
      }
    }
    pcVar24 = uStack_200;
    storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>::
    show_population((storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>
                     *)(auStack_138 + 8),uStack_200);
    if ((pcVar24->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(uStack_200->finish)._M_invoker)((_Any_data *)&uStack_200->finish,__return_storage_ptr__);
    }
    operator_delete__(prVar30);
    if (pdStack_90 != (pointer)0x0) {
      operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
    }
    if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
        (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
      operator_delete__(_Stack_b0._M_head_impl);
    }
    _Stack_b0._M_head_impl = (unsigned_long *)0x0;
    if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
        _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
      operator_delete__(_Stack_c0._M_head_impl);
    }
    _Stack_c0._M_head_impl = (unsigned_long *)0x0;
    std::
    vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
    ::~vector((vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
               *)&vStack_e0);
    if (piStack_f8 != (int *)0x0) {
      operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
    if (auStack_1c8 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_1c8,auStack_1b8._0_8_ - (long)auStack_1c8);
    }
    if ((tuple<int_*,_std::default_delete<int[]>_>)
        qStack_178.linear_elements._M_t.
        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0) {
      operator_delete__((void *)qStack_178.linear_elements._M_t.
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl);
    }
    qStack_178.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
    _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
         (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
    if ((_Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
         )qStack_178.obj != (quad *)0x0) {
      operator_delete__(qStack_178.obj);
    }
    qStack_178.obj = (objective_function *)0x0;
    if ((_Head_base<0UL,_float_*,_false>)auStack_188._8_8_ != (_Head_base<0UL,_float_*,_false>)0x0)
    {
      operator_delete__((void *)auStack_188._8_8_);
    }
LAB_005a26e0:
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)auStack_1a0);
    return __return_storage_ptr__;
  }
  if (!is_optimization) {
    prVar27 = solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
                        (__return_storage_ptr__,(itm *)ctx,(context *)pb,pb_00);
    return prVar27;
  }
  auVar92 = ZEXT1664((undefined1  [16])0x0);
  auVar57 = vmovdqu64_avx512f(auVar92);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar57;
  auVar57 = vmovdqu64_avx512f(auVar92);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = auVar57;
  auVar57 = vmovdqu64_avx512f(auVar92);
  __return_storage_ptr__->strings = (string_buffer_ptr)auVar57._0_16_;
  (__return_storage_ptr__->method)._M_len = SUB168(auVar57._16_16_,0);
  (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar57._16_16_,8);
  (__return_storage_ptr__->affected_vars).names =
       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        )auVar57._32_24_;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auVar57._56_8_;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  if ((ctx->start).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(ctx->start)._M_invoker)((_Any_data *)&ctx->start,&ctx->parameters);
  }
  make_merged_constraints
            ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              *)auStack_1a0,ctx,pb);
  if ((auStack_1a0._0_8_ == auStack_1a0._8_8_) ||
     ((pb->vars).values.
      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (pb->vars).values.
      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    __return_storage_ptr__->status = success;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].value = (pb->objective).value;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__return_storage_ptr__->strings).
                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pb->strings).
                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&(__return_storage_ptr__->affected_vars).names,&(pb->affected_vars).names);
    std::vector<signed_char,_std::allocator<signed_char>_>::operator=
              (&(__return_storage_ptr__->affected_vars).values,&(pb->affected_vars).values);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&__return_storage_ptr__->variable_name,&(pb->vars).names);
    goto LAB_005a184f;
  }
  uVar29 = std::chrono::_V2::system_clock::now();
  uVar42 = (ulong)(ctx->parameters).seed;
  if (uVar42 != 0) {
    uVar29 = uVar42;
  }
  rStack_1d0._M_data = (atomic<bool> *)(uVar29 % 0x7fffffff + (ulong)(uVar29 % 0x7fffffff == 0));
  uVar35 = (int)((ulong)((long)(pb->vars).values.
                               super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pb->vars).values.
                              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  lVar41 = (ulong)uVar35 << 0x20;
  quadratic_cost_type<double>::quadratic_cost_type
            ((quadratic_cost_type<double> *)auStack_188,&pb->objective,uVar35);
  dStack_1a8 = (pb->objective).value;
  uVar35 = (ctx->parameters).thread;
  if ((int)uVar35 < 1) {
    uVar35 = std::thread::hardware_concurrency();
  }
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auStack_1b8._8_8_;
  auStack_1b8 = auVar20 << 0x40;
  uVar37 = uVar35 + (uVar35 == 0);
  uVar29 = (ulong)uVar37;
  _auStack_1c8 = (undefined1  [16])0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&vStack_150,uVar29,(allocator_type *)auStack_138);
  best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
  ::best_solution_recorder
            ((best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
              *)auStack_138,(random_engine *)&rStack_1d0,uVar37,
             (quadratic_cost_type<double> *)auStack_188,dStack_1a8,(int)((ulong)lVar41 >> 0x20),
             (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              *)auStack_1a0,(ctx->parameters).init_population_size);
  prVar30 = (result_type_conflict *)operator_new__(uVar29 * 8);
  uStack_200 = ctx;
  memset(prVar30,0,uVar29 * 8);
  tStack_1f8.tv_sec = 0;
  tStack_1f8.tv_nsec = -1;
  rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                     ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                      (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                      &rStack_1d0,(param_type *)&tStack_1f8);
  uVar94 = (uint)((ulong)lVar41 >> 0x20);
  *prVar30 = rVar31;
  if (1 < uVar35) {
    uVar42 = 1;
    do {
      rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                         ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          &rStack_1d0,(param_type *)&tStack_1f8);
      prVar30[uVar42] = rVar31;
      uVar32 = uVar42 - 1;
      if (uVar32 != 0) {
        do {
          iVar26 = (int)uVar32;
          if (prVar30[uVar32 & 0xffffffff] == prVar30[uVar42]) {
            rVar31 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&tStack_1f8,
                                (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                 *)&rStack_1d0,(param_type *)&tStack_1f8);
            prVar30[uVar32 & 0xffffffff] = rVar31;
            iVar26 = (int)uVar42;
          }
          uVar32 = (ulong)(iVar26 - 1U);
        } while (iVar26 - 1U != 0);
      }
      uVar94 = (uint)((ulong)lVar41 >> 0x20);
      uVar42 = uVar42 + 1;
    } while (uVar42 != uVar29);
  }
  pcVar24 = uStack_200;
  uVar35 = 0;
  LOCK();
  lVar41 = (ulong)uVar94 << 0x20;
  UNLOCK();
  tStack_1f8.tv_sec = tStack_1f8.tv_sec & 0xffffffff00000000;
  pvVar3 = (variables *)(auStack_1b8._8_8_ + 0x90);
  do {
    std::
    vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>>>
    ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
              ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>>>
                *)auStack_1c8,pcVar24,(uint *)&tStack_1f8,prVar30 + uVar35);
    uVar35 = (int)tStack_1f8.tv_sec + 1;
    tStack_1f8.tv_sec = CONCAT44(tStack_1f8.tv_sec._4_4_,uVar35);
  } while (uVar35 != uVar37);
  lVar40 = 0;
  lVar43 = 0;
  qStack_178.quadratic_elements._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl =
       (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
        )(__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
          )pvVar3;
  do {
    tStack_1e8.tv_nsec = (long)&stack0xfffffffffffffdf3;
    tStack_1e8.tv_sec = (__time_t)auStack_138;
    rStack_158._M_data =
         (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *)auStack_1a0;
    rStack_1d8._M_data =
         (optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
          *)((long)(context **)auStack_1c8 + lVar40);
    qStack_178.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)auStack_188;
    std::thread::
    thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,double,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::quadratic_cost_type<double>const>,double&,void>
              ((thread *)&tStack_1f8,
               (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>_>
                *)&rStack_1d8,(reference_wrapper<std::atomic<bool>_> *)&tStack_1e8.tv_nsec,
               (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>_>
                *)&tStack_1e8,&rStack_158,(int *)&stack0xfffffffffffffdf4,
               (reference_wrapper<const_baryonyx::itm::quadratic_cost_type<double>_> *)
               &qStack_178.indices,&dStack_1a8);
    if (vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[lVar43]._M_id._M_thread != 0) {
      std::terminate();
    }
    lVar40 = lVar40 + 0xc0;
    vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start[lVar43]._M_id._M_thread = tStack_1f8.tv_sec;
    lVar43 = lVar43 + 1;
  } while (uVar37 != (uint)lVar43);
  lVar40 = std::chrono::_V2::steady_clock::now();
  auVar57 = vpbroadcastq_avx512f();
  auStack_78 = vmovdqu64_avx512f(auVar57);
  psVar2 = &uStack_200->update;
  do {
    tStack_1f8.tv_sec = 1;
    tStack_1f8.tv_nsec = 0;
    do {
      ptVar39 = &tStack_1f8;
      iVar26 = nanosleep(&tStack_1f8,&tStack_1f8);
      if (iVar26 != -1) break;
      piVar33 = __errno_location();
    } while (*piVar33 == 4);
    if ((uStack_200->update).super__Function_base._M_manager != (_Manager_type)0x0) {
      auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar92 = vmovdqu64_avx512f(auStack_78);
      auVar58 = vpbroadcastq_avx512f(ZEXT816(0xc0));
      auVar59 = vpbroadcastq_avx512f(ZEXT816(8));
      auVar93 = ZEXT1664((undefined1  [16])0x0);
      uVar42 = uVar29 + 7 & 0xfffffffffffffff8;
      do {
        vpmullq_avx512dq(auVar57,auVar58);
        uVar32 = vpcmpuq_avx512f(auVar57,auVar92,2);
        auVar60 = vmovdqa64_avx512f(auVar93);
        auVar57 = vpaddq_avx512f(auVar57,auVar59);
        uVar42 = uVar42 - 8;
        auVar93 = vpgatherqq_avx512f(*(undefined8 *)
                                      ((long)((long)auStack_1c8 + 0xb0) + (long)ptVar39));
        auVar77._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar93._8_8_;
        auVar77._0_8_ = (ulong)((byte)uVar32 & 1) * auVar93._0_8_;
        auVar77._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar93._16_8_;
        auVar77._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar93._24_8_;
        auVar77._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar93._32_8_;
        auVar77._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar93._40_8_;
        auVar77._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar93._48_8_;
        auVar77._56_8_ = (uVar32 >> 7) * auVar93._56_8_;
        auVar93 = vpaddq_avx512f(auVar77,auVar60);
      } while (uVar42 != 0);
      auVar57 = vmovdqa64_avx512f(auVar93);
      bVar5 = (bool)((byte)uVar32 & 1);
      auVar78._0_8_ = (ulong)bVar5 * auVar57._0_8_ | (ulong)!bVar5 * auVar60._0_8_;
      bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
      auVar78._8_8_ = (ulong)bVar5 * auVar57._8_8_ | (ulong)!bVar5 * auVar60._8_8_;
      bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
      auVar78._16_8_ = (ulong)bVar5 * auVar57._16_8_ | (ulong)!bVar5 * auVar60._16_8_;
      bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
      auVar78._24_8_ = (ulong)bVar5 * auVar57._24_8_ | (ulong)!bVar5 * auVar60._24_8_;
      bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
      auVar78._32_8_ = (ulong)bVar5 * auVar57._32_8_ | (ulong)!bVar5 * auVar60._32_8_;
      bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
      auVar78._40_8_ = (ulong)bVar5 * auVar57._40_8_ | (ulong)!bVar5 * auVar60._40_8_;
      bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
      auVar78._48_8_ = (ulong)bVar5 * auVar57._48_8_ | (ulong)!bVar5 * auVar60._48_8_;
      auVar78._56_8_ =
           (uVar32 >> 7) * auVar57._56_8_ | (ulong)!SUB81(uVar32 >> 7,0) * auVar60._56_8_;
      auVar44 = vextracti64x4_avx512f(auVar78,1);
      auVar57 = vpaddq_avx512f(auVar78,ZEXT3264(auVar44));
      auVar12 = vpaddq_avx(auVar57._0_16_,auVar57._16_16_);
      auVar13 = vpshufd_avx(auVar12,0xee);
      auVar12 = vpaddq_avx(auVar12,auVar13);
      storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>::get_best
                ((storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag> *
                 )(auStack_138 + 8),(int *)&tStack_1e8,(double *)&rStack_1d8,
                 (double *)&tStack_1e8.tv_nsec,&tStack_1f8.tv_sec);
      std::function<void_(int,_double,_long,_double,_long)>::operator()
                (psVar2,(int)tStack_1e8.tv_sec,(double)rStack_1d8._M_data,tStack_1f8.tv_sec,
                 (double)tStack_1e8.tv_nsec,auVar12._0_8_);
    }
    lVar43 = std::chrono::_V2::steady_clock::now();
    pcVar24 = uStack_200;
    dVar4 = (uStack_200->parameters).time_limit;
  } while ((dVar4 <= 0.0) || ((double)(lVar43 - lVar40) / 1000000000.0 <= dVar4));
  LOCK();
  iVar95 = (index)((ulong)lVar41 >> 0x20);
  UNLOCK();
  uVar25 = auStack_1b8._8_8_;
  for (ptVar36 = vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ptVar36 !=
      vStack_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish; ptVar36 = ptVar36 + 1) {
    std::thread::join();
  }
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)uVar25;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->strings).
              super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + 8));
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->affected_vars).names,
              (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)(uVar25 + 0xc0));
  std::vector<signed_char,_std::allocator<signed_char>_>::operator=
            (&(__return_storage_ptr__->affected_vars).values,
             (vector<signed_char,_std::allocator<signed_char>_> *)(uVar25 + 0xd8));
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=(&__return_storage_ptr__->variable_name,
              (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)qStack_178.quadratic_elements._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                 .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
                 _M_head_impl);
  __return_storage_ptr__->variables = iVar95;
  __return_storage_ptr__->constraints =
       (int)((ulong)(auStack_1a0._8_8_ - auStack_1a0._0_8_) >> 3) * -0x33333333;
  iVar26 = *piStack_f8;
  iVar8 = vStack_e0.
          super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar26].remaining_constraints;
  prVar34 = (raw_result<baryonyx::itm::minimize_tag> *)
            (vStack_e0.
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar26);
  __return_storage_ptr__->status = (uint)(iVar8 != 0) * 3;
  __return_storage_ptr__->duration =
       vStack_e0.
       super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar26].duration;
  __return_storage_ptr__->loop =
       vStack_e0.
       super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar26].loop;
  __return_storage_ptr__->remaining_constraints = iVar8;
  sVar9 = (pcVar24->parameters).storage;
  if (sVar9 == one) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    psVar38 = (__return_storage_ptr__->solutions).
              super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
              super__Vector_impl_data._M_start;
LAB_005a1710:
    convert<baryonyx::itm::minimize_tag>(prVar34,psVar38,iVar95);
  }
  else {
    if (sVar9 == bound) {
      pvVar1 = &__return_storage_ptr__->solutions;
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
      convert<baryonyx::itm::minimize_tag>
                (prVar34,(pvVar1->
                         super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                         )._M_impl.super__Vector_impl_data._M_start,iVar95);
      prVar34 = storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>::
                get_worst((storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>
                           *)(auStack_138 + 8));
      psVar38 = (pvVar1->super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                )._M_impl.super__Vector_impl_data._M_start + 1;
      goto LAB_005a1710;
    }
    if (sVar9 == five) {
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                (&__return_storage_ptr__->solutions,5);
      lVar40 = 0;
      lVar41 = 0;
      do {
        convert<baryonyx::itm::minimize_tag>
                  ((raw_result<baryonyx::itm::minimize_tag> *)
                   (vStack_e0.
                    super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + piStack_f8[lVar41]),
                   (solution *)
                   ((long)&(((__return_storage_ptr__->solutions).
                             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                             ._M_impl.super__Vector_impl_data._M_start)->variables).
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl +
                   lVar40),iVar95);
        lVar41 = lVar41 + 1;
        lVar40 = lVar40 + 0x20;
      } while (lVar41 != 5);
    }
  }
  pcVar24 = uStack_200;
  storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>::show_population
            ((storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag> *)
             (auStack_138 + 8),uStack_200);
  if ((pcVar24->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(uStack_200->finish)._M_invoker)((_Any_data *)&uStack_200->finish,__return_storage_ptr__);
  }
  operator_delete__(prVar30);
  if (pdStack_90 != (pointer)0x0) {
    operator_delete(pdStack_90,(long)pdStack_80 - (long)pdStack_90);
  }
  if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_Stack_b0._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__(_Stack_b0._M_head_impl);
  }
  _Stack_b0._M_head_impl = (unsigned_long *)0x0;
  if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
      _Stack_c0._M_head_impl != (unsigned_long *)0x0) {
    operator_delete__(_Stack_c0._M_head_impl);
  }
  _Stack_c0._M_head_impl = (unsigned_long *)0x0;
  std::
  vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
  ::~vector((vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             *)&vStack_e0);
  if (piStack_f8 != (int *)0x0) {
    operator_delete(piStack_f8,(long)piStack_e8 - (long)piStack_f8);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_150);
  if (auStack_1c8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_1c8,auStack_1b8._0_8_ - (long)auStack_1c8);
  }
  if ((tuple<int_*,_std::default_delete<int[]>_>)
      qStack_178.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0) {
    operator_delete__((void *)qStack_178.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  qStack_178.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if ((_Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
       )qStack_178.obj != (quad *)0x0) {
    operator_delete__(qStack_178.obj);
  }
  qStack_178.obj = (objective_function *)0x0;
  if ((_Head_base<0UL,_float_*,_false>)auStack_188._8_8_ != (_Head_base<0UL,_float_*,_false>)0x0) {
    operator_delete__((void *)auStack_188._8_8_);
  }
LAB_005a184f:
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  ~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           *)auStack_1a0);
  return __return_storage_ptr__;
}

Assistant:

static result
select_float(const context& ctx, const problem& pb, bool is_optimization)
{
    const auto f = static_cast<int>(ctx.parameters.float_type);

    if (f == 0)
        return select_mode<float_sel<0>>(ctx, pb, is_optimization);
    else if (f == 1)
        return select_mode<float_sel<1>>(ctx, pb, is_optimization);
    else
        return select_mode<float_sel<2>>(ctx, pb, is_optimization);
}